

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersector1<8>::
     intersect_t<embree::avx::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [12];
  undefined1 (*pauVar2) [12];
  undefined1 (*pauVar3) [12];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  undefined1 (*pauVar7) [32];
  undefined1 (*pauVar8) [28];
  undefined1 (*pauVar9) [28];
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Primitive PVar24;
  uint uVar25;
  RTCFilterFunctionN p_Var26;
  uint uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [28];
  undefined1 auVar132 [28];
  undefined1 auVar133 [28];
  undefined1 auVar134 [28];
  undefined1 auVar135 [28];
  undefined1 auVar136 [28];
  undefined1 auVar137 [24];
  uint uVar138;
  uint uVar139;
  uint uVar140;
  long lVar141;
  ulong uVar142;
  undefined1 auVar143 [8];
  Geometry *pGVar144;
  ulong uVar145;
  long lVar146;
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar165;
  float fVar166;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar167;
  float fVar171;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar185 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar198;
  undefined1 auVar197 [32];
  float fVar199;
  float fVar220;
  undefined1 auVar201 [16];
  float fVar200;
  float fVar215;
  float fVar218;
  float fVar221;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar214;
  float fVar217;
  float fVar224;
  float fVar227;
  float fVar230;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar216;
  float fVar219;
  float fVar222;
  float fVar223;
  float fVar225;
  float fVar226;
  float fVar228;
  float fVar229;
  float fVar231;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar232;
  float fVar238;
  float fVar239;
  float fVar241;
  undefined1 auVar233 [16];
  float fVar240;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar247;
  undefined1 auVar237 [32];
  float fVar248;
  float fVar249;
  float fVar255;
  float fVar257;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar252 [32];
  float fVar259;
  undefined1 auVar253 [32];
  float fVar256;
  float fVar258;
  undefined1 auVar254 [32];
  undefined1 auVar264 [16];
  float fVar263;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  float fVar277;
  undefined1 auVar272 [32];
  float fVar278;
  undefined1 auVar279 [16];
  float fVar287;
  float fVar288;
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float fVar289;
  undefined1 auVar286 [32];
  float fVar290;
  float fVar297;
  float fVar298;
  float fVar300;
  float fVar302;
  float fVar304;
  float fVar306;
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar299;
  float fVar303;
  float fVar307;
  float fVar308;
  undefined1 auVar294 [32];
  float fVar301;
  float fVar305;
  undefined1 auVar295 [32];
  undefined1 auVar296 [64];
  float fVar309;
  undefined1 auVar310 [16];
  float fVar317;
  float fVar318;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [64];
  float fVar319;
  float fVar324;
  float fVar325;
  float fVar326;
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  float in_register_0000151c;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  float fVar337;
  undefined1 auVar338 [16];
  float fVar343;
  float fVar344;
  undefined1 auVar339 [32];
  float fVar345;
  float fVar347;
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  float fVar346;
  undefined1 auVar342 [64];
  float fVar348;
  float fVar352;
  float fVar353;
  float fVar354;
  float in_register_0000159c;
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [64];
  float fVar355;
  float fVar358;
  float fVar359;
  float fVar360;
  float in_register_000015dc;
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_7b4;
  ulong local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float local_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float local_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  Primitive *local_740;
  Precalculations *local_738;
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [32];
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined8 local_630;
  undefined4 local_628;
  float local_624;
  undefined4 local_620;
  undefined4 local_61c;
  undefined4 local_618;
  uint local_614;
  uint local_610;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [2] [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  PVar24 = prim[1];
  uVar145 = (ulong)(byte)PVar24;
  lVar141 = uVar145 * 5;
  fVar199 = *(float *)(prim + uVar145 * 0x19 + 0x12);
  auVar185 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar145 * 0x19 + 6));
  auVar250._0_4_ = fVar199 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar250._4_4_ = fVar199 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar250._8_4_ = fVar199 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar250._12_4_ = fVar199 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 4 + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 4 + 10)));
  auVar172._0_4_ = fVar199 * auVar185._0_4_;
  auVar172._4_4_ = fVar199 * auVar185._4_4_;
  auVar172._8_4_ = fVar199 * auVar185._8_4_;
  auVar172._12_4_ = fVar199 * auVar185._12_4_;
  auVar157._16_16_ = auVar189;
  auVar157._0_16_ = auVar203;
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar141 + 6)));
  auVar157 = vcvtdq2ps_avx(auVar157);
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar141 + 10)));
  auVar193._16_16_ = auVar189;
  auVar193._0_16_ = auVar203;
  auVar29 = vcvtdq2ps_avx(auVar193);
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 6 + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 6 + 10)));
  auVar205._16_16_ = auVar189;
  auVar205._0_16_ = auVar203;
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 0xb + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 0xb + 10)));
  auVar30 = vcvtdq2ps_avx(auVar205);
  auVar206._16_16_ = auVar189;
  auVar206._0_16_ = auVar203;
  auVar31 = vcvtdq2ps_avx(auVar206);
  uVar142 = (ulong)((uint)(byte)PVar24 * 0xc);
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 + 10)));
  auVar265._16_16_ = auVar189;
  auVar265._0_16_ = auVar203;
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 + uVar145 + 6)));
  auVar32 = vcvtdq2ps_avx(auVar265);
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 + uVar145 + 10)));
  auVar280._16_16_ = auVar189;
  auVar280._0_16_ = auVar203;
  lVar146 = uVar145 * 9;
  uVar142 = (ulong)(uint)((int)lVar146 * 2);
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 + 6)));
  auVar33 = vcvtdq2ps_avx(auVar280);
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 + 10)));
  auVar281._16_16_ = auVar189;
  auVar281._0_16_ = auVar203;
  auVar34 = vcvtdq2ps_avx(auVar281);
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 + uVar145 + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 + uVar145 + 10)));
  auVar311._16_16_ = auVar189;
  auVar311._0_16_ = auVar203;
  uVar142 = (ulong)(uint)((int)lVar141 << 2);
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 + 10)));
  auVar35 = vcvtdq2ps_avx(auVar311);
  auVar320._16_16_ = auVar189;
  auVar320._0_16_ = auVar203;
  auVar36 = vcvtdq2ps_avx(auVar320);
  auVar203 = vshufps_avx(auVar250,auVar250,0);
  auVar189 = vshufps_avx(auVar250,auVar250,0x55);
  auVar185 = vshufps_avx(auVar250,auVar250,0xaa);
  fVar199 = auVar185._0_4_;
  fVar214 = auVar185._4_4_;
  fVar217 = auVar185._8_4_;
  fVar220 = auVar185._12_4_;
  fVar224 = auVar189._0_4_;
  fVar227 = auVar189._4_4_;
  fVar230 = auVar189._8_4_;
  fVar232 = auVar189._12_4_;
  fVar238 = auVar203._0_4_;
  fVar239 = auVar203._4_4_;
  fVar241 = auVar203._8_4_;
  fVar244 = auVar203._12_4_;
  auVar330._0_4_ = fVar238 * auVar157._0_4_ + fVar224 * auVar29._0_4_ + fVar199 * auVar30._0_4_;
  auVar330._4_4_ = fVar239 * auVar157._4_4_ + fVar227 * auVar29._4_4_ + fVar214 * auVar30._4_4_;
  auVar330._8_4_ = fVar241 * auVar157._8_4_ + fVar230 * auVar29._8_4_ + fVar217 * auVar30._8_4_;
  auVar330._12_4_ = fVar244 * auVar157._12_4_ + fVar232 * auVar29._12_4_ + fVar220 * auVar30._12_4_;
  auVar330._16_4_ = fVar238 * auVar157._16_4_ + fVar224 * auVar29._16_4_ + fVar199 * auVar30._16_4_;
  auVar330._20_4_ = fVar239 * auVar157._20_4_ + fVar227 * auVar29._20_4_ + fVar214 * auVar30._20_4_;
  auVar330._24_4_ = fVar241 * auVar157._24_4_ + fVar230 * auVar29._24_4_ + fVar217 * auVar30._24_4_;
  auVar330._28_4_ = fVar232 + in_register_000015dc + in_register_0000151c;
  auVar327._0_4_ = fVar238 * auVar31._0_4_ + fVar224 * auVar32._0_4_ + auVar33._0_4_ * fVar199;
  auVar327._4_4_ = fVar239 * auVar31._4_4_ + fVar227 * auVar32._4_4_ + auVar33._4_4_ * fVar214;
  auVar327._8_4_ = fVar241 * auVar31._8_4_ + fVar230 * auVar32._8_4_ + auVar33._8_4_ * fVar217;
  auVar327._12_4_ = fVar244 * auVar31._12_4_ + fVar232 * auVar32._12_4_ + auVar33._12_4_ * fVar220;
  auVar327._16_4_ = fVar238 * auVar31._16_4_ + fVar224 * auVar32._16_4_ + auVar33._16_4_ * fVar199;
  auVar327._20_4_ = fVar239 * auVar31._20_4_ + fVar227 * auVar32._20_4_ + auVar33._20_4_ * fVar214;
  auVar327._24_4_ = fVar241 * auVar31._24_4_ + fVar230 * auVar32._24_4_ + auVar33._24_4_ * fVar217;
  auVar327._28_4_ = fVar232 + in_register_000015dc + in_register_0000159c;
  auVar252._0_4_ = fVar238 * auVar34._0_4_ + fVar224 * auVar35._0_4_ + auVar36._0_4_ * fVar199;
  auVar252._4_4_ = fVar239 * auVar34._4_4_ + fVar227 * auVar35._4_4_ + auVar36._4_4_ * fVar214;
  auVar252._8_4_ = fVar241 * auVar34._8_4_ + fVar230 * auVar35._8_4_ + auVar36._8_4_ * fVar217;
  auVar252._12_4_ = fVar244 * auVar34._12_4_ + fVar232 * auVar35._12_4_ + auVar36._12_4_ * fVar220;
  auVar252._16_4_ = fVar238 * auVar34._16_4_ + fVar224 * auVar35._16_4_ + auVar36._16_4_ * fVar199;
  auVar252._20_4_ = fVar239 * auVar34._20_4_ + fVar227 * auVar35._20_4_ + auVar36._20_4_ * fVar214;
  auVar252._24_4_ = fVar241 * auVar34._24_4_ + fVar230 * auVar35._24_4_ + auVar36._24_4_ * fVar217;
  auVar252._28_4_ = fVar244 + fVar232 + fVar220;
  auVar203 = vshufps_avx(auVar172,auVar172,0);
  auVar189 = vshufps_avx(auVar172,auVar172,0x55);
  auVar185 = vshufps_avx(auVar172,auVar172,0xaa);
  fVar214 = auVar185._0_4_;
  fVar217 = auVar185._4_4_;
  fVar220 = auVar185._8_4_;
  fVar224 = auVar185._12_4_;
  fVar239 = auVar189._0_4_;
  fVar241 = auVar189._4_4_;
  fVar244 = auVar189._8_4_;
  fVar245 = auVar189._12_4_;
  fVar227 = auVar203._0_4_;
  fVar230 = auVar203._4_4_;
  fVar232 = auVar203._8_4_;
  fVar238 = auVar203._12_4_;
  fVar199 = auVar157._28_4_;
  auVar266._0_4_ = fVar227 * auVar157._0_4_ + fVar239 * auVar29._0_4_ + fVar214 * auVar30._0_4_;
  auVar266._4_4_ = fVar230 * auVar157._4_4_ + fVar241 * auVar29._4_4_ + fVar217 * auVar30._4_4_;
  auVar266._8_4_ = fVar232 * auVar157._8_4_ + fVar244 * auVar29._8_4_ + fVar220 * auVar30._8_4_;
  auVar266._12_4_ = fVar238 * auVar157._12_4_ + fVar245 * auVar29._12_4_ + fVar224 * auVar30._12_4_;
  auVar266._16_4_ = fVar227 * auVar157._16_4_ + fVar239 * auVar29._16_4_ + fVar214 * auVar30._16_4_;
  auVar266._20_4_ = fVar230 * auVar157._20_4_ + fVar241 * auVar29._20_4_ + fVar217 * auVar30._20_4_;
  auVar266._24_4_ = fVar232 * auVar157._24_4_ + fVar244 * auVar29._24_4_ + fVar220 * auVar30._24_4_;
  auVar266._28_4_ = fVar199 + auVar29._28_4_ + auVar30._28_4_;
  auVar174._0_4_ = fVar227 * auVar31._0_4_ + auVar33._0_4_ * fVar214 + fVar239 * auVar32._0_4_;
  auVar174._4_4_ = fVar230 * auVar31._4_4_ + auVar33._4_4_ * fVar217 + fVar241 * auVar32._4_4_;
  auVar174._8_4_ = fVar232 * auVar31._8_4_ + auVar33._8_4_ * fVar220 + fVar244 * auVar32._8_4_;
  auVar174._12_4_ = fVar238 * auVar31._12_4_ + auVar33._12_4_ * fVar224 + fVar245 * auVar32._12_4_;
  auVar174._16_4_ = fVar227 * auVar31._16_4_ + auVar33._16_4_ * fVar214 + fVar239 * auVar32._16_4_;
  auVar174._20_4_ = fVar230 * auVar31._20_4_ + auVar33._20_4_ * fVar217 + fVar241 * auVar32._20_4_;
  auVar174._24_4_ = fVar232 * auVar31._24_4_ + auVar33._24_4_ * fVar220 + fVar244 * auVar32._24_4_;
  auVar174._28_4_ = fVar199 + auVar33._28_4_ + auVar30._28_4_;
  auVar282._8_4_ = 0x7fffffff;
  auVar282._0_8_ = 0x7fffffff7fffffff;
  auVar282._12_4_ = 0x7fffffff;
  auVar282._16_4_ = 0x7fffffff;
  auVar282._20_4_ = 0x7fffffff;
  auVar282._24_4_ = 0x7fffffff;
  auVar282._28_4_ = 0x7fffffff;
  auVar194._8_4_ = 0x219392ef;
  auVar194._0_8_ = 0x219392ef219392ef;
  auVar194._12_4_ = 0x219392ef;
  auVar194._16_4_ = 0x219392ef;
  auVar194._20_4_ = 0x219392ef;
  auVar194._24_4_ = 0x219392ef;
  auVar194._28_4_ = 0x219392ef;
  auVar157 = vandps_avx(auVar330,auVar282);
  auVar157 = vcmpps_avx(auVar157,auVar194,1);
  auVar29 = vblendvps_avx(auVar330,auVar194,auVar157);
  auVar157 = vandps_avx(auVar327,auVar282);
  auVar157 = vcmpps_avx(auVar157,auVar194,1);
  auVar30 = vblendvps_avx(auVar327,auVar194,auVar157);
  auVar157 = vandps_avx(auVar252,auVar282);
  auVar157 = vcmpps_avx(auVar157,auVar194,1);
  auVar157 = vblendvps_avx(auVar252,auVar194,auVar157);
  auVar195._0_4_ = fVar239 * auVar35._0_4_ + auVar36._0_4_ * fVar214 + fVar227 * auVar34._0_4_;
  auVar195._4_4_ = fVar241 * auVar35._4_4_ + auVar36._4_4_ * fVar217 + fVar230 * auVar34._4_4_;
  auVar195._8_4_ = fVar244 * auVar35._8_4_ + auVar36._8_4_ * fVar220 + fVar232 * auVar34._8_4_;
  auVar195._12_4_ = fVar245 * auVar35._12_4_ + auVar36._12_4_ * fVar224 + fVar238 * auVar34._12_4_;
  auVar195._16_4_ = fVar239 * auVar35._16_4_ + auVar36._16_4_ * fVar214 + fVar227 * auVar34._16_4_;
  auVar195._20_4_ = fVar241 * auVar35._20_4_ + auVar36._20_4_ * fVar217 + fVar230 * auVar34._20_4_;
  auVar195._24_4_ = fVar244 * auVar35._24_4_ + auVar36._24_4_ * fVar220 + fVar232 * auVar34._24_4_;
  auVar195._28_4_ = auVar32._28_4_ + fVar224 + fVar199;
  auVar31 = vrcpps_avx(auVar29);
  fVar199 = auVar31._0_4_;
  fVar214 = auVar31._4_4_;
  auVar32._4_4_ = auVar29._4_4_ * fVar214;
  auVar32._0_4_ = auVar29._0_4_ * fVar199;
  fVar217 = auVar31._8_4_;
  auVar32._8_4_ = auVar29._8_4_ * fVar217;
  fVar220 = auVar31._12_4_;
  auVar32._12_4_ = auVar29._12_4_ * fVar220;
  fVar224 = auVar31._16_4_;
  auVar32._16_4_ = auVar29._16_4_ * fVar224;
  fVar227 = auVar31._20_4_;
  auVar32._20_4_ = auVar29._20_4_ * fVar227;
  fVar230 = auVar31._24_4_;
  auVar32._24_4_ = auVar29._24_4_ * fVar230;
  auVar32._28_4_ = auVar29._28_4_;
  auVar291._8_4_ = 0x3f800000;
  auVar291._0_8_ = 0x3f8000003f800000;
  auVar291._12_4_ = 0x3f800000;
  auVar291._16_4_ = 0x3f800000;
  auVar291._20_4_ = 0x3f800000;
  auVar291._24_4_ = 0x3f800000;
  auVar291._28_4_ = 0x3f800000;
  auVar32 = vsubps_avx(auVar291,auVar32);
  auVar29 = vrcpps_avx(auVar30);
  fVar199 = fVar199 + fVar199 * auVar32._0_4_;
  fVar214 = fVar214 + fVar214 * auVar32._4_4_;
  fVar217 = fVar217 + fVar217 * auVar32._8_4_;
  fVar220 = fVar220 + fVar220 * auVar32._12_4_;
  fVar224 = fVar224 + fVar224 * auVar32._16_4_;
  fVar227 = fVar227 + fVar227 * auVar32._20_4_;
  fVar230 = fVar230 + fVar230 * auVar32._24_4_;
  fVar248 = auVar29._0_4_;
  fVar255 = auVar29._4_4_;
  auVar33._4_4_ = fVar255 * auVar30._4_4_;
  auVar33._0_4_ = fVar248 * auVar30._0_4_;
  fVar257 = auVar29._8_4_;
  auVar33._8_4_ = fVar257 * auVar30._8_4_;
  fVar259 = auVar29._12_4_;
  auVar33._12_4_ = fVar259 * auVar30._12_4_;
  fVar260 = auVar29._16_4_;
  auVar33._16_4_ = fVar260 * auVar30._16_4_;
  fVar261 = auVar29._20_4_;
  auVar33._20_4_ = fVar261 * auVar30._20_4_;
  fVar262 = auVar29._24_4_;
  auVar33._24_4_ = fVar262 * auVar30._24_4_;
  auVar33._28_4_ = auVar31._28_4_;
  auVar29 = vsubps_avx(auVar291,auVar33);
  fVar248 = fVar248 + fVar248 * auVar29._0_4_;
  fVar255 = fVar255 + fVar255 * auVar29._4_4_;
  fVar257 = fVar257 + fVar257 * auVar29._8_4_;
  fVar259 = fVar259 + fVar259 * auVar29._12_4_;
  fVar260 = fVar260 + fVar260 * auVar29._16_4_;
  fVar261 = fVar261 + fVar261 * auVar29._20_4_;
  fVar262 = fVar262 + fVar262 * auVar29._24_4_;
  auVar29 = vrcpps_avx(auVar157);
  fVar232 = auVar29._0_4_;
  fVar238 = auVar29._4_4_;
  auVar34._4_4_ = fVar238 * auVar157._4_4_;
  auVar34._0_4_ = fVar232 * auVar157._0_4_;
  fVar239 = auVar29._8_4_;
  auVar34._8_4_ = fVar239 * auVar157._8_4_;
  fVar241 = auVar29._12_4_;
  auVar34._12_4_ = fVar241 * auVar157._12_4_;
  fVar244 = auVar29._16_4_;
  auVar34._16_4_ = fVar244 * auVar157._16_4_;
  fVar245 = auVar29._20_4_;
  auVar34._20_4_ = fVar245 * auVar157._20_4_;
  fVar246 = auVar29._24_4_;
  auVar34._24_4_ = fVar246 * auVar157._24_4_;
  auVar34._28_4_ = auVar30._28_4_;
  auVar157 = vsubps_avx(auVar291,auVar34);
  fVar232 = fVar232 + fVar232 * auVar157._0_4_;
  fVar238 = fVar238 + fVar238 * auVar157._4_4_;
  fVar239 = fVar239 + fVar239 * auVar157._8_4_;
  fVar241 = fVar241 + fVar241 * auVar157._12_4_;
  fVar244 = fVar244 + fVar244 * auVar157._16_4_;
  fVar245 = fVar245 + fVar245 * auVar157._20_4_;
  fVar246 = fVar246 + fVar246 * auVar157._24_4_;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = *(ulong *)(prim + uVar145 * 7 + 6);
  auVar203 = vpmovsxwd_avx(auVar203);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar145 * 7 + 0xe);
  auVar189 = vpmovsxwd_avx(auVar189);
  auVar151._16_16_ = auVar189;
  auVar151._0_16_ = auVar203;
  auVar157 = vcvtdq2ps_avx(auVar151);
  auVar157 = vsubps_avx(auVar157,auVar266);
  auVar148._0_4_ = fVar199 * auVar157._0_4_;
  auVar148._4_4_ = fVar214 * auVar157._4_4_;
  auVar148._8_4_ = fVar217 * auVar157._8_4_;
  auVar148._12_4_ = fVar220 * auVar157._12_4_;
  auVar30._16_4_ = fVar224 * auVar157._16_4_;
  auVar30._0_16_ = auVar148;
  auVar30._20_4_ = fVar227 * auVar157._20_4_;
  auVar30._24_4_ = fVar230 * auVar157._24_4_;
  auVar30._28_4_ = auVar157._28_4_;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *(ulong *)(prim + lVar146 + 6);
  auVar203 = vpmovsxwd_avx(auVar185);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *(ulong *)(prim + lVar146 + 0xe);
  auVar189 = vpmovsxwd_avx(auVar204);
  auVar283._16_16_ = auVar189;
  auVar283._0_16_ = auVar203;
  auVar157 = vcvtdq2ps_avx(auVar283);
  auVar157 = vsubps_avx(auVar157,auVar266);
  auVar201._0_4_ = fVar199 * auVar157._0_4_;
  auVar201._4_4_ = fVar214 * auVar157._4_4_;
  auVar201._8_4_ = fVar217 * auVar157._8_4_;
  auVar201._12_4_ = fVar220 * auVar157._12_4_;
  auVar35._16_4_ = fVar224 * auVar157._16_4_;
  auVar35._0_16_ = auVar201;
  auVar35._20_4_ = fVar227 * auVar157._20_4_;
  auVar35._24_4_ = fVar230 * auVar157._24_4_;
  auVar35._28_4_ = auVar31._28_4_ + auVar32._28_4_;
  lVar141 = (ulong)(byte)PVar24 * 0x10;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + lVar141 + 6);
  auVar203 = vpmovsxwd_avx(auVar202);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar141 + 0xe);
  auVar189 = vpmovsxwd_avx(auVar17);
  lVar141 = lVar141 + uVar145 * -2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar141 + 6);
  auVar185 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar141 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar19);
  auVar267._16_16_ = auVar204;
  auVar267._0_16_ = auVar185;
  auVar157 = vcvtdq2ps_avx(auVar267);
  auVar157 = vsubps_avx(auVar157,auVar174);
  auVar264._0_4_ = fVar248 * auVar157._0_4_;
  auVar264._4_4_ = fVar255 * auVar157._4_4_;
  auVar264._8_4_ = fVar257 * auVar157._8_4_;
  auVar264._12_4_ = fVar259 * auVar157._12_4_;
  auVar31._16_4_ = fVar260 * auVar157._16_4_;
  auVar31._0_16_ = auVar264;
  auVar31._20_4_ = fVar261 * auVar157._20_4_;
  auVar31._24_4_ = fVar262 * auVar157._24_4_;
  auVar31._28_4_ = auVar157._28_4_;
  auVar284._16_16_ = auVar189;
  auVar284._0_16_ = auVar203;
  auVar157 = vcvtdq2ps_avx(auVar284);
  auVar157 = vsubps_avx(auVar157,auVar174);
  auVar173._0_4_ = fVar248 * auVar157._0_4_;
  auVar173._4_4_ = fVar255 * auVar157._4_4_;
  auVar173._8_4_ = fVar257 * auVar157._8_4_;
  auVar173._12_4_ = fVar259 * auVar157._12_4_;
  auVar29._16_4_ = fVar260 * auVar157._16_4_;
  auVar29._0_16_ = auVar173;
  auVar29._20_4_ = fVar261 * auVar157._20_4_;
  auVar29._24_4_ = fVar262 * auVar157._24_4_;
  auVar29._28_4_ = auVar157._28_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar142 + uVar145 + 6);
  auVar203 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar142 + uVar145 + 0xe);
  auVar189 = vpmovsxwd_avx(auVar21);
  auVar253._16_16_ = auVar189;
  auVar253._0_16_ = auVar203;
  auVar157 = vcvtdq2ps_avx(auVar253);
  auVar157 = vsubps_avx(auVar157,auVar195);
  auVar251._0_4_ = fVar232 * auVar157._0_4_;
  auVar251._4_4_ = fVar238 * auVar157._4_4_;
  auVar251._8_4_ = fVar239 * auVar157._8_4_;
  auVar251._12_4_ = fVar241 * auVar157._12_4_;
  auVar36._16_4_ = fVar244 * auVar157._16_4_;
  auVar36._0_16_ = auVar251;
  auVar36._20_4_ = fVar245 * auVar157._20_4_;
  auVar36._24_4_ = fVar246 * auVar157._24_4_;
  auVar36._28_4_ = auVar157._28_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar145 * 0x17 + 6);
  auVar203 = vpmovsxwd_avx(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar145 * 0x17 + 0xe);
  auVar189 = vpmovsxwd_avx(auVar23);
  auVar285._16_16_ = auVar189;
  auVar285._0_16_ = auVar203;
  auVar157 = vcvtdq2ps_avx(auVar285);
  auVar157 = vsubps_avx(auVar157,auVar195);
  auVar186._0_4_ = fVar232 * auVar157._0_4_;
  auVar186._4_4_ = fVar238 * auVar157._4_4_;
  auVar186._8_4_ = fVar239 * auVar157._8_4_;
  auVar186._12_4_ = fVar241 * auVar157._12_4_;
  auVar28._16_4_ = fVar244 * auVar157._16_4_;
  auVar28._0_16_ = auVar186;
  auVar28._20_4_ = fVar245 * auVar157._20_4_;
  auVar28._24_4_ = fVar246 * auVar157._24_4_;
  auVar28._28_4_ = auVar157._28_4_;
  auVar203 = vpminsd_avx(auVar30._16_16_,auVar35._16_16_);
  auVar189 = vpminsd_avx(auVar148,auVar201);
  auVar292._16_16_ = auVar203;
  auVar292._0_16_ = auVar189;
  auVar185 = auVar29._16_16_;
  auVar316 = ZEXT1664(auVar185);
  auVar203 = vpminsd_avx(auVar31._16_16_,auVar185);
  auVar189 = vpminsd_avx(auVar264,auVar173);
  auVar328._16_16_ = auVar203;
  auVar328._0_16_ = auVar189;
  auVar157 = vmaxps_avx(auVar292,auVar328);
  auVar203 = vpminsd_avx(auVar36._16_16_,auVar28._16_16_);
  auVar189 = vpminsd_avx(auVar251,auVar186);
  auVar339._16_16_ = auVar203;
  auVar339._0_16_ = auVar189;
  uVar14 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar349._4_4_ = uVar14;
  auVar349._0_4_ = uVar14;
  auVar349._8_4_ = uVar14;
  auVar349._12_4_ = uVar14;
  auVar349._16_4_ = uVar14;
  auVar349._20_4_ = uVar14;
  auVar349._24_4_ = uVar14;
  auVar349._28_4_ = uVar14;
  auVar29 = vmaxps_avx(auVar339,auVar349);
  auVar157 = vmaxps_avx(auVar157,auVar29);
  local_80._4_4_ = auVar157._4_4_ * 0.99999964;
  local_80._0_4_ = auVar157._0_4_ * 0.99999964;
  local_80._8_4_ = auVar157._8_4_ * 0.99999964;
  local_80._12_4_ = auVar157._12_4_ * 0.99999964;
  local_80._16_4_ = auVar157._16_4_ * 0.99999964;
  local_80._20_4_ = auVar157._20_4_ * 0.99999964;
  local_80._24_4_ = auVar157._24_4_ * 0.99999964;
  local_80._28_4_ = auVar157._28_4_;
  auVar296 = ZEXT3264(local_80);
  auVar203 = vpmaxsd_avx(auVar30._16_16_,auVar35._16_16_);
  auVar189 = vpmaxsd_avx(auVar148,auVar201);
  auVar152._16_16_ = auVar203;
  auVar152._0_16_ = auVar189;
  auVar203 = vpmaxsd_avx(auVar31._16_16_,auVar185);
  auVar189 = vpmaxsd_avx(auVar264,auVar173);
  auVar175._16_16_ = auVar203;
  auVar175._0_16_ = auVar189;
  auVar157 = vminps_avx(auVar152,auVar175);
  auVar203 = vpmaxsd_avx(auVar36._16_16_,auVar28._16_16_);
  auVar189 = vpmaxsd_avx(auVar251,auVar186);
  fVar199 = (ray->super_RayK<1>).tfar;
  auVar207._4_4_ = fVar199;
  auVar207._0_4_ = fVar199;
  auVar207._8_4_ = fVar199;
  auVar207._12_4_ = fVar199;
  auVar207._16_4_ = fVar199;
  auVar207._20_4_ = fVar199;
  auVar207._24_4_ = fVar199;
  auVar207._28_4_ = fVar199;
  auVar176._16_16_ = auVar203;
  auVar176._0_16_ = auVar189;
  auVar29 = vminps_avx(auVar176,auVar207);
  auVar157 = vminps_avx(auVar157,auVar29);
  auVar37._4_4_ = auVar157._4_4_ * 1.0000004;
  auVar37._0_4_ = auVar157._0_4_ * 1.0000004;
  auVar37._8_4_ = auVar157._8_4_ * 1.0000004;
  auVar37._12_4_ = auVar157._12_4_ * 1.0000004;
  auVar37._16_4_ = auVar157._16_4_ * 1.0000004;
  auVar37._20_4_ = auVar157._20_4_ * 1.0000004;
  auVar37._24_4_ = auVar157._24_4_ * 1.0000004;
  auVar37._28_4_ = auVar157._28_4_;
  auVar157 = vcmpps_avx(local_80,auVar37,2);
  auVar203 = vpshufd_avx(ZEXT116((byte)PVar24),0);
  auVar177._16_16_ = auVar203;
  auVar177._0_16_ = auVar203;
  auVar29 = vcvtdq2ps_avx(auVar177);
  auVar29 = vcmpps_avx(_DAT_01faff40,auVar29,1);
  auVar157 = vandps_avx(auVar157,auVar29);
  uVar138 = vmovmskps_avx(auVar157);
  if (uVar138 != 0) {
    local_4c0[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_4c0[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_4c0[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_4c0[1]._24_8_ = mm_lookupmask_ps._24_8_;
    uVar138 = uVar138 & 0xff;
    local_740 = prim;
    local_738 = pre;
    do {
      uVar145 = (ulong)uVar138;
      local_680 = auVar316._0_32_;
      local_6c0 = auVar296._0_32_;
      lVar141 = 0;
      if (uVar145 != 0) {
        for (; (uVar138 >> lVar141 & 1) == 0; lVar141 = lVar141 + 1) {
        }
      }
      uVar145 = uVar145 - 1 & uVar145;
      uVar138 = *(uint *)(prim + 2);
      uVar140 = *(uint *)(prim + lVar141 * 4 + 6);
      local_7b0 = (ulong)uVar138;
      pGVar144 = (context->scene->geometries).items[uVar138].ptr;
      local_7a8 = (ulong)uVar140;
      uVar142 = (ulong)*(uint *)(*(long *)&pGVar144->field_0x58 +
                                pGVar144[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar140);
      p_Var26 = pGVar144[1].intersectionFilterN;
      lVar141 = *(long *)&pGVar144[1].time_range.upper;
      pauVar1 = (undefined1 (*) [12])(lVar141 + (long)p_Var26 * uVar142);
      local_250 = *(undefined8 *)*pauVar1;
      uStack_248 = *(undefined8 *)(*pauVar1 + 8);
      local_780 = (float)local_250;
      fStack_77c = (float)((ulong)local_250 >> 0x20);
      fStack_778 = (float)uStack_248;
      fStack_774 = (float)((ulong)uStack_248 >> 0x20);
      pauVar2 = (undefined1 (*) [12])(lVar141 + (uVar142 + 1) * (long)p_Var26);
      local_240 = *(undefined8 *)*pauVar2;
      uStack_238 = *(undefined8 *)(*pauVar2 + 8);
      local_750 = (float)local_240;
      fStack_74c = (float)((ulong)local_240 >> 0x20);
      fStack_748 = (float)uStack_238;
      fStack_744 = (float)((ulong)uStack_238 >> 0x20);
      pauVar3 = (undefined1 (*) [12])(lVar141 + (uVar142 + 2) * (long)p_Var26);
      local_230 = *(undefined8 *)*pauVar3;
      uStack_228 = *(undefined8 *)(*pauVar3 + 8);
      local_760 = (float)local_230;
      fStack_75c = (float)((ulong)local_230 >> 0x20);
      fStack_758 = (float)uStack_228;
      fStack_754 = (float)((ulong)uStack_228 >> 0x20);
      lVar146 = 0;
      if (uVar145 != 0) {
        for (; (uVar145 >> lVar146 & 1) == 0; lVar146 = lVar146 + 1) {
        }
      }
      pauVar4 = (undefined1 (*) [12])(lVar141 + (uVar142 + 3) * (long)p_Var26);
      local_220 = *(undefined8 *)*pauVar4;
      uStack_218 = *(undefined8 *)(*pauVar4 + 8);
      local_770 = (float)local_220;
      fStack_76c = (float)((ulong)local_220 >> 0x20);
      fStack_768 = (float)uStack_218;
      fStack_764 = (float)((ulong)uStack_218 >> 0x20);
      if (((uVar145 != 0) && (uVar142 = uVar145 - 1 & uVar145, uVar142 != 0)) &&
         (lVar141 = 0, uVar142 != 0)) {
        for (; (uVar142 >> lVar141 & 1) == 0; lVar141 = lVar141 + 1) {
        }
      }
      uVar25 = (uint)pGVar144[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar16 = (ray->super_RayK<1>).org.field_0;
      auVar122._12_4_ = fStack_774;
      auVar122._0_12_ = *pauVar1;
      auVar185 = vsubps_avx(auVar122,(undefined1  [16])aVar16);
      auVar203 = vshufps_avx(auVar185,auVar185,0);
      auVar189 = vshufps_avx(auVar185,auVar185,0x55);
      auVar185 = vshufps_avx(auVar185,auVar185,0xaa);
      fVar199 = (pre->ray_space).vx.field_0.m128[0];
      fVar214 = (pre->ray_space).vx.field_0.m128[1];
      fVar217 = (pre->ray_space).vx.field_0.m128[2];
      fVar220 = (pre->ray_space).vx.field_0.m128[3];
      fVar224 = (pre->ray_space).vy.field_0.m128[0];
      fVar227 = (pre->ray_space).vy.field_0.m128[1];
      fVar230 = (pre->ray_space).vy.field_0.m128[2];
      fVar232 = (pre->ray_space).vy.field_0.m128[3];
      fVar238 = (pre->ray_space).vz.field_0.m128[0];
      fVar239 = (pre->ray_space).vz.field_0.m128[1];
      fVar241 = (pre->ray_space).vz.field_0.m128[2];
      fVar244 = (pre->ray_space).vz.field_0.m128[3];
      auVar149._0_4_ =
           auVar203._0_4_ * fVar199 + auVar185._0_4_ * fVar238 + auVar189._0_4_ * fVar224;
      auVar149._4_4_ =
           auVar203._4_4_ * fVar214 + auVar185._4_4_ * fVar239 + auVar189._4_4_ * fVar227;
      auVar149._8_4_ =
           auVar203._8_4_ * fVar217 + auVar185._8_4_ * fVar241 + auVar189._8_4_ * fVar230;
      auVar149._12_4_ =
           auVar203._12_4_ * fVar220 + auVar185._12_4_ * fVar244 + auVar189._12_4_ * fVar232;
      auVar203 = vblendps_avx(auVar149,auVar122,8);
      auVar126._12_4_ = fStack_744;
      auVar126._0_12_ = *pauVar2;
      auVar204 = vsubps_avx(auVar126,(undefined1  [16])aVar16);
      auVar189 = vshufps_avx(auVar204,auVar204,0);
      auVar185 = vshufps_avx(auVar204,auVar204,0x55);
      auVar204 = vshufps_avx(auVar204,auVar204,0xaa);
      auVar338._0_4_ =
           auVar189._0_4_ * fVar199 + auVar204._0_4_ * fVar238 + auVar185._0_4_ * fVar224;
      auVar338._4_4_ =
           auVar189._4_4_ * fVar214 + auVar204._4_4_ * fVar239 + auVar185._4_4_ * fVar227;
      auVar338._8_4_ =
           auVar189._8_4_ * fVar217 + auVar204._8_4_ * fVar241 + auVar185._8_4_ * fVar230;
      auVar338._12_4_ =
           auVar189._12_4_ * fVar220 + auVar204._12_4_ * fVar244 + auVar185._12_4_ * fVar232;
      auVar189 = vblendps_avx(auVar338,auVar126,8);
      auVar125._12_4_ = fStack_754;
      auVar125._0_12_ = *pauVar3;
      auVar202 = vsubps_avx(auVar125,(undefined1  [16])aVar16);
      auVar185 = vshufps_avx(auVar202,auVar202,0);
      auVar204 = vshufps_avx(auVar202,auVar202,0x55);
      auVar202 = vshufps_avx(auVar202,auVar202,0xaa);
      auVar279._0_4_ =
           auVar185._0_4_ * fVar199 + auVar204._0_4_ * fVar224 + auVar202._0_4_ * fVar238;
      auVar279._4_4_ =
           auVar185._4_4_ * fVar214 + auVar204._4_4_ * fVar227 + auVar202._4_4_ * fVar239;
      auVar279._8_4_ =
           auVar185._8_4_ * fVar217 + auVar204._8_4_ * fVar230 + auVar202._8_4_ * fVar241;
      auVar279._12_4_ =
           auVar185._12_4_ * fVar220 + auVar204._12_4_ * fVar232 + auVar202._12_4_ * fVar244;
      auVar17 = vshufps_avx(auVar125,auVar125,0xff);
      auVar185 = vblendps_avx(auVar279,auVar125,8);
      auVar124._12_4_ = fStack_764;
      auVar124._0_12_ = *pauVar4;
      local_3e0._0_16_ = (undefined1  [16])aVar16;
      auVar18 = vsubps_avx(auVar124,(undefined1  [16])aVar16);
      auVar204 = vshufps_avx(auVar18,auVar18,0);
      auVar202 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      auVar310._0_4_ = auVar204._0_4_ * fVar199 + auVar18._0_4_ * fVar238 + auVar202._0_4_ * fVar224
      ;
      auVar310._4_4_ = auVar204._4_4_ * fVar214 + auVar18._4_4_ * fVar239 + auVar202._4_4_ * fVar227
      ;
      auVar310._8_4_ = auVar204._8_4_ * fVar217 + auVar18._8_4_ * fVar241 + auVar202._8_4_ * fVar230
      ;
      auVar310._12_4_ =
           auVar204._12_4_ * fVar220 + auVar18._12_4_ * fVar244 + auVar202._12_4_ * fVar232;
      auVar204 = vblendps_avx(auVar310,auVar124,8);
      auVar233._8_4_ = 0x7fffffff;
      auVar233._0_8_ = 0x7fffffff7fffffff;
      auVar233._12_4_ = 0x7fffffff;
      auVar203 = vandps_avx(auVar203,auVar233);
      auVar189 = vandps_avx(auVar189,auVar233);
      auVar202 = vmaxps_avx(auVar203,auVar189);
      auVar203 = vandps_avx(auVar185,auVar233);
      auVar189 = vandps_avx(auVar204,auVar233);
      auVar203 = vmaxps_avx(auVar203,auVar189);
      auVar203 = vmaxps_avx(auVar202,auVar203);
      auVar189 = vmovshdup_avx(auVar203);
      auVar189 = vmaxss_avx(auVar189,auVar203);
      auVar203 = vshufpd_avx(auVar203,auVar203,1);
      auVar203 = vmaxss_avx(auVar203,auVar189);
      lVar141 = (long)(int)uVar25 * 0x44;
      fVar248 = *(float *)(bezier_basis0 + lVar141 + 0x908);
      fVar255 = *(float *)(bezier_basis0 + lVar141 + 0x90c);
      fVar257 = *(float *)(bezier_basis0 + lVar141 + 0x910);
      fVar259 = *(float *)(bezier_basis0 + lVar141 + 0x914);
      fVar260 = *(float *)(bezier_basis0 + lVar141 + 0x918);
      fVar261 = *(float *)(bezier_basis0 + lVar141 + 0x91c);
      fVar262 = *(float *)(bezier_basis0 + lVar141 + 0x920);
      auVar189 = vshufps_avx(auVar279,auVar279,0);
      register0x000012d0 = auVar189;
      _local_580 = auVar189;
      auVar185 = vshufps_avx(auVar279,auVar279,0x55);
      local_6a0._16_16_ = auVar185;
      local_6a0._0_16_ = auVar185;
      fVar199 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar141 + 0xd8c);
      fVar214 = *(float *)(bezier_basis0 + lVar141 + 0xd90);
      fVar217 = *(float *)(bezier_basis0 + lVar141 + 0xd94);
      fVar220 = *(float *)(bezier_basis0 + lVar141 + 0xd98);
      fVar224 = *(float *)(bezier_basis0 + lVar141 + 0xd9c);
      fVar227 = *(float *)(bezier_basis0 + lVar141 + 0xda0);
      fVar230 = *(float *)(bezier_basis0 + lVar141 + 0xda4);
      auVar131 = *(undefined1 (*) [28])(bezier_basis0 + lVar141 + 0xd8c);
      auVar204 = vshufps_avx(auVar310,auVar310,0);
      register0x00001490 = auVar204;
      _local_3c0 = auVar204;
      auVar202 = vshufps_avx(auVar310,auVar310,0x55);
      register0x000015d0 = auVar202;
      _local_4e0 = auVar202;
      fVar319 = auVar204._0_4_;
      fVar324 = auVar204._4_4_;
      fVar325 = auVar204._8_4_;
      fVar326 = auVar204._12_4_;
      fVar355 = auVar202._0_4_;
      fVar358 = auVar202._4_4_;
      fVar359 = auVar202._8_4_;
      fVar360 = auVar202._12_4_;
      fVar274 = auVar189._0_4_;
      fVar275 = auVar189._4_4_;
      fVar276 = auVar189._8_4_;
      fVar277 = auVar189._12_4_;
      fVar222 = auVar185._0_4_;
      fVar228 = auVar185._4_4_;
      fVar308 = auVar185._8_4_;
      fVar242 = auVar185._12_4_;
      auVar189 = vshufps_avx(auVar124,auVar124,0xff);
      register0x00001350 = auVar17;
      _local_120 = auVar17;
      register0x00001410 = auVar189;
      _local_140 = auVar189;
      fVar290 = auVar189._0_4_;
      fVar297 = auVar189._4_4_;
      fVar298 = auVar189._8_4_;
      fVar300 = auVar189._12_4_;
      fVar249 = auVar17._0_4_;
      fVar256 = auVar17._4_4_;
      fVar258 = auVar17._8_4_;
      auVar189 = vshufps_avx(auVar338,auVar338,0);
      register0x000012d0 = auVar189;
      _local_5c0 = auVar189;
      fVar299 = *(float *)(bezier_basis0 + lVar141 + 0x484);
      fVar223 = *(float *)(bezier_basis0 + lVar141 + 0x488);
      fVar302 = *(float *)(bezier_basis0 + lVar141 + 0x48c);
      fVar301 = *(float *)(bezier_basis0 + lVar141 + 0x490);
      fStack_430 = *(float *)(bezier_basis0 + lVar141 + 0x494);
      fStack_42c = *(float *)(bezier_basis0 + lVar141 + 0x498);
      fStack_428 = *(float *)(bezier_basis0 + lVar141 + 0x49c);
      fStack_424 = *(float *)(bezier_basis0 + lVar141 + 0x4a0);
      fVar200 = auVar189._0_4_;
      fVar215 = auVar189._4_4_;
      fVar218 = auVar189._8_4_;
      fVar221 = auVar189._12_4_;
      auVar189 = vshufps_avx(auVar338,auVar338,0x55);
      register0x00001550 = auVar189;
      _local_600 = auVar189;
      fVar337 = auVar189._0_4_;
      fVar343 = auVar189._4_4_;
      fVar344 = auVar189._8_4_;
      fVar346 = auVar189._12_4_;
      auVar189 = vshufps_avx(auVar126,auVar126,0xff);
      register0x00001590 = auVar189;
      _local_a0 = auVar189;
      fVar345 = auVar189._0_4_;
      fVar347 = auVar189._4_4_;
      fVar348 = auVar189._8_4_;
      fVar352 = auVar189._12_4_;
      auVar189 = vshufps_avx(auVar149,auVar149,0);
      register0x00001310 = auVar189;
      _local_100 = auVar189;
      pauVar7 = (undefined1 (*) [32])(bezier_basis0 + lVar141);
      fVar232 = *(float *)*pauVar7;
      fVar238 = *(float *)(bezier_basis0 + lVar141 + 4);
      fVar239 = *(float *)(bezier_basis0 + lVar141 + 8);
      fVar241 = *(float *)(bezier_basis0 + lVar141 + 0xc);
      fVar244 = *(float *)(bezier_basis0 + lVar141 + 0x10);
      fVar245 = *(float *)(bezier_basis0 + lVar141 + 0x14);
      fVar246 = *(float *)(bezier_basis0 + lVar141 + 0x18);
      auVar132 = *(undefined1 (*) [28])*pauVar7;
      fVar225 = auVar189._0_4_;
      fVar231 = auVar189._4_4_;
      fVar240 = auVar189._8_4_;
      fVar243 = auVar189._12_4_;
      auVar331._0_4_ = fVar225 * fVar232 + fVar200 * fVar299 + fVar274 * fVar248 + fVar319 * fVar199
      ;
      auVar331._4_4_ = fVar231 * fVar238 + fVar215 * fVar223 + fVar275 * fVar255 + fVar324 * fVar214
      ;
      auVar331._8_4_ = fVar240 * fVar239 + fVar218 * fVar302 + fVar276 * fVar257 + fVar325 * fVar217
      ;
      auVar331._12_4_ =
           fVar243 * fVar241 + fVar221 * fVar301 + fVar277 * fVar259 + fVar326 * fVar220;
      auVar331._16_4_ =
           fVar225 * fVar244 + fVar200 * fStack_430 + fVar274 * fVar260 + fVar319 * fVar224;
      auVar331._20_4_ =
           fVar231 * fVar245 + fVar215 * fStack_42c + fVar275 * fVar261 + fVar324 * fVar227;
      auVar331._24_4_ =
           fVar240 * fVar246 + fVar218 * fStack_428 + fVar276 * fVar262 + fVar325 * fVar230;
      auVar331._28_4_ = fStack_424 + fVar221 + fVar277 + 0.0;
      auVar189 = vshufps_avx(auVar149,auVar149,0x55);
      register0x000013d0 = auVar189;
      _local_3a0 = auVar189;
      fVar278 = auVar189._0_4_;
      fVar287 = auVar189._4_4_;
      fVar288 = auVar189._8_4_;
      fVar289 = auVar189._12_4_;
      auVar329._0_4_ = fVar337 * fVar299 + fVar222 * fVar248 + fVar355 * fVar199 + fVar278 * fVar232
      ;
      auVar329._4_4_ = fVar343 * fVar223 + fVar228 * fVar255 + fVar358 * fVar214 + fVar287 * fVar238
      ;
      auVar329._8_4_ = fVar344 * fVar302 + fVar308 * fVar257 + fVar359 * fVar217 + fVar288 * fVar239
      ;
      auVar329._12_4_ =
           fVar346 * fVar301 + fVar242 * fVar259 + fVar360 * fVar220 + fVar289 * fVar241;
      auVar329._16_4_ =
           fVar337 * fStack_430 + fVar222 * fVar260 + fVar355 * fVar224 + fVar278 * fVar244;
      auVar329._20_4_ =
           fVar343 * fStack_42c + fVar228 * fVar261 + fVar358 * fVar227 + fVar287 * fVar245;
      auVar329._24_4_ =
           fVar344 * fStack_428 + fVar308 * fVar262 + fVar359 * fVar230 + fVar288 * fVar246;
      auVar329._28_4_ = fVar277 + 0.0 + 0.0 + 0.0;
      auVar123._12_4_ = fStack_774;
      auVar123._0_12_ = *pauVar1;
      auVar189 = vpermilps_avx(auVar123,0xff);
      register0x00001450 = auVar189;
      _local_160 = auVar189;
      _local_320 = *pauVar7;
      auVar33 = _local_320;
      fVar309 = auVar189._0_4_;
      fVar317 = auVar189._4_4_;
      fVar318 = auVar189._8_4_;
      local_7a0._0_4_ =
           fVar309 * fVar232 + fVar345 * fVar299 + fVar249 * fVar248 + fVar290 * fVar199;
      local_7a0._4_4_ =
           fVar317 * fVar238 + fVar347 * fVar223 + fVar256 * fVar255 + fVar297 * fVar214;
      fStack_798 = fVar318 * fVar239 + fVar348 * fVar302 + fVar258 * fVar257 + fVar298 * fVar217;
      fStack_794 = auVar189._12_4_ * fVar241 +
                   fVar352 * fVar301 + auVar17._12_4_ * fVar259 + fVar300 * fVar220;
      fStack_790 = fVar309 * fVar244 + fVar345 * fStack_430 + fVar249 * fVar260 + fVar290 * fVar224;
      fStack_78c = fVar317 * fVar245 + fVar347 * fStack_42c + fVar256 * fVar261 + fVar297 * fVar227;
      fStack_788 = fVar318 * fVar246 + fVar348 * fStack_428 + fVar258 * fVar262 + fVar298 * fVar230;
      fStack_784 = 0.0;
      fVar303 = *(float *)(bezier_basis1 + lVar141 + 0x908);
      fVar226 = *(float *)(bezier_basis1 + lVar141 + 0x90c);
      fVar304 = *(float *)(bezier_basis1 + lVar141 + 0x910);
      fVar305 = *(float *)(bezier_basis1 + lVar141 + 0x914);
      fVar307 = *(float *)(bezier_basis1 + lVar141 + 0x918);
      fVar229 = *(float *)(bezier_basis1 + lVar141 + 0x91c);
      fVar306 = *(float *)(bezier_basis1 + lVar141 + 0x920);
      fVar199 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar141 + 0xd8c);
      fVar214 = *(float *)(bezier_basis1 + lVar141 + 0xd90);
      fVar217 = *(float *)(bezier_basis1 + lVar141 + 0xd94);
      fVar220 = *(float *)(bezier_basis1 + lVar141 + 0xd98);
      fVar224 = *(float *)(bezier_basis1 + lVar141 + 0xd9c);
      fVar227 = *(float *)(bezier_basis1 + lVar141 + 0xda0);
      fVar230 = *(float *)(bezier_basis1 + lVar141 + 0xda4);
      auVar133 = *(undefined1 (*) [28])(bezier_basis1 + lVar141 + 0xd8c);
      fVar147 = *(float *)(bezier_basis1 + lVar141 + 0x484);
      fVar165 = *(float *)(bezier_basis1 + lVar141 + 0x488);
      fVar166 = *(float *)(bezier_basis1 + lVar141 + 0x48c);
      fVar167 = *(float *)(bezier_basis1 + lVar141 + 0x490);
      fVar168 = *(float *)(bezier_basis1 + lVar141 + 0x494);
      fVar169 = *(float *)(bezier_basis1 + lVar141 + 0x498);
      fVar170 = *(float *)(bezier_basis1 + lVar141 + 0x49c);
      fVar232 = fVar346 + *(float *)(bezier_basis0 + lVar141 + 0x1c) + 0.0;
      fVar171 = *(float *)(bezier_basis1 + lVar141);
      fVar263 = *(float *)(bezier_basis1 + lVar141 + 4);
      fVar273 = *(float *)(bezier_basis1 + lVar141 + 8);
      fVar247 = *(float *)(bezier_basis1 + lVar141 + 0xc);
      fVar198 = *(float *)(bezier_basis1 + lVar141 + 0x10);
      fVar216 = *(float *)(bezier_basis1 + lVar141 + 0x14);
      fVar219 = *(float *)(bezier_basis1 + lVar141 + 0x18);
      local_520._0_4_ =
           fVar171 * fVar225 + fVar200 * fVar147 + fVar303 * fVar274 + fVar319 * fVar199;
      local_520._4_4_ =
           fVar263 * fVar231 + fVar215 * fVar165 + fVar226 * fVar275 + fVar324 * fVar214;
      fStack_518 = fVar273 * fVar240 + fVar218 * fVar166 + fVar304 * fVar276 + fVar325 * fVar217;
      fStack_514 = fVar247 * fVar243 + fVar221 * fVar167 + fVar305 * fVar277 + fVar326 * fVar220;
      fStack_510 = fVar198 * fVar225 + fVar200 * fVar168 + fVar307 * fVar274 + fVar319 * fVar224;
      fStack_50c = fVar216 * fVar231 + fVar215 * fVar169 + fVar229 * fVar275 + fVar324 * fVar227;
      fStack_508 = fVar219 * fVar240 + fVar218 * fVar170 + fVar306 * fVar276 + fVar325 * fVar230;
      fStack_504 = fVar352 + fVar232;
      local_420._0_4_ =
           fVar171 * fVar278 + fVar337 * fVar147 + fVar303 * fVar222 + fVar355 * fVar199;
      local_420._4_4_ =
           fVar263 * fVar287 + fVar343 * fVar165 + fVar226 * fVar228 + fVar358 * fVar214;
      fStack_418 = fVar273 * fVar288 + fVar344 * fVar166 + fVar304 * fVar308 + fVar359 * fVar217;
      fStack_414 = fVar247 * fVar289 + fVar346 * fVar167 + fVar305 * fVar242 + fVar360 * fVar220;
      fStack_410 = fVar198 * fVar278 + fVar337 * fVar168 + fVar307 * fVar222 + fVar355 * fVar224;
      fStack_40c = fVar216 * fVar287 + fVar343 * fVar169 + fVar229 * fVar228 + fVar358 * fVar227;
      fStack_408 = fVar219 * fVar288 + fVar344 * fVar170 + fVar306 * fVar308 + fVar359 * fVar230;
      fStack_404 = fVar232 + fVar346 + fStack_424 + 0.0;
      local_480._0_4_ =
           fVar345 * fVar147 + fVar249 * fVar303 + fVar290 * fVar199 + fVar309 * fVar171;
      local_480._4_4_ =
           fVar347 * fVar165 + fVar256 * fVar226 + fVar297 * fVar214 + fVar317 * fVar263;
      local_480._8_4_ =
           fVar348 * fVar166 + fVar258 * fVar304 + fVar298 * fVar217 + fVar318 * fVar273;
      local_480._12_4_ =
           fVar352 * fVar167 + auVar17._12_4_ * fVar305 + fVar300 * fVar220 +
           auVar189._12_4_ * fVar247;
      local_480._16_4_ =
           fVar345 * fVar168 + fVar249 * fVar307 + fVar290 * fVar224 + fVar309 * fVar198;
      local_480._20_4_ =
           fVar347 * fVar169 + fVar256 * fVar229 + fVar297 * fVar227 + fVar317 * fVar216;
      local_480._24_4_ =
           fVar348 * fVar170 + fVar258 * fVar306 + fVar298 * fVar230 + fVar318 * fVar219;
      local_480._28_4_ = fVar346 + fVar300 + fStack_424 + fVar232;
      auVar30 = vsubps_avx(_local_520,auVar331);
      auVar31 = vsubps_avx(_local_420,auVar329);
      fVar199 = auVar30._0_4_;
      fVar217 = auVar30._4_4_;
      auVar38._4_4_ = auVar329._4_4_ * fVar217;
      auVar38._0_4_ = auVar329._0_4_ * fVar199;
      fVar224 = auVar30._8_4_;
      auVar38._8_4_ = auVar329._8_4_ * fVar224;
      fVar230 = auVar30._12_4_;
      auVar38._12_4_ = auVar329._12_4_ * fVar230;
      fVar238 = auVar30._16_4_;
      auVar38._16_4_ = auVar329._16_4_ * fVar238;
      fVar241 = auVar30._20_4_;
      auVar38._20_4_ = auVar329._20_4_ * fVar241;
      fVar245 = auVar30._24_4_;
      auVar38._24_4_ = auVar329._24_4_ * fVar245;
      auVar38._28_4_ = fVar232;
      fVar214 = auVar31._0_4_;
      fVar220 = auVar31._4_4_;
      auVar39._4_4_ = auVar331._4_4_ * fVar220;
      auVar39._0_4_ = auVar331._0_4_ * fVar214;
      fVar227 = auVar31._8_4_;
      auVar39._8_4_ = auVar331._8_4_ * fVar227;
      fVar232 = auVar31._12_4_;
      auVar39._12_4_ = auVar331._12_4_ * fVar232;
      fVar239 = auVar31._16_4_;
      auVar39._16_4_ = auVar331._16_4_ * fVar239;
      fVar244 = auVar31._20_4_;
      auVar39._20_4_ = auVar331._20_4_ * fVar244;
      fVar246 = auVar31._24_4_;
      auVar39._24_4_ = auVar331._24_4_ * fVar246;
      auVar39._28_4_ = fStack_404;
      auVar29 = vsubps_avx(auVar38,auVar39);
      auVar157 = vmaxps_avx(_local_7a0,local_480);
      auVar40._4_4_ = auVar157._4_4_ * auVar157._4_4_ * (fVar217 * fVar217 + fVar220 * fVar220);
      auVar40._0_4_ = auVar157._0_4_ * auVar157._0_4_ * (fVar199 * fVar199 + fVar214 * fVar214);
      auVar40._8_4_ = auVar157._8_4_ * auVar157._8_4_ * (fVar224 * fVar224 + fVar227 * fVar227);
      auVar40._12_4_ = auVar157._12_4_ * auVar157._12_4_ * (fVar230 * fVar230 + fVar232 * fVar232);
      auVar40._16_4_ = auVar157._16_4_ * auVar157._16_4_ * (fVar238 * fVar238 + fVar239 * fVar239);
      auVar40._20_4_ = auVar157._20_4_ * auVar157._20_4_ * (fVar241 * fVar241 + fVar244 * fVar244);
      auVar40._24_4_ = auVar157._24_4_ * auVar157._24_4_ * (fVar245 * fVar245 + fVar246 * fVar246);
      auVar40._28_4_ = auVar31._28_4_ + fStack_404;
      auVar41._4_4_ = auVar29._4_4_ * auVar29._4_4_;
      auVar41._0_4_ = auVar29._0_4_ * auVar29._0_4_;
      auVar41._8_4_ = auVar29._8_4_ * auVar29._8_4_;
      auVar41._12_4_ = auVar29._12_4_ * auVar29._12_4_;
      auVar41._16_4_ = auVar29._16_4_ * auVar29._16_4_;
      auVar41._20_4_ = auVar29._20_4_ * auVar29._20_4_;
      auVar41._24_4_ = auVar29._24_4_ * auVar29._24_4_;
      auVar41._28_4_ = auVar29._28_4_;
      auVar157 = vcmpps_avx(auVar41,auVar40,2);
      auVar202 = ZEXT416((uint)(auVar203._0_4_ * 4.7683716e-07));
      local_700._0_16_ = auVar202;
      auVar203 = ZEXT416((uint)(float)(int)uVar25);
      _local_400 = auVar203;
      auVar203 = vshufps_avx(auVar203,auVar203,0);
      auVar208._16_16_ = auVar203;
      auVar208._0_16_ = auVar203;
      auVar29 = vcmpps_avx(_DAT_01faff40,auVar208,1);
      auVar203 = vpermilps_avx(auVar149,0xaa);
      register0x00001450 = auVar203;
      _local_180 = auVar203;
      auVar189 = vpermilps_avx(auVar338,0xaa);
      register0x00001550 = auVar189;
      _local_300 = auVar189;
      auVar185 = vpermilps_avx(auVar279,0xaa);
      register0x00001590 = auVar185;
      _local_2e0 = auVar185;
      auVar204 = vpermilps_avx(auVar310,0xaa);
      register0x00001510 = auVar204;
      _local_660 = auVar204;
      auVar32 = auVar29 & auVar157;
      fVar199 = fVar274;
      fVar214 = fVar275;
      fVar217 = fVar276;
      fVar220 = fVar277;
      fVar224 = fVar200;
      fVar227 = fVar215;
      fVar230 = fVar218;
      if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar32 >> 0x7f,0) == '\0') &&
            (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar32 >> 0xbf,0) == '\0') &&
          (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar32[0x1f])
      {
        auVar296 = ZEXT3264(local_6c0);
        auVar316 = ZEXT3264(local_680);
        auVar342 = ZEXT3264(local_6a0);
        auVar351 = ZEXT3264(_local_600);
      }
      else {
        auVar157 = vandps_avx(auVar157,auVar29);
        fVar249 = auVar203._0_4_;
        fVar256 = auVar203._4_4_;
        fVar258 = auVar203._8_4_;
        fVar290 = auVar203._12_4_;
        fVar317 = auVar189._0_4_;
        fVar318 = auVar189._4_4_;
        fVar345 = auVar189._8_4_;
        fVar347 = auVar189._12_4_;
        fVar348 = auVar185._0_4_;
        fVar352 = auVar185._4_4_;
        fVar353 = auVar185._8_4_;
        fVar354 = auVar185._12_4_;
        local_460._0_4_ = auVar133._0_4_;
        local_460._4_4_ = auVar133._4_4_;
        fStack_458 = auVar133._8_4_;
        fStack_454 = auVar133._12_4_;
        fStack_450 = auVar133._16_4_;
        fStack_44c = auVar133._20_4_;
        fStack_448 = auVar133._24_4_;
        fVar297 = auVar204._0_4_;
        fVar298 = auVar204._4_4_;
        fVar300 = auVar204._8_4_;
        fVar309 = auVar204._12_4_;
        local_460._0_4_ =
             fVar249 * fVar171 +
             fVar317 * fVar147 + fVar348 * fVar303 + fVar297 * (float)local_460._0_4_;
        local_460._4_4_ =
             fVar256 * fVar263 +
             fVar318 * fVar165 + fVar352 * fVar226 + fVar298 * (float)local_460._4_4_;
        fStack_458 = fVar258 * fVar273 +
                     fVar345 * fVar166 + fVar353 * fVar304 + fVar300 * fStack_458;
        fStack_454 = fVar290 * fVar247 +
                     fVar347 * fVar167 + fVar354 * fVar305 + fVar309 * fStack_454;
        fStack_450 = fVar249 * fVar198 +
                     fVar317 * fVar168 + fVar348 * fVar307 + fVar297 * fStack_450;
        fStack_44c = fVar256 * fVar216 +
                     fVar318 * fVar169 + fVar352 * fVar229 + fVar298 * fStack_44c;
        fStack_448 = fVar258 * fVar219 +
                     fVar345 * fVar170 + fVar353 * fVar306 + fVar300 * fStack_448;
        fStack_444 = auVar157._28_4_ +
                     auVar29._28_4_ + *(float *)(bezier_basis1 + lVar141 + 0x924) + 0.0;
        local_320._0_4_ = auVar132._0_4_;
        local_320._4_4_ = auVar132._4_4_;
        fStack_318 = auVar132._8_4_;
        fStack_314 = auVar132._12_4_;
        fStack_310 = auVar132._16_4_;
        fStack_30c = auVar132._20_4_;
        fStack_308 = auVar132._24_4_;
        local_5a0._0_4_ = auVar131._0_4_;
        local_5a0._4_4_ = auVar131._4_4_;
        fStack_598 = auVar131._8_4_;
        fStack_594 = auVar131._12_4_;
        fStack_590 = auVar131._16_4_;
        fStack_58c = auVar131._20_4_;
        fStack_588 = auVar131._24_4_;
        local_540 = fVar249 * (float)local_320._0_4_ +
                    fVar317 * fVar299 + fVar348 * fVar248 + fVar297 * (float)local_5a0._0_4_;
        fStack_53c = fVar256 * (float)local_320._4_4_ +
                     fVar318 * fVar223 + fVar352 * fVar255 + fVar298 * (float)local_5a0._4_4_;
        fStack_538 = fVar258 * fStack_318 +
                     fVar345 * fVar302 + fVar353 * fVar257 + fVar300 * fStack_598;
        fStack_534 = fVar290 * fStack_314 +
                     fVar347 * fVar301 + fVar354 * fVar259 + fVar309 * fStack_594;
        fStack_530 = fVar249 * fStack_310 +
                     fVar317 * fStack_430 + fVar348 * fVar260 + fVar297 * fStack_590;
        fStack_52c = fVar256 * fStack_30c +
                     fVar318 * fStack_42c + fVar352 * fVar261 + fVar298 * fStack_58c;
        fStack_528 = fVar258 * fStack_308 +
                     fVar345 * fStack_428 + fVar353 * fVar262 + fVar300 * fStack_588;
        fStack_524 = fVar289 + fStack_444 + auVar157._28_4_ + auVar29._28_4_;
        fVar232 = *(float *)(bezier_basis0 + lVar141 + 0x1210);
        fVar238 = *(float *)(bezier_basis0 + lVar141 + 0x1214);
        fVar239 = *(float *)(bezier_basis0 + lVar141 + 0x1218);
        fVar241 = *(float *)(bezier_basis0 + lVar141 + 0x121c);
        fVar244 = *(float *)(bezier_basis0 + lVar141 + 0x1220);
        fVar245 = *(float *)(bezier_basis0 + lVar141 + 0x1224);
        fVar246 = *(float *)(bezier_basis0 + lVar141 + 0x1228);
        fVar248 = *(float *)(bezier_basis0 + lVar141 + 0x1694);
        fVar255 = *(float *)(bezier_basis0 + lVar141 + 0x1698);
        fVar257 = *(float *)(bezier_basis0 + lVar141 + 0x169c);
        fVar259 = *(float *)(bezier_basis0 + lVar141 + 0x16a0);
        fVar260 = *(float *)(bezier_basis0 + lVar141 + 0x16a4);
        fVar261 = *(float *)(bezier_basis0 + lVar141 + 0x16a8);
        fVar262 = *(float *)(bezier_basis0 + lVar141 + 0x16ac);
        fVar299 = *(float *)(bezier_basis0 + lVar141 + 0x1b18);
        fVar223 = *(float *)(bezier_basis0 + lVar141 + 0x1b1c);
        fVar302 = *(float *)(bezier_basis0 + lVar141 + 0x1b20);
        fVar301 = *(float *)(bezier_basis0 + lVar141 + 0x1b24);
        fVar303 = *(float *)(bezier_basis0 + lVar141 + 0x1b28);
        fVar226 = *(float *)(bezier_basis0 + lVar141 + 0x1b2c);
        fVar304 = *(float *)(bezier_basis0 + lVar141 + 0x1b30);
        fVar305 = *(float *)(bezier_basis0 + lVar141 + 0x1f9c);
        fVar307 = *(float *)(bezier_basis0 + lVar141 + 0x1fa0);
        fVar229 = *(float *)(bezier_basis0 + lVar141 + 0x1fa4);
        fVar306 = *(float *)(bezier_basis0 + lVar141 + 0x1fa8);
        fVar147 = *(float *)(bezier_basis0 + lVar141 + 0x1fac);
        fVar165 = *(float *)(bezier_basis0 + lVar141 + 0x1fb0);
        fVar166 = *(float *)(bezier_basis0 + lVar141 + 0x1fb4);
        fVar167 = *(float *)(bezier_basis0 + lVar141 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar141 + 0x1fb8);
        fVar168 = *(float *)(bezier_basis0 + lVar141 + 0x16b0) + fVar167;
        local_440 = fVar225 * fVar232 + fVar200 * fVar248 + fVar274 * fVar299 + fVar319 * fVar305;
        fStack_43c = fVar231 * fVar238 + fVar215 * fVar255 + fVar275 * fVar223 + fVar324 * fVar307;
        fStack_438 = fVar240 * fVar239 + fVar218 * fVar257 + fVar276 * fVar302 + fVar325 * fVar229;
        fStack_434 = fVar243 * fVar241 + fVar221 * fVar259 + fVar277 * fVar301 + fVar326 * fVar306;
        fStack_430 = fVar225 * fVar244 + fVar200 * fVar260 + fVar274 * fVar303 + fVar319 * fVar147;
        fStack_42c = fVar231 * fVar245 + fVar215 * fVar261 + fVar275 * fVar226 + fVar324 * fVar165;
        fStack_428 = fVar240 * fVar246 + fVar218 * fVar262 + fVar276 * fVar304 + fVar325 * fVar166;
        fStack_424 = *(float *)(bezier_basis0 + lVar141 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar141 + 0x1fb8) +
                     fVar290 + *(float *)(bezier_basis1 + lVar141 + 0x4a0);
        auVar178._0_4_ =
             fVar278 * fVar232 + fVar299 * fVar222 + fVar355 * fVar305 + fVar337 * fVar248;
        auVar178._4_4_ =
             fVar287 * fVar238 + fVar223 * fVar228 + fVar358 * fVar307 + fVar343 * fVar255;
        auVar178._8_4_ =
             fVar288 * fVar239 + fVar302 * fVar308 + fVar359 * fVar229 + fVar344 * fVar257;
        auVar178._12_4_ =
             fVar289 * fVar241 + fVar301 * fVar242 + fVar360 * fVar306 + fVar346 * fVar259;
        auVar178._16_4_ =
             fVar278 * fVar244 + fVar303 * fVar222 + fVar355 * fVar147 + fVar337 * fVar260;
        auVar178._20_4_ =
             fVar287 * fVar245 + fVar226 * fVar228 + fVar358 * fVar165 + fVar343 * fVar261;
        auVar178._24_4_ =
             fVar288 * fVar246 + fVar304 * fVar308 + fVar359 * fVar166 + fVar344 * fVar262;
        auVar178._28_4_ =
             fVar167 + fVar290 + 0.0 + fVar290 + *(float *)(bezier_basis1 + lVar141 + 0x4a0);
        auVar268._0_4_ =
             fVar317 * fVar248 + fVar348 * fVar299 + fVar297 * fVar305 + fVar249 * fVar232;
        auVar268._4_4_ =
             fVar318 * fVar255 + fVar352 * fVar223 + fVar298 * fVar307 + fVar256 * fVar238;
        auVar268._8_4_ =
             fVar345 * fVar257 + fVar353 * fVar302 + fVar300 * fVar229 + fVar258 * fVar239;
        auVar268._12_4_ =
             fVar347 * fVar259 + fVar354 * fVar301 + fVar309 * fVar306 + fVar290 * fVar241;
        auVar268._16_4_ =
             fVar317 * fVar260 + fVar348 * fVar303 + fVar297 * fVar147 + fVar249 * fVar244;
        auVar268._20_4_ =
             fVar318 * fVar261 + fVar352 * fVar226 + fVar298 * fVar165 + fVar256 * fVar245;
        auVar268._24_4_ =
             fVar345 * fVar262 + fVar353 * fVar304 + fVar300 * fVar166 + fVar258 * fVar246;
        auVar268._28_4_ = fVar168 + *(float *)(bezier_basis0 + lVar141 + 0x122c);
        fVar232 = *(float *)(bezier_basis1 + lVar141 + 0x1b18);
        fVar238 = *(float *)(bezier_basis1 + lVar141 + 0x1b1c);
        fVar239 = *(float *)(bezier_basis1 + lVar141 + 0x1b20);
        fVar241 = *(float *)(bezier_basis1 + lVar141 + 0x1b24);
        fVar244 = *(float *)(bezier_basis1 + lVar141 + 0x1b28);
        fVar245 = *(float *)(bezier_basis1 + lVar141 + 0x1b2c);
        fVar246 = *(float *)(bezier_basis1 + lVar141 + 0x1b30);
        fVar248 = *(float *)(bezier_basis1 + lVar141 + 0x1f9c);
        fVar255 = *(float *)(bezier_basis1 + lVar141 + 0x1fa0);
        fVar257 = *(float *)(bezier_basis1 + lVar141 + 0x1fa4);
        fVar259 = *(float *)(bezier_basis1 + lVar141 + 0x1fa8);
        fVar260 = *(float *)(bezier_basis1 + lVar141 + 0x1fac);
        fVar261 = *(float *)(bezier_basis1 + lVar141 + 0x1fb0);
        fVar262 = *(float *)(bezier_basis1 + lVar141 + 0x1fb4);
        fVar299 = *(float *)(bezier_basis1 + lVar141 + 0x1694);
        fVar223 = *(float *)(bezier_basis1 + lVar141 + 0x1698);
        fVar302 = *(float *)(bezier_basis1 + lVar141 + 0x169c);
        fVar301 = *(float *)(bezier_basis1 + lVar141 + 0x16a0);
        fVar303 = *(float *)(bezier_basis1 + lVar141 + 0x16a4);
        fVar226 = *(float *)(bezier_basis1 + lVar141 + 0x16a8);
        fVar304 = *(float *)(bezier_basis1 + lVar141 + 0x16ac);
        fVar305 = *(float *)(bezier_basis1 + lVar141 + 0x1210);
        fVar307 = *(float *)(bezier_basis1 + lVar141 + 0x1214);
        fVar229 = *(float *)(bezier_basis1 + lVar141 + 0x1218);
        fVar306 = *(float *)(bezier_basis1 + lVar141 + 0x121c);
        fVar147 = *(float *)(bezier_basis1 + lVar141 + 0x1220);
        fVar165 = *(float *)(bezier_basis1 + lVar141 + 0x1224);
        fVar166 = *(float *)(bezier_basis1 + lVar141 + 0x1228);
        auVar293._0_4_ =
             fVar225 * fVar305 + fVar200 * fVar299 + fVar274 * fVar232 + fVar319 * fVar248;
        auVar293._4_4_ =
             fVar231 * fVar307 + fVar215 * fVar223 + fVar275 * fVar238 + fVar324 * fVar255;
        auVar293._8_4_ =
             fVar240 * fVar229 + fVar218 * fVar302 + fVar276 * fVar239 + fVar325 * fVar257;
        auVar293._12_4_ =
             fVar243 * fVar306 + fVar221 * fVar301 + fVar277 * fVar241 + fVar326 * fVar259;
        auVar293._16_4_ =
             fVar225 * fVar147 + fVar200 * fVar303 + fVar274 * fVar244 + fVar319 * fVar260;
        auVar293._20_4_ =
             fVar231 * fVar165 + fVar215 * fVar226 + fVar275 * fVar245 + fVar324 * fVar261;
        auVar293._24_4_ =
             fVar240 * fVar166 + fVar218 * fVar304 + fVar276 * fVar246 + fVar325 * fVar262;
        auVar293._28_4_ = fVar360 + fVar360 + fVar290 + fVar168;
        auVar312._0_4_ =
             fVar278 * fVar305 + fVar337 * fVar299 + fVar232 * fVar222 + fVar355 * fVar248;
        auVar312._4_4_ =
             fVar287 * fVar307 + fVar343 * fVar223 + fVar238 * fVar228 + fVar358 * fVar255;
        auVar312._8_4_ =
             fVar288 * fVar229 + fVar344 * fVar302 + fVar239 * fVar308 + fVar359 * fVar257;
        auVar312._12_4_ =
             fVar289 * fVar306 + fVar346 * fVar301 + fVar241 * fVar242 + fVar360 * fVar259;
        auVar312._16_4_ =
             fVar278 * fVar147 + fVar337 * fVar303 + fVar244 * fVar222 + fVar355 * fVar260;
        auVar312._20_4_ =
             fVar287 * fVar165 + fVar343 * fVar226 + fVar245 * fVar228 + fVar358 * fVar261;
        auVar312._24_4_ =
             fVar288 * fVar166 + fVar344 * fVar304 + fVar246 * fVar308 + fVar359 * fVar262;
        auVar312._28_4_ = fVar360 + fVar360 + fVar360 + fVar290;
        auVar196._0_4_ =
             fVar249 * fVar305 + fVar317 * fVar299 + fVar348 * fVar232 + fVar248 * fVar297;
        auVar196._4_4_ =
             fVar256 * fVar307 + fVar318 * fVar223 + fVar352 * fVar238 + fVar255 * fVar298;
        auVar196._8_4_ =
             fVar258 * fVar229 + fVar345 * fVar302 + fVar353 * fVar239 + fVar257 * fVar300;
        auVar196._12_4_ =
             fVar290 * fVar306 + fVar347 * fVar301 + fVar354 * fVar241 + fVar259 * fVar309;
        auVar196._16_4_ =
             fVar249 * fVar147 + fVar317 * fVar303 + fVar348 * fVar244 + fVar260 * fVar297;
        auVar196._20_4_ =
             fVar256 * fVar165 + fVar318 * fVar226 + fVar352 * fVar245 + fVar261 * fVar298;
        auVar196._24_4_ =
             fVar258 * fVar166 + fVar345 * fVar304 + fVar353 * fVar246 + fVar262 * fVar300;
        auVar196._28_4_ =
             *(float *)(bezier_basis1 + lVar141 + 0x122c) +
             *(float *)(bezier_basis1 + lVar141 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar141 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar141 + 0x1fb8);
        auVar234._8_4_ = 0x7fffffff;
        auVar234._0_8_ = 0x7fffffff7fffffff;
        auVar234._12_4_ = 0x7fffffff;
        auVar234._16_4_ = 0x7fffffff;
        auVar234._20_4_ = 0x7fffffff;
        auVar234._24_4_ = 0x7fffffff;
        auVar234._28_4_ = 0x7fffffff;
        auVar130._4_4_ = fStack_43c;
        auVar130._0_4_ = local_440;
        auVar130._8_4_ = fStack_438;
        auVar130._12_4_ = fStack_434;
        auVar130._16_4_ = fStack_430;
        auVar130._20_4_ = fStack_42c;
        auVar130._24_4_ = fStack_428;
        auVar130._28_4_ = fStack_424;
        auVar29 = vandps_avx(auVar130,auVar234);
        auVar32 = vandps_avx(auVar178,auVar234);
        auVar32 = vmaxps_avx(auVar29,auVar32);
        auVar29 = vandps_avx(auVar268,auVar234);
        auVar29 = vmaxps_avx(auVar32,auVar29);
        auVar203 = vpermilps_avx(auVar202,0);
        auVar269._16_16_ = auVar203;
        auVar269._0_16_ = auVar203;
        auVar29 = vcmpps_avx(auVar29,auVar269,1);
        auVar34 = vblendvps_avx(auVar130,auVar30,auVar29);
        auVar35 = vblendvps_avx(auVar178,auVar31,auVar29);
        auVar29 = vandps_avx(auVar293,auVar234);
        auVar32 = vandps_avx(auVar312,auVar234);
        auVar36 = vmaxps_avx(auVar29,auVar32);
        auVar29 = vandps_avx(auVar196,auVar234);
        auVar29 = vmaxps_avx(auVar36,auVar29);
        auVar36 = vcmpps_avx(auVar29,auVar269,1);
        auVar29 = vblendvps_avx(auVar293,auVar30,auVar36);
        auVar30 = vblendvps_avx(auVar312,auVar31,auVar36);
        fVar168 = auVar34._0_4_;
        fVar169 = auVar34._4_4_;
        fVar170 = auVar34._8_4_;
        fVar171 = auVar34._12_4_;
        fVar263 = auVar34._16_4_;
        fVar273 = auVar34._20_4_;
        fVar247 = auVar34._24_4_;
        fVar198 = auVar29._0_4_;
        fVar216 = auVar29._4_4_;
        fVar219 = auVar29._8_4_;
        fVar222 = auVar29._12_4_;
        fVar225 = auVar29._16_4_;
        fVar228 = auVar29._20_4_;
        fVar231 = auVar29._24_4_;
        fVar308 = -auVar29._28_4_;
        fVar232 = auVar35._0_4_;
        fVar244 = auVar35._4_4_;
        fVar255 = auVar35._8_4_;
        fVar261 = auVar35._12_4_;
        fVar302 = auVar35._16_4_;
        fVar304 = auVar35._20_4_;
        fVar306 = auVar35._24_4_;
        auVar153._0_4_ = fVar232 * fVar232 + fVar168 * fVar168;
        auVar153._4_4_ = fVar244 * fVar244 + fVar169 * fVar169;
        auVar153._8_4_ = fVar255 * fVar255 + fVar170 * fVar170;
        auVar153._12_4_ = fVar261 * fVar261 + fVar171 * fVar171;
        auVar153._16_4_ = fVar302 * fVar302 + fVar263 * fVar263;
        auVar153._20_4_ = fVar304 * fVar304 + fVar273 * fVar273;
        auVar153._24_4_ = fVar306 * fVar306 + fVar247 * fVar247;
        auVar153._28_4_ = auVar312._28_4_ + auVar34._28_4_;
        auVar31 = vrsqrtps_avx(auVar153);
        fVar238 = auVar31._0_4_;
        fVar239 = auVar31._4_4_;
        auVar42._4_4_ = fVar239 * 1.5;
        auVar42._0_4_ = fVar238 * 1.5;
        fVar241 = auVar31._8_4_;
        auVar42._8_4_ = fVar241 * 1.5;
        fVar245 = auVar31._12_4_;
        auVar42._12_4_ = fVar245 * 1.5;
        fVar246 = auVar31._16_4_;
        auVar42._16_4_ = fVar246 * 1.5;
        fVar248 = auVar31._20_4_;
        auVar42._20_4_ = fVar248 * 1.5;
        fVar257 = auVar31._24_4_;
        fVar167 = auVar32._28_4_;
        auVar42._24_4_ = fVar257 * 1.5;
        auVar42._28_4_ = fVar167;
        auVar43._4_4_ = fVar239 * fVar239 * fVar239 * auVar153._4_4_ * 0.5;
        auVar43._0_4_ = fVar238 * fVar238 * fVar238 * auVar153._0_4_ * 0.5;
        auVar43._8_4_ = fVar241 * fVar241 * fVar241 * auVar153._8_4_ * 0.5;
        auVar43._12_4_ = fVar245 * fVar245 * fVar245 * auVar153._12_4_ * 0.5;
        auVar43._16_4_ = fVar246 * fVar246 * fVar246 * auVar153._16_4_ * 0.5;
        auVar43._20_4_ = fVar248 * fVar248 * fVar248 * auVar153._20_4_ * 0.5;
        auVar43._24_4_ = fVar257 * fVar257 * fVar257 * auVar153._24_4_ * 0.5;
        auVar43._28_4_ = auVar153._28_4_;
        auVar31 = vsubps_avx(auVar42,auVar43);
        fVar238 = auVar31._0_4_;
        fVar245 = auVar31._4_4_;
        fVar257 = auVar31._8_4_;
        fVar262 = auVar31._12_4_;
        fVar301 = auVar31._16_4_;
        fVar305 = auVar31._20_4_;
        fVar147 = auVar31._24_4_;
        fVar239 = auVar30._0_4_;
        fVar246 = auVar30._4_4_;
        fVar259 = auVar30._8_4_;
        fVar299 = auVar30._12_4_;
        fVar303 = auVar30._16_4_;
        fVar307 = auVar30._20_4_;
        fVar165 = auVar30._24_4_;
        auVar154._0_4_ = fVar239 * fVar239 + fVar198 * fVar198;
        auVar154._4_4_ = fVar246 * fVar246 + fVar216 * fVar216;
        auVar154._8_4_ = fVar259 * fVar259 + fVar219 * fVar219;
        auVar154._12_4_ = fVar299 * fVar299 + fVar222 * fVar222;
        auVar154._16_4_ = fVar303 * fVar303 + fVar225 * fVar225;
        auVar154._20_4_ = fVar307 * fVar307 + fVar228 * fVar228;
        auVar154._24_4_ = fVar165 * fVar165 + fVar231 * fVar231;
        auVar154._28_4_ = auVar29._28_4_ + auVar31._28_4_;
        auVar29 = vrsqrtps_avx(auVar154);
        fVar241 = auVar29._0_4_;
        fVar248 = auVar29._4_4_;
        auVar44._4_4_ = fVar248 * 1.5;
        auVar44._0_4_ = fVar241 * 1.5;
        fVar260 = auVar29._8_4_;
        auVar44._8_4_ = fVar260 * 1.5;
        fVar223 = auVar29._12_4_;
        auVar44._12_4_ = fVar223 * 1.5;
        fVar226 = auVar29._16_4_;
        auVar44._16_4_ = fVar226 * 1.5;
        fVar229 = auVar29._20_4_;
        auVar44._20_4_ = fVar229 * 1.5;
        fVar166 = auVar29._24_4_;
        auVar44._24_4_ = fVar166 * 1.5;
        auVar44._28_4_ = fVar167;
        auVar45._4_4_ = fVar248 * fVar248 * fVar248 * auVar154._4_4_ * 0.5;
        auVar45._0_4_ = fVar241 * fVar241 * fVar241 * auVar154._0_4_ * 0.5;
        auVar45._8_4_ = fVar260 * fVar260 * fVar260 * auVar154._8_4_ * 0.5;
        auVar45._12_4_ = fVar223 * fVar223 * fVar223 * auVar154._12_4_ * 0.5;
        auVar45._16_4_ = fVar226 * fVar226 * fVar226 * auVar154._16_4_ * 0.5;
        auVar45._20_4_ = fVar229 * fVar229 * fVar229 * auVar154._20_4_ * 0.5;
        auVar45._24_4_ = fVar166 * fVar166 * fVar166 * auVar154._24_4_ * 0.5;
        auVar45._28_4_ = auVar154._28_4_;
        auVar29 = vsubps_avx(auVar44,auVar45);
        fVar241 = auVar29._0_4_;
        fVar248 = auVar29._4_4_;
        fVar260 = auVar29._8_4_;
        fVar223 = auVar29._12_4_;
        fVar226 = auVar29._16_4_;
        fVar229 = auVar29._20_4_;
        fVar166 = auVar29._24_4_;
        fVar232 = (float)local_7a0._0_4_ * fVar232 * fVar238;
        fVar244 = (float)local_7a0._4_4_ * fVar244 * fVar245;
        auVar46._4_4_ = fVar244;
        auVar46._0_4_ = fVar232;
        fVar255 = fStack_798 * fVar255 * fVar257;
        auVar46._8_4_ = fVar255;
        fVar261 = fStack_794 * fVar261 * fVar262;
        auVar46._12_4_ = fVar261;
        fVar302 = fStack_790 * fVar302 * fVar301;
        auVar46._16_4_ = fVar302;
        fVar304 = fStack_78c * fVar304 * fVar305;
        auVar46._20_4_ = fVar304;
        fVar306 = fStack_788 * fVar306 * fVar147;
        auVar46._24_4_ = fVar306;
        auVar46._28_4_ = fVar308;
        local_5a0._4_4_ = fVar244 + auVar331._4_4_;
        local_5a0._0_4_ = fVar232 + auVar331._0_4_;
        fStack_598 = fVar255 + auVar331._8_4_;
        fStack_594 = fVar261 + auVar331._12_4_;
        fStack_590 = fVar302 + auVar331._16_4_;
        fStack_58c = fVar304 + auVar331._20_4_;
        fStack_588 = fVar306 + auVar331._24_4_;
        fStack_584 = fVar308 + auVar331._28_4_;
        fVar232 = (float)local_7a0._0_4_ * fVar238 * -fVar168;
        fVar244 = (float)local_7a0._4_4_ * fVar245 * -fVar169;
        auVar47._4_4_ = fVar244;
        auVar47._0_4_ = fVar232;
        fVar255 = fStack_798 * fVar257 * -fVar170;
        auVar47._8_4_ = fVar255;
        fVar261 = fStack_794 * fVar262 * -fVar171;
        auVar47._12_4_ = fVar261;
        fVar302 = fStack_790 * fVar301 * -fVar263;
        auVar47._16_4_ = fVar302;
        fVar304 = fStack_78c * fVar305 * -fVar273;
        auVar47._20_4_ = fVar304;
        fVar306 = fStack_788 * fVar147 * -fVar247;
        auVar47._24_4_ = fVar306;
        auVar47._28_4_ = fVar167;
        local_560._4_4_ = fVar244 + auVar329._4_4_;
        local_560._0_4_ = fVar232 + auVar329._0_4_;
        fStack_558 = fVar255 + auVar329._8_4_;
        fStack_554 = fVar261 + auVar329._12_4_;
        fStack_550 = fVar302 + auVar329._16_4_;
        fStack_54c = fVar304 + auVar329._20_4_;
        fStack_548 = fVar306 + auVar329._24_4_;
        fStack_544 = fVar167 + auVar329._28_4_;
        fVar232 = fVar238 * 0.0 * (float)local_7a0._0_4_;
        fVar238 = fVar245 * 0.0 * (float)local_7a0._4_4_;
        auVar48._4_4_ = fVar238;
        auVar48._0_4_ = fVar232;
        fVar244 = fVar257 * 0.0 * fStack_798;
        auVar48._8_4_ = fVar244;
        fVar245 = fVar262 * 0.0 * fStack_794;
        auVar48._12_4_ = fVar245;
        fVar255 = fVar301 * 0.0 * fStack_790;
        auVar48._16_4_ = fVar255;
        fVar257 = fVar305 * 0.0 * fStack_78c;
        auVar48._20_4_ = fVar257;
        fVar261 = fVar147 * 0.0 * fStack_788;
        auVar48._24_4_ = fVar261;
        auVar48._28_4_ = fVar290;
        auVar127._4_4_ = fStack_53c;
        auVar127._0_4_ = local_540;
        auVar127._8_4_ = fStack_538;
        auVar127._12_4_ = fStack_534;
        auVar127._16_4_ = fStack_530;
        auVar127._20_4_ = fStack_52c;
        auVar127._24_4_ = fStack_528;
        auVar127._28_4_ = fStack_524;
        auVar270._0_4_ = fVar232 + local_540;
        auVar270._4_4_ = fVar238 + fStack_53c;
        auVar270._8_4_ = fVar244 + fStack_538;
        auVar270._12_4_ = fVar245 + fStack_534;
        auVar270._16_4_ = fVar255 + fStack_530;
        auVar270._20_4_ = fVar257 + fStack_52c;
        auVar270._24_4_ = fVar261 + fStack_528;
        auVar270._28_4_ = fVar290 + fStack_524;
        fVar232 = local_480._0_4_ * fVar239 * fVar241;
        fVar238 = local_480._4_4_ * fVar246 * fVar248;
        auVar49._4_4_ = fVar238;
        auVar49._0_4_ = fVar232;
        fVar239 = local_480._8_4_ * fVar259 * fVar260;
        auVar49._8_4_ = fVar239;
        fVar244 = local_480._12_4_ * fVar299 * fVar223;
        auVar49._12_4_ = fVar244;
        fVar245 = local_480._16_4_ * fVar303 * fVar226;
        auVar49._16_4_ = fVar245;
        fVar246 = local_480._20_4_ * fVar307 * fVar229;
        auVar49._20_4_ = fVar246;
        fVar255 = local_480._24_4_ * fVar165 * fVar166;
        auVar49._24_4_ = fVar255;
        auVar49._28_4_ = auVar30._28_4_;
        auVar34 = vsubps_avx(auVar331,auVar46);
        auVar313._0_4_ = (float)local_520._0_4_ + fVar232;
        auVar313._4_4_ = (float)local_520._4_4_ + fVar238;
        auVar313._8_4_ = fStack_518 + fVar239;
        auVar313._12_4_ = fStack_514 + fVar244;
        auVar313._16_4_ = fStack_510 + fVar245;
        auVar313._20_4_ = fStack_50c + fVar246;
        auVar313._24_4_ = fStack_508 + fVar255;
        auVar313._28_4_ = fStack_504 + auVar30._28_4_;
        fVar232 = local_480._0_4_ * -fVar198 * fVar241;
        fVar238 = local_480._4_4_ * -fVar216 * fVar248;
        auVar50._4_4_ = fVar238;
        auVar50._0_4_ = fVar232;
        fVar239 = local_480._8_4_ * -fVar219 * fVar260;
        auVar50._8_4_ = fVar239;
        fVar244 = local_480._12_4_ * -fVar222 * fVar223;
        auVar50._12_4_ = fVar244;
        fVar245 = local_480._16_4_ * -fVar225 * fVar226;
        auVar50._16_4_ = fVar245;
        fVar246 = local_480._20_4_ * -fVar228 * fVar229;
        auVar50._20_4_ = fVar246;
        fVar255 = local_480._24_4_ * -fVar231 * fVar166;
        auVar50._24_4_ = fVar255;
        auVar50._28_4_ = fVar347;
        auVar35 = vsubps_avx(auVar329,auVar47);
        auVar321._0_4_ = fVar232 + (float)local_420._0_4_;
        auVar321._4_4_ = fVar238 + (float)local_420._4_4_;
        auVar321._8_4_ = fVar239 + fStack_418;
        auVar321._12_4_ = fVar244 + fStack_414;
        auVar321._16_4_ = fVar245 + fStack_410;
        auVar321._20_4_ = fVar246 + fStack_40c;
        auVar321._24_4_ = fVar255 + fStack_408;
        auVar321._28_4_ = fVar347 + fStack_404;
        fVar232 = fVar241 * 0.0 * local_480._0_4_;
        fVar238 = fVar248 * 0.0 * local_480._4_4_;
        auVar51._4_4_ = fVar238;
        auVar51._0_4_ = fVar232;
        fVar239 = fVar260 * 0.0 * local_480._8_4_;
        auVar51._8_4_ = fVar239;
        fVar241 = fVar223 * 0.0 * local_480._12_4_;
        auVar51._12_4_ = fVar241;
        fVar244 = fVar226 * 0.0 * local_480._16_4_;
        auVar51._16_4_ = fVar244;
        fVar245 = fVar229 * 0.0 * local_480._20_4_;
        auVar51._20_4_ = fVar245;
        fVar246 = fVar166 * 0.0 * local_480._24_4_;
        auVar51._24_4_ = fVar246;
        auVar51._28_4_ = 0x3f000000;
        auVar28 = vsubps_avx(auVar127,auVar48);
        auVar350._0_4_ = fVar232 + (float)local_460._0_4_;
        auVar350._4_4_ = fVar238 + (float)local_460._4_4_;
        auVar350._8_4_ = fVar239 + fStack_458;
        auVar350._12_4_ = fVar241 + fStack_454;
        auVar350._16_4_ = fVar244 + fStack_450;
        auVar350._20_4_ = fVar245 + fStack_44c;
        auVar350._24_4_ = fVar246 + fStack_448;
        auVar350._28_4_ = fStack_444 + 0.5;
        auVar29 = vsubps_avx(_local_520,auVar49);
        auVar30 = vsubps_avx(_local_420,auVar50);
        auVar37 = vsubps_avx(_local_460,auVar51);
        auVar31 = vsubps_avx(auVar321,auVar35);
        auVar32 = vsubps_avx(auVar350,auVar28);
        auVar52._4_4_ = auVar28._4_4_ * auVar31._4_4_;
        auVar52._0_4_ = auVar28._0_4_ * auVar31._0_4_;
        auVar52._8_4_ = auVar28._8_4_ * auVar31._8_4_;
        auVar52._12_4_ = auVar28._12_4_ * auVar31._12_4_;
        auVar52._16_4_ = auVar28._16_4_ * auVar31._16_4_;
        auVar52._20_4_ = auVar28._20_4_ * auVar31._20_4_;
        auVar52._24_4_ = auVar28._24_4_ * auVar31._24_4_;
        auVar52._28_4_ = fVar346;
        auVar53._4_4_ = auVar35._4_4_ * auVar32._4_4_;
        auVar53._0_4_ = auVar35._0_4_ * auVar32._0_4_;
        auVar53._8_4_ = auVar35._8_4_ * auVar32._8_4_;
        auVar53._12_4_ = auVar35._12_4_ * auVar32._12_4_;
        auVar53._16_4_ = auVar35._16_4_ * auVar32._16_4_;
        auVar53._20_4_ = auVar35._20_4_ * auVar32._20_4_;
        auVar53._24_4_ = auVar35._24_4_ * auVar32._24_4_;
        auVar53._28_4_ = fStack_404;
        auVar36 = vsubps_avx(auVar53,auVar52);
        auVar54._4_4_ = auVar34._4_4_ * auVar32._4_4_;
        auVar54._0_4_ = auVar34._0_4_ * auVar32._0_4_;
        auVar54._8_4_ = auVar34._8_4_ * auVar32._8_4_;
        auVar54._12_4_ = auVar34._12_4_ * auVar32._12_4_;
        auVar54._16_4_ = auVar34._16_4_ * auVar32._16_4_;
        auVar54._20_4_ = auVar34._20_4_ * auVar32._20_4_;
        auVar54._24_4_ = auVar34._24_4_ * auVar32._24_4_;
        auVar54._28_4_ = auVar32._28_4_;
        auVar151 = vsubps_avx(auVar313,auVar34);
        auVar55._4_4_ = auVar151._4_4_ * auVar28._4_4_;
        auVar55._0_4_ = auVar151._0_4_ * auVar28._0_4_;
        auVar55._8_4_ = auVar151._8_4_ * auVar28._8_4_;
        auVar55._12_4_ = auVar151._12_4_ * auVar28._12_4_;
        auVar55._16_4_ = auVar151._16_4_ * auVar28._16_4_;
        auVar55._20_4_ = auVar151._20_4_ * auVar28._20_4_;
        auVar55._24_4_ = auVar151._24_4_ * auVar28._24_4_;
        auVar55._28_4_ = fStack_504;
        auVar152 = vsubps_avx(auVar55,auVar54);
        auVar56._4_4_ = auVar151._4_4_ * auVar35._4_4_;
        auVar56._0_4_ = auVar151._0_4_ * auVar35._0_4_;
        auVar56._8_4_ = auVar151._8_4_ * auVar35._8_4_;
        auVar56._12_4_ = auVar151._12_4_ * auVar35._12_4_;
        auVar56._16_4_ = auVar151._16_4_ * auVar35._16_4_;
        auVar56._20_4_ = auVar151._20_4_ * auVar35._20_4_;
        auVar56._24_4_ = auVar151._24_4_ * auVar35._24_4_;
        auVar56._28_4_ = auVar32._28_4_;
        auVar57._4_4_ = auVar34._4_4_ * auVar31._4_4_;
        auVar57._0_4_ = auVar34._0_4_ * auVar31._0_4_;
        auVar57._8_4_ = auVar34._8_4_ * auVar31._8_4_;
        auVar57._12_4_ = auVar34._12_4_ * auVar31._12_4_;
        auVar57._16_4_ = auVar34._16_4_ * auVar31._16_4_;
        auVar57._20_4_ = auVar34._20_4_ * auVar31._20_4_;
        auVar57._24_4_ = auVar34._24_4_ * auVar31._24_4_;
        auVar57._28_4_ = auVar31._28_4_;
        auVar31 = vsubps_avx(auVar57,auVar56);
        auVar155._0_4_ = auVar36._0_4_ * 0.0 + auVar31._0_4_ + auVar152._0_4_ * 0.0;
        auVar155._4_4_ = auVar36._4_4_ * 0.0 + auVar31._4_4_ + auVar152._4_4_ * 0.0;
        auVar155._8_4_ = auVar36._8_4_ * 0.0 + auVar31._8_4_ + auVar152._8_4_ * 0.0;
        auVar155._12_4_ = auVar36._12_4_ * 0.0 + auVar31._12_4_ + auVar152._12_4_ * 0.0;
        auVar155._16_4_ = auVar36._16_4_ * 0.0 + auVar31._16_4_ + auVar152._16_4_ * 0.0;
        auVar155._20_4_ = auVar36._20_4_ * 0.0 + auVar31._20_4_ + auVar152._20_4_ * 0.0;
        auVar155._24_4_ = auVar36._24_4_ * 0.0 + auVar31._24_4_ + auVar152._24_4_ * 0.0;
        auVar155._28_4_ = auVar31._28_4_ + auVar31._28_4_ + auVar152._28_4_;
        auVar36 = vcmpps_avx(auVar155,ZEXT432(0) << 0x20,2);
        _local_500 = vblendvps_avx(auVar29,_local_5a0,auVar36);
        _local_5e0 = vblendvps_avx(auVar30,_local_560,auVar36);
        auVar29 = vblendvps_avx(auVar37,auVar270,auVar36);
        auVar30 = vblendvps_avx(auVar34,auVar313,auVar36);
        auVar31 = vblendvps_avx(auVar35,auVar321,auVar36);
        auVar32 = vblendvps_avx(auVar28,auVar350,auVar36);
        auVar34 = vblendvps_avx(auVar313,auVar34,auVar36);
        auVar35 = vblendvps_avx(auVar321,auVar35,auVar36);
        local_6e0 = vpackssdw_avx(auVar157._0_16_,auVar157._16_16_);
        auStack_6d0 = auVar157._16_16_;
        auVar157 = vblendvps_avx(auVar350,auVar28,auVar36);
        auVar34 = vsubps_avx(auVar34,_local_500);
        auVar28 = vsubps_avx(auVar35,_local_5e0);
        auVar151 = vsubps_avx(auVar157,auVar29);
        auVar157 = vsubps_avx(_local_5e0,auVar31);
        fVar232 = auVar28._0_4_;
        fVar247 = auVar29._0_4_;
        fVar245 = auVar28._4_4_;
        fVar198 = auVar29._4_4_;
        auVar58._4_4_ = fVar198 * fVar245;
        auVar58._0_4_ = fVar247 * fVar232;
        fVar259 = auVar28._8_4_;
        fVar216 = auVar29._8_4_;
        auVar58._8_4_ = fVar216 * fVar259;
        fVar223 = auVar28._12_4_;
        fVar219 = auVar29._12_4_;
        auVar58._12_4_ = fVar219 * fVar223;
        fVar304 = auVar28._16_4_;
        fVar222 = auVar29._16_4_;
        auVar58._16_4_ = fVar222 * fVar304;
        fVar147 = auVar28._20_4_;
        fVar225 = auVar29._20_4_;
        auVar58._20_4_ = fVar225 * fVar147;
        fVar169 = auVar28._24_4_;
        fVar228 = auVar29._24_4_;
        auVar58._24_4_ = fVar228 * fVar169;
        auVar58._28_4_ = auVar35._28_4_;
        fVar238 = local_5e0._0_4_;
        fVar258 = auVar151._0_4_;
        fVar246 = local_5e0._4_4_;
        fVar278 = auVar151._4_4_;
        auVar59._4_4_ = fVar278 * fVar246;
        auVar59._0_4_ = fVar258 * fVar238;
        fVar260 = local_5e0._8_4_;
        fVar287 = auVar151._8_4_;
        auVar59._8_4_ = fVar287 * fVar260;
        fVar302 = local_5e0._12_4_;
        fVar288 = auVar151._12_4_;
        auVar59._12_4_ = fVar288 * fVar302;
        fVar305 = local_5e0._16_4_;
        fVar289 = auVar151._16_4_;
        auVar59._16_4_ = fVar289 * fVar305;
        fVar165 = local_5e0._20_4_;
        fVar290 = auVar151._20_4_;
        auVar59._20_4_ = fVar290 * fVar165;
        fVar170 = local_5e0._24_4_;
        fVar297 = auVar151._24_4_;
        uVar14 = auVar37._28_4_;
        auVar59._24_4_ = fVar297 * fVar170;
        auVar59._28_4_ = uVar14;
        auVar35 = vsubps_avx(auVar59,auVar58);
        fVar239 = local_500._0_4_;
        fVar248 = local_500._4_4_;
        auVar60._4_4_ = fVar278 * fVar248;
        auVar60._0_4_ = fVar258 * fVar239;
        fVar261 = local_500._8_4_;
        auVar60._8_4_ = fVar287 * fVar261;
        fVar301 = local_500._12_4_;
        auVar60._12_4_ = fVar288 * fVar301;
        fVar307 = local_500._16_4_;
        auVar60._16_4_ = fVar289 * fVar307;
        fVar166 = local_500._20_4_;
        auVar60._20_4_ = fVar290 * fVar166;
        fVar171 = local_500._24_4_;
        auVar60._24_4_ = fVar297 * fVar171;
        auVar60._28_4_ = uVar14;
        fVar241 = auVar34._0_4_;
        fVar255 = auVar34._4_4_;
        auVar61._4_4_ = fVar198 * fVar255;
        auVar61._0_4_ = fVar247 * fVar241;
        fVar262 = auVar34._8_4_;
        auVar61._8_4_ = fVar216 * fVar262;
        fVar303 = auVar34._12_4_;
        auVar61._12_4_ = fVar219 * fVar303;
        fVar229 = auVar34._16_4_;
        auVar61._16_4_ = fVar222 * fVar229;
        fVar167 = auVar34._20_4_;
        auVar61._20_4_ = fVar225 * fVar167;
        fVar263 = auVar34._24_4_;
        auVar61._24_4_ = fVar228 * fVar263;
        auVar61._28_4_ = auVar350._28_4_;
        auVar37 = vsubps_avx(auVar61,auVar60);
        auVar62._4_4_ = fVar246 * fVar255;
        auVar62._0_4_ = fVar238 * fVar241;
        auVar62._8_4_ = fVar260 * fVar262;
        auVar62._12_4_ = fVar302 * fVar303;
        auVar62._16_4_ = fVar305 * fVar229;
        auVar62._20_4_ = fVar165 * fVar167;
        auVar62._24_4_ = fVar170 * fVar263;
        auVar62._28_4_ = uVar14;
        auVar356._0_4_ = fVar239 * fVar232;
        auVar356._4_4_ = fVar248 * fVar245;
        auVar356._8_4_ = fVar261 * fVar259;
        auVar356._12_4_ = fVar301 * fVar223;
        auVar356._16_4_ = fVar307 * fVar304;
        auVar356._20_4_ = fVar166 * fVar147;
        auVar356._24_4_ = fVar171 * fVar169;
        auVar356._28_4_ = 0;
        auVar152 = vsubps_avx(auVar356,auVar62);
        auVar174 = vsubps_avx(auVar29,auVar32);
        fVar244 = auVar152._28_4_ + auVar37._28_4_;
        auVar179._0_4_ = auVar152._0_4_ + auVar37._0_4_ * 0.0 + auVar35._0_4_ * 0.0;
        auVar179._4_4_ = auVar152._4_4_ + auVar37._4_4_ * 0.0 + auVar35._4_4_ * 0.0;
        auVar179._8_4_ = auVar152._8_4_ + auVar37._8_4_ * 0.0 + auVar35._8_4_ * 0.0;
        auVar179._12_4_ = auVar152._12_4_ + auVar37._12_4_ * 0.0 + auVar35._12_4_ * 0.0;
        auVar179._16_4_ = auVar152._16_4_ + auVar37._16_4_ * 0.0 + auVar35._16_4_ * 0.0;
        auVar179._20_4_ = auVar152._20_4_ + auVar37._20_4_ * 0.0 + auVar35._20_4_ * 0.0;
        auVar179._24_4_ = auVar152._24_4_ + auVar37._24_4_ * 0.0 + auVar35._24_4_ * 0.0;
        auVar179._28_4_ = fVar244 + auVar35._28_4_;
        fVar231 = auVar157._0_4_;
        fVar308 = auVar157._4_4_;
        auVar63._4_4_ = fVar308 * auVar32._4_4_;
        auVar63._0_4_ = fVar231 * auVar32._0_4_;
        fVar240 = auVar157._8_4_;
        auVar63._8_4_ = fVar240 * auVar32._8_4_;
        fVar242 = auVar157._12_4_;
        auVar63._12_4_ = fVar242 * auVar32._12_4_;
        fVar243 = auVar157._16_4_;
        auVar63._16_4_ = fVar243 * auVar32._16_4_;
        fVar249 = auVar157._20_4_;
        auVar63._20_4_ = fVar249 * auVar32._20_4_;
        fVar256 = auVar157._24_4_;
        auVar63._24_4_ = fVar256 * auVar32._24_4_;
        auVar63._28_4_ = fVar244;
        fVar244 = auVar174._0_4_;
        fVar257 = auVar174._4_4_;
        auVar64._4_4_ = auVar31._4_4_ * fVar257;
        auVar64._0_4_ = auVar31._0_4_ * fVar244;
        fVar299 = auVar174._8_4_;
        auVar64._8_4_ = auVar31._8_4_ * fVar299;
        fVar226 = auVar174._12_4_;
        auVar64._12_4_ = auVar31._12_4_ * fVar226;
        fVar306 = auVar174._16_4_;
        auVar64._16_4_ = auVar31._16_4_ * fVar306;
        fVar168 = auVar174._20_4_;
        auVar64._20_4_ = auVar31._20_4_ * fVar168;
        fVar273 = auVar174._24_4_;
        auVar64._24_4_ = auVar31._24_4_ * fVar273;
        auVar64._28_4_ = auVar152._28_4_;
        auVar157 = vsubps_avx(auVar64,auVar63);
        auVar37 = vsubps_avx(_local_500,auVar30);
        fVar298 = auVar37._0_4_;
        fVar300 = auVar37._4_4_;
        auVar65._4_4_ = fVar300 * auVar32._4_4_;
        auVar65._0_4_ = fVar298 * auVar32._0_4_;
        fVar309 = auVar37._8_4_;
        auVar65._8_4_ = fVar309 * auVar32._8_4_;
        fVar317 = auVar37._12_4_;
        auVar65._12_4_ = fVar317 * auVar32._12_4_;
        fVar318 = auVar37._16_4_;
        auVar65._16_4_ = fVar318 * auVar32._16_4_;
        fVar319 = auVar37._20_4_;
        auVar65._20_4_ = fVar319 * auVar32._20_4_;
        fVar324 = auVar37._24_4_;
        auVar65._24_4_ = fVar324 * auVar32._24_4_;
        auVar65._28_4_ = auVar32._28_4_;
        auVar66._4_4_ = auVar30._4_4_ * fVar257;
        auVar66._0_4_ = auVar30._0_4_ * fVar244;
        auVar66._8_4_ = auVar30._8_4_ * fVar299;
        auVar66._12_4_ = auVar30._12_4_ * fVar226;
        auVar66._16_4_ = auVar30._16_4_ * fVar306;
        auVar66._20_4_ = auVar30._20_4_ * fVar168;
        auVar66._24_4_ = auVar30._24_4_ * fVar273;
        auVar66._28_4_ = auVar35._28_4_;
        auVar35 = vsubps_avx(auVar65,auVar66);
        auVar67._4_4_ = auVar31._4_4_ * fVar300;
        auVar67._0_4_ = auVar31._0_4_ * fVar298;
        auVar67._8_4_ = auVar31._8_4_ * fVar309;
        auVar67._12_4_ = auVar31._12_4_ * fVar317;
        auVar67._16_4_ = auVar31._16_4_ * fVar318;
        auVar67._20_4_ = auVar31._20_4_ * fVar319;
        auVar67._24_4_ = auVar31._24_4_ * fVar324;
        auVar67._28_4_ = auVar32._28_4_;
        auVar68._4_4_ = auVar30._4_4_ * fVar308;
        auVar68._0_4_ = auVar30._0_4_ * fVar231;
        auVar68._8_4_ = auVar30._8_4_ * fVar240;
        auVar68._12_4_ = auVar30._12_4_ * fVar242;
        auVar68._16_4_ = auVar30._16_4_ * fVar243;
        auVar68._20_4_ = auVar30._20_4_ * fVar249;
        auVar68._24_4_ = auVar30._24_4_ * fVar256;
        auVar68._28_4_ = auVar30._28_4_;
        auVar30 = vsubps_avx(auVar68,auVar67);
        auVar235._0_4_ = auVar157._0_4_ * 0.0 + auVar30._0_4_ + auVar35._0_4_ * 0.0;
        auVar235._4_4_ = auVar157._4_4_ * 0.0 + auVar30._4_4_ + auVar35._4_4_ * 0.0;
        auVar235._8_4_ = auVar157._8_4_ * 0.0 + auVar30._8_4_ + auVar35._8_4_ * 0.0;
        auVar235._12_4_ = auVar157._12_4_ * 0.0 + auVar30._12_4_ + auVar35._12_4_ * 0.0;
        auVar235._16_4_ = auVar157._16_4_ * 0.0 + auVar30._16_4_ + auVar35._16_4_ * 0.0;
        auVar235._20_4_ = auVar157._20_4_ * 0.0 + auVar30._20_4_ + auVar35._20_4_ * 0.0;
        auVar235._24_4_ = auVar157._24_4_ * 0.0 + auVar30._24_4_ + auVar35._24_4_ * 0.0;
        auVar235._28_4_ = auVar30._28_4_ + auVar30._28_4_ + auVar35._28_4_;
        auVar157 = vmaxps_avx(auVar179,auVar235);
        auVar157 = vcmpps_avx(auVar157,ZEXT832(0) << 0x20,2);
        auVar203 = vpackssdw_avx(auVar157._0_16_,auVar157._16_16_);
        auVar203 = vpand_avx(auVar203,local_6e0);
        auVar189 = vpmovsxwd_avx(auVar203);
        auVar185 = vpunpckhwd_avx(auVar203,auVar203);
        auVar209._16_16_ = auVar185;
        auVar209._0_16_ = auVar189;
        if ((((((((auVar209 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar209 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar209 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar209 >> 0x7f,0) == '\0') &&
              (auVar209 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar185 >> 0x3f,0) == '\0') &&
            (auVar209 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar185[0xf]) {
LAB_010b22ef:
          auVar164 = ZEXT3264(CONCAT824(local_4c0[1]._24_8_,
                                        CONCAT816(local_4c0[1]._16_8_,
                                                  CONCAT88(local_4c0[1]._8_8_,local_4c0[1]._0_8_))))
          ;
          auVar296 = ZEXT3264(local_6c0);
          auVar316 = ZEXT3264(local_680);
        }
        else {
          auVar69._4_4_ = fVar257 * fVar245;
          auVar69._0_4_ = fVar244 * fVar232;
          auVar69._8_4_ = fVar299 * fVar259;
          auVar69._12_4_ = fVar226 * fVar223;
          auVar69._16_4_ = fVar306 * fVar304;
          auVar69._20_4_ = fVar168 * fVar147;
          auVar69._24_4_ = fVar273 * fVar169;
          auVar69._28_4_ = auVar185._12_4_;
          auVar332._0_4_ = fVar231 * fVar258;
          auVar332._4_4_ = fVar308 * fVar278;
          auVar332._8_4_ = fVar240 * fVar287;
          auVar332._12_4_ = fVar242 * fVar288;
          auVar332._16_4_ = fVar243 * fVar289;
          auVar332._20_4_ = fVar249 * fVar290;
          auVar332._24_4_ = fVar256 * fVar297;
          auVar332._28_4_ = 0;
          auVar157 = vsubps_avx(auVar332,auVar69);
          auVar70._4_4_ = fVar300 * fVar278;
          auVar70._0_4_ = fVar298 * fVar258;
          auVar70._8_4_ = fVar309 * fVar287;
          auVar70._12_4_ = fVar317 * fVar288;
          auVar70._16_4_ = fVar318 * fVar289;
          auVar70._20_4_ = fVar319 * fVar290;
          auVar70._24_4_ = fVar324 * fVar297;
          auVar70._28_4_ = auVar151._28_4_;
          auVar71._4_4_ = fVar257 * fVar255;
          auVar71._0_4_ = fVar244 * fVar241;
          auVar71._8_4_ = fVar299 * fVar262;
          auVar71._12_4_ = fVar226 * fVar303;
          auVar71._16_4_ = fVar306 * fVar229;
          auVar71._20_4_ = fVar168 * fVar167;
          auVar71._24_4_ = fVar273 * fVar263;
          auVar71._28_4_ = auVar174._28_4_;
          auVar31 = vsubps_avx(auVar71,auVar70);
          auVar72._4_4_ = fVar308 * fVar255;
          auVar72._0_4_ = fVar231 * fVar241;
          auVar72._8_4_ = fVar240 * fVar262;
          auVar72._12_4_ = fVar242 * fVar303;
          auVar72._16_4_ = fVar243 * fVar229;
          auVar72._20_4_ = fVar249 * fVar167;
          auVar72._24_4_ = fVar256 * fVar263;
          auVar72._28_4_ = auVar179._28_4_;
          auVar73._4_4_ = fVar300 * fVar245;
          auVar73._0_4_ = fVar298 * fVar232;
          auVar73._8_4_ = fVar309 * fVar259;
          auVar73._12_4_ = fVar317 * fVar223;
          auVar73._16_4_ = fVar318 * fVar304;
          auVar73._20_4_ = fVar319 * fVar147;
          auVar73._24_4_ = fVar324 * fVar169;
          auVar73._28_4_ = auVar28._28_4_;
          auVar32 = vsubps_avx(auVar73,auVar72);
          auVar286._0_4_ = auVar157._0_4_ * 0.0 + auVar32._0_4_ + auVar31._0_4_ * 0.0;
          auVar286._4_4_ = auVar157._4_4_ * 0.0 + auVar32._4_4_ + auVar31._4_4_ * 0.0;
          auVar286._8_4_ = auVar157._8_4_ * 0.0 + auVar32._8_4_ + auVar31._8_4_ * 0.0;
          auVar286._12_4_ = auVar157._12_4_ * 0.0 + auVar32._12_4_ + auVar31._12_4_ * 0.0;
          auVar286._16_4_ = auVar157._16_4_ * 0.0 + auVar32._16_4_ + auVar31._16_4_ * 0.0;
          auVar286._20_4_ = auVar157._20_4_ * 0.0 + auVar32._20_4_ + auVar31._20_4_ * 0.0;
          auVar286._24_4_ = auVar157._24_4_ * 0.0 + auVar32._24_4_ + auVar31._24_4_ * 0.0;
          auVar286._28_4_ = auVar28._28_4_ + auVar32._28_4_ + auVar179._28_4_;
          auVar30 = vrcpps_avx(auVar286);
          fVar241 = auVar30._0_4_;
          fVar244 = auVar30._4_4_;
          auVar74._4_4_ = auVar286._4_4_ * fVar244;
          auVar74._0_4_ = auVar286._0_4_ * fVar241;
          fVar245 = auVar30._8_4_;
          auVar74._8_4_ = auVar286._8_4_ * fVar245;
          fVar255 = auVar30._12_4_;
          auVar74._12_4_ = auVar286._12_4_ * fVar255;
          fVar257 = auVar30._16_4_;
          auVar74._16_4_ = auVar286._16_4_ * fVar257;
          fVar259 = auVar30._20_4_;
          auVar74._20_4_ = auVar286._20_4_ * fVar259;
          fVar262 = auVar30._24_4_;
          auVar74._24_4_ = auVar286._24_4_ * fVar262;
          auVar74._28_4_ = auVar174._28_4_;
          auVar333._8_4_ = 0x3f800000;
          auVar333._0_8_ = 0x3f8000003f800000;
          auVar333._12_4_ = 0x3f800000;
          auVar333._16_4_ = 0x3f800000;
          auVar333._20_4_ = 0x3f800000;
          auVar333._24_4_ = 0x3f800000;
          auVar333._28_4_ = 0x3f800000;
          auVar35 = vsubps_avx(auVar333,auVar74);
          fVar241 = auVar35._0_4_ * fVar241 + fVar241;
          fVar244 = auVar35._4_4_ * fVar244 + fVar244;
          fVar245 = auVar35._8_4_ * fVar245 + fVar245;
          fVar255 = auVar35._12_4_ * fVar255 + fVar255;
          fVar257 = auVar35._16_4_ * fVar257 + fVar257;
          fVar259 = auVar35._20_4_ * fVar259 + fVar259;
          fVar262 = auVar35._24_4_ * fVar262 + fVar262;
          auVar75._4_4_ =
               (auVar157._4_4_ * fVar248 + auVar31._4_4_ * fVar246 + auVar32._4_4_ * fVar198) *
               fVar244;
          auVar75._0_4_ =
               (auVar157._0_4_ * fVar239 + auVar31._0_4_ * fVar238 + auVar32._0_4_ * fVar247) *
               fVar241;
          auVar75._8_4_ =
               (auVar157._8_4_ * fVar261 + auVar31._8_4_ * fVar260 + auVar32._8_4_ * fVar216) *
               fVar245;
          auVar75._12_4_ =
               (auVar157._12_4_ * fVar301 + auVar31._12_4_ * fVar302 + auVar32._12_4_ * fVar219) *
               fVar255;
          auVar75._16_4_ =
               (auVar157._16_4_ * fVar307 + auVar31._16_4_ * fVar305 + auVar32._16_4_ * fVar222) *
               fVar257;
          auVar75._20_4_ =
               (auVar157._20_4_ * fVar166 + auVar31._20_4_ * fVar165 + auVar32._20_4_ * fVar225) *
               fVar259;
          auVar75._24_4_ =
               (auVar157._24_4_ * fVar171 + auVar31._24_4_ * fVar170 + auVar32._24_4_ * fVar228) *
               fVar262;
          auVar75._28_4_ = auVar34._28_4_ + auVar29._28_4_;
          auVar189 = vpermilps_avx((undefined1  [16])aVar16,0xff);
          auVar156._16_16_ = auVar189;
          auVar156._0_16_ = auVar189;
          auVar157 = vcmpps_avx(auVar156,auVar75,2);
          fVar232 = (ray->super_RayK<1>).tfar;
          auVar210._4_4_ = fVar232;
          auVar210._0_4_ = fVar232;
          auVar210._8_4_ = fVar232;
          auVar210._12_4_ = fVar232;
          auVar210._16_4_ = fVar232;
          auVar210._20_4_ = fVar232;
          auVar210._24_4_ = fVar232;
          auVar210._28_4_ = fVar232;
          auVar29 = vcmpps_avx(auVar75,auVar210,2);
          auVar157 = vandps_avx(auVar29,auVar157);
          auVar189 = vpackssdw_avx(auVar157._0_16_,auVar157._16_16_);
          auVar203 = vpand_avx(auVar203,auVar189);
          auVar189 = vpmovsxwd_avx(auVar203);
          auVar185 = vpshufd_avx(auVar203,0xee);
          auVar185 = vpmovsxwd_avx(auVar185);
          auVar211._16_16_ = auVar185;
          auVar211._0_16_ = auVar189;
          if ((((((((auVar211 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar211 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar211 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar211 >> 0x7f,0) == '\0') &&
                (auVar211 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar185 >> 0x3f,0) == '\0') &&
              (auVar211 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar185[0xf]) goto LAB_010b22ef;
          auVar157 = vcmpps_avx(ZEXT832(0) << 0x20,auVar286,4);
          auVar189 = vpackssdw_avx(auVar157._0_16_,auVar157._16_16_);
          auVar203 = vpand_avx(auVar203,auVar189);
          auVar189 = vpmovsxwd_avx(auVar203);
          auVar203 = vpunpckhwd_avx(auVar203,auVar203);
          auVar271._16_16_ = auVar203;
          auVar271._0_16_ = auVar189;
          auVar164 = ZEXT3264(CONCAT824(local_4c0[1]._24_8_,
                                        CONCAT816(local_4c0[1]._16_8_,
                                                  CONCAT88(local_4c0[1]._8_8_,local_4c0[1]._0_8_))))
          ;
          auVar296 = ZEXT3264(local_6c0);
          auVar316 = ZEXT3264(local_680);
          if ((((((((auVar271 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar271 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar271 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar271 >> 0x7f,0) != '\0') ||
                (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar203 >> 0x3f,0) != '\0') ||
              (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar203[0xf] < '\0') {
            auVar76._4_4_ = auVar179._4_4_ * fVar244;
            auVar76._0_4_ = auVar179._0_4_ * fVar241;
            auVar76._8_4_ = auVar179._8_4_ * fVar245;
            auVar76._12_4_ = auVar179._12_4_ * fVar255;
            auVar76._16_4_ = auVar179._16_4_ * fVar257;
            auVar76._20_4_ = auVar179._20_4_ * fVar259;
            auVar76._24_4_ = auVar179._24_4_ * fVar262;
            auVar76._28_4_ = SUB84(local_4c0[1]._24_8_,4);
            auVar77._4_4_ = auVar235._4_4_ * fVar244;
            auVar77._0_4_ = auVar235._0_4_ * fVar241;
            auVar77._8_4_ = auVar235._8_4_ * fVar245;
            auVar77._12_4_ = auVar235._12_4_ * fVar255;
            auVar77._16_4_ = auVar235._16_4_ * fVar257;
            auVar77._20_4_ = auVar235._20_4_ * fVar259;
            auVar77._24_4_ = auVar235._24_4_ * fVar262;
            auVar77._28_4_ = auVar35._28_4_ + auVar30._28_4_;
            auVar236._8_4_ = 0x3f800000;
            auVar236._0_8_ = 0x3f8000003f800000;
            auVar236._12_4_ = 0x3f800000;
            auVar236._16_4_ = 0x3f800000;
            auVar236._20_4_ = 0x3f800000;
            auVar236._24_4_ = 0x3f800000;
            auVar236._28_4_ = 0x3f800000;
            auVar157 = vsubps_avx(auVar236,auVar76);
            auVar157 = vblendvps_avx(auVar157,auVar76,auVar36);
            auVar296 = ZEXT3264(auVar157);
            auVar157 = vsubps_avx(auVar236,auVar77);
            _local_340 = vblendvps_avx(auVar157,auVar77,auVar36);
            auVar164 = ZEXT3264(auVar271);
            auVar316 = ZEXT3264(auVar75);
          }
        }
        auVar351 = ZEXT3264(_local_600);
        auVar342 = ZEXT3264(local_6a0);
        auVar157 = auVar164._0_32_;
        if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar157 >> 0x7f,0) != '\0') ||
              (auVar164 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar157 >> 0xbf,0) != '\0') ||
            (auVar164 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar164[0x1f] < '\0') {
          auVar29 = vsubps_avx(local_480,_local_7a0);
          fVar238 = (float)local_7a0._0_4_ + auVar296._0_4_ * auVar29._0_4_;
          fVar239 = (float)local_7a0._4_4_ + auVar296._4_4_ * auVar29._4_4_;
          fVar241 = fStack_798 + auVar296._8_4_ * auVar29._8_4_;
          fVar244 = fStack_794 + auVar296._12_4_ * auVar29._12_4_;
          fVar245 = fStack_790 + auVar296._16_4_ * auVar29._16_4_;
          fVar246 = fStack_78c + auVar296._20_4_ * auVar29._20_4_;
          fVar248 = fStack_788 + auVar296._24_4_ * auVar29._24_4_;
          fVar255 = auVar29._28_4_ + 0.0;
          fVar232 = pre->depth_scale;
          auVar78._4_4_ = (fVar239 + fVar239) * fVar232;
          auVar78._0_4_ = (fVar238 + fVar238) * fVar232;
          auVar78._8_4_ = (fVar241 + fVar241) * fVar232;
          auVar78._12_4_ = (fVar244 + fVar244) * fVar232;
          auVar78._16_4_ = (fVar245 + fVar245) * fVar232;
          auVar78._20_4_ = (fVar246 + fVar246) * fVar232;
          auVar78._24_4_ = (fVar248 + fVar248) * fVar232;
          auVar78._28_4_ = fVar255 + fVar255;
          local_280 = auVar316._0_32_;
          auVar29 = vcmpps_avx(local_280,auVar78,6);
          auVar30 = auVar157 & auVar29;
          if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0x7f,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar30 >> 0xbf,0) != '\0') ||
              (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar30[0x1f] < '\0') {
            local_340._0_4_ = (float)local_340._0_4_ + (float)local_340._0_4_ + -1.0;
            local_340._4_4_ = (float)local_340._4_4_ + (float)local_340._4_4_ + -1.0;
            uStack_338._0_4_ = (float)uStack_338 + (float)uStack_338 + -1.0;
            uStack_338._4_4_ = uStack_338._4_4_ + uStack_338._4_4_ + -1.0;
            uStack_330._0_4_ = (float)uStack_330 + (float)uStack_330 + -1.0;
            uStack_330._4_4_ = uStack_330._4_4_ + uStack_330._4_4_ + -1.0;
            uStack_328._0_4_ = (float)uStack_328 + (float)uStack_328 + -1.0;
            uStack_328._4_4_ = uStack_328._4_4_ + uStack_328._4_4_ + -1.0;
            local_2c0 = auVar296._0_32_;
            auVar137 = _local_340;
            auVar30 = _local_340;
            local_2a0 = (float)local_340._0_4_;
            fStack_29c = (float)local_340._4_4_;
            fStack_298 = (float)uStack_338;
            fStack_294 = uStack_338._4_4_;
            fStack_290 = (float)uStack_330;
            fStack_28c = uStack_330._4_4_;
            fStack_288 = (float)uStack_328;
            fStack_284 = uStack_328._4_4_;
            local_260 = 0;
            local_25c = uVar25;
            _local_340 = auVar30;
            if ((pGVar144->mask & (ray->super_RayK<1>).mask) != 0) {
              auVar157 = vandps_avx(auVar29,auVar157);
              local_4c0[0] = auVar157;
              auVar187._0_4_ = 1.0 / (float)(int)uVar25;
              auVar187._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar203 = vshufps_avx(auVar187,auVar187,0);
              local_1e0[0] = auVar203._0_4_ * (auVar296._0_4_ + 0.0);
              local_1e0[1] = auVar203._4_4_ * (auVar296._4_4_ + 1.0);
              local_1e0[2] = auVar203._8_4_ * (auVar296._8_4_ + 2.0);
              local_1e0[3] = auVar203._12_4_ * (auVar296._12_4_ + 3.0);
              fStack_1d0 = auVar203._0_4_ * (auVar296._16_4_ + 4.0);
              fStack_1cc = auVar203._4_4_ * (auVar296._20_4_ + 5.0);
              fStack_1c8 = auVar203._8_4_ * (auVar296._24_4_ + 6.0);
              fStack_1c4 = auVar296._28_4_ + 7.0;
              uStack_330 = auVar137._16_8_;
              uStack_328 = auVar30._24_8_;
              local_1c0 = local_340;
              uStack_1b8 = uStack_338;
              uStack_1b0 = uStack_330;
              uStack_1a8 = uStack_328;
              local_1a0 = local_280;
              auVar180._8_4_ = 0x7f800000;
              auVar180._0_8_ = 0x7f8000007f800000;
              auVar180._12_4_ = 0x7f800000;
              auVar180._16_4_ = 0x7f800000;
              auVar180._20_4_ = 0x7f800000;
              auVar180._24_4_ = 0x7f800000;
              auVar180._28_4_ = 0x7f800000;
              auVar29 = vblendvps_avx(auVar180,local_280,auVar157);
              auVar30 = vshufps_avx(auVar29,auVar29,0xb1);
              auVar30 = vminps_avx(auVar29,auVar30);
              auVar31 = vshufpd_avx(auVar30,auVar30,5);
              auVar30 = vminps_avx(auVar30,auVar31);
              auVar31 = vperm2f128_avx(auVar30,auVar30,1);
              auVar30 = vminps_avx(auVar30,auVar31);
              auVar29 = vcmpps_avx(auVar29,auVar30,0);
              auVar30 = auVar157 & auVar29;
              if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar30 >> 0x7f,0) != '\0') ||
                    (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0xbf,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar30[0x1f] < '\0') {
                auVar157 = vandps_avx(auVar29,auVar157);
              }
              uVar139 = vmovmskps_avx(auVar157);
              uVar27 = 0;
              if (uVar139 != 0) {
                for (; (uVar139 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              auVar143 = (undefined1  [8])(ulong)uVar27;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar144->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_680 = local_280;
                _local_6e0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                local_6c0 = auVar296._0_32_;
                _local_320 = auVar33;
                do {
                  local_624 = local_1e0[(long)auVar143];
                  local_620 = *(undefined4 *)((long)&local_1c0 + (long)auVar143 * 4);
                  (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + (long)auVar143 * 4);
                  local_730.context = context->user;
                  fVar214 = 1.0 - local_624;
                  fVar199 = local_624 * fVar214 + local_624 * fVar214;
                  auVar203 = ZEXT416((uint)(local_624 * local_624 * 3.0));
                  auVar203 = vshufps_avx(auVar203,auVar203,0);
                  auVar189 = ZEXT416((uint)((fVar199 - local_624 * local_624) * 3.0));
                  auVar189 = vshufps_avx(auVar189,auVar189,0);
                  auVar185 = ZEXT416((uint)((fVar214 * fVar214 - fVar199) * 3.0));
                  auVar185 = vshufps_avx(auVar185,auVar185,0);
                  auVar204 = ZEXT416((uint)(fVar214 * fVar214 * -3.0));
                  auVar204 = vshufps_avx(auVar204,auVar204,0);
                  auVar192._0_4_ =
                       auVar204._0_4_ * local_780 +
                       auVar185._0_4_ * local_750 +
                       auVar203._0_4_ * local_770 + auVar189._0_4_ * local_760;
                  auVar192._4_4_ =
                       auVar204._4_4_ * fStack_77c +
                       auVar185._4_4_ * fStack_74c +
                       auVar203._4_4_ * fStack_76c + auVar189._4_4_ * fStack_75c;
                  auVar192._8_4_ =
                       auVar204._8_4_ * fStack_778 +
                       auVar185._8_4_ * fStack_748 +
                       auVar203._8_4_ * fStack_768 + auVar189._8_4_ * fStack_758;
                  auVar192._12_4_ =
                       auVar204._12_4_ * fStack_774 +
                       auVar185._12_4_ * fStack_744 +
                       auVar203._12_4_ * fStack_764 + auVar189._12_4_ * fStack_754;
                  local_630 = vmovlps_avx(auVar192);
                  local_628 = vextractps_avx(auVar192,2);
                  local_61c = (int)local_7a8;
                  local_618 = (int)local_7b0;
                  local_614 = (local_730.context)->instID[0];
                  local_610 = (local_730.context)->instPrimID[0];
                  local_7b4 = -1;
                  local_730.valid = &local_7b4;
                  local_730.geometryUserPtr = pGVar144->userPtr;
                  local_730.ray = (RTCRayN *)ray;
                  local_730.hit = (RTCHitN *)&local_630;
                  local_730.N = 1;
                  local_7a0 = auVar143;
                  if (pGVar144->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_010b2516:
                    p_Var26 = context->args->filter;
                    if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar144->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var26)(&local_730);
                      auVar351 = ZEXT3264(_local_600);
                      auVar342 = ZEXT3264(local_6a0);
                      auVar296 = ZEXT3264(local_6c0);
                      pre = local_738;
                      auVar143 = local_7a0;
                      fVar200 = (float)local_5c0._0_4_;
                      fVar215 = (float)local_5c0._4_4_;
                      fVar218 = fStack_5b8;
                      fVar221 = fStack_5b4;
                      fVar224 = fStack_5b0;
                      fVar227 = fStack_5ac;
                      fVar230 = fStack_5a8;
                      if (*local_730.valid == 0) goto LAB_010b25f4;
                    }
                    (((Vec3f *)((long)local_730.ray + 0x30))->field_0).components[0] =
                         *(float *)local_730.hit;
                    (((Vec3f *)((long)local_730.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_730.hit + 4);
                    (((Vec3f *)((long)local_730.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_730.hit + 8);
                    *(float *)((long)local_730.ray + 0x3c) = *(float *)(local_730.hit + 0xc);
                    *(float *)((long)local_730.ray + 0x40) = *(float *)(local_730.hit + 0x10);
                    *(float *)((long)local_730.ray + 0x44) = *(float *)(local_730.hit + 0x14);
                    *(float *)((long)local_730.ray + 0x48) = *(float *)(local_730.hit + 0x18);
                    *(float *)((long)local_730.ray + 0x4c) = *(float *)(local_730.hit + 0x1c);
                    *(float *)((long)local_730.ray + 0x50) = *(float *)(local_730.hit + 0x20);
                  }
                  else {
                    (*pGVar144->intersectionFilterN)(&local_730);
                    auVar351 = ZEXT3264(_local_600);
                    auVar342 = ZEXT3264(local_6a0);
                    auVar296 = ZEXT3264(local_6c0);
                    pre = local_738;
                    auVar143 = local_7a0;
                    fVar200 = (float)local_5c0._0_4_;
                    fVar215 = (float)local_5c0._4_4_;
                    fVar218 = fStack_5b8;
                    fVar221 = fStack_5b4;
                    fVar224 = fStack_5b0;
                    fVar227 = fStack_5ac;
                    fVar230 = fStack_5a8;
                    if (*local_730.valid != 0) goto LAB_010b2516;
LAB_010b25f4:
                    (ray->super_RayK<1>).tfar = (float)local_6e0._0_4_;
                    pre = local_738;
                    auVar143 = local_7a0;
                  }
                  *(undefined4 *)(local_4c0[0] + (long)auVar143 * 4) = 0;
                  auVar30 = local_4c0[0];
                  fVar199 = (ray->super_RayK<1>).tfar;
                  auVar163._4_4_ = fVar199;
                  auVar163._0_4_ = fVar199;
                  auVar163._8_4_ = fVar199;
                  auVar163._12_4_ = fVar199;
                  auVar163._16_4_ = fVar199;
                  auVar163._20_4_ = fVar199;
                  auVar163._24_4_ = fVar199;
                  auVar163._28_4_ = fVar199;
                  auVar316 = ZEXT3264(local_680);
                  auVar29 = vcmpps_avx(local_680,auVar163,2);
                  auVar157 = vandps_avx(auVar29,local_4c0[0]);
                  local_4c0[0] = auVar157;
                  auVar30 = auVar30 & auVar29;
                  prim = local_740;
                  if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar30 >> 0x7f,0) == '\0') &&
                        (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar30 >> 0xbf,0) == '\0') &&
                      (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar30[0x1f]) goto LAB_010b1335;
                  _local_6e0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                  auVar184._8_4_ = 0x7f800000;
                  auVar184._0_8_ = 0x7f8000007f800000;
                  auVar184._12_4_ = 0x7f800000;
                  auVar184._16_4_ = 0x7f800000;
                  auVar184._20_4_ = 0x7f800000;
                  auVar184._24_4_ = 0x7f800000;
                  auVar184._28_4_ = 0x7f800000;
                  auVar29 = vblendvps_avx(auVar184,local_680,auVar157);
                  auVar30 = vshufps_avx(auVar29,auVar29,0xb1);
                  auVar30 = vminps_avx(auVar29,auVar30);
                  auVar31 = vshufpd_avx(auVar30,auVar30,5);
                  auVar30 = vminps_avx(auVar30,auVar31);
                  auVar31 = vperm2f128_avx(auVar30,auVar30,1);
                  auVar30 = vminps_avx(auVar30,auVar31);
                  auVar29 = vcmpps_avx(auVar29,auVar30,0);
                  auVar30 = auVar157 & auVar29;
                  if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar30 >> 0x7f,0) != '\0') ||
                        (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar30 >> 0xbf,0) != '\0') ||
                      (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar30[0x1f] < '\0') {
                    auVar157 = vandps_avx(auVar29,auVar157);
                  }
                  uVar140 = vmovmskps_avx(auVar157);
                  uVar138 = 0;
                  if (uVar140 != 0) {
                    for (; (uVar140 >> uVar138 & 1) == 0; uVar138 = uVar138 + 1) {
                    }
                  }
                  auVar143 = (undefined1  [8])(ulong)uVar138;
                } while( true );
              }
              fVar199 = local_1e0[(long)auVar143];
              fVar214 = *(float *)((long)&local_1c0 + (long)auVar143 * 4);
              fVar220 = 1.0 - fVar199;
              fVar217 = fVar199 * fVar220 + fVar199 * fVar220;
              auVar203 = ZEXT416((uint)(fVar199 * fVar199 * 3.0));
              auVar203 = vshufps_avx(auVar203,auVar203,0);
              auVar189 = ZEXT416((uint)((fVar217 - fVar199 * fVar199) * 3.0));
              auVar189 = vshufps_avx(auVar189,auVar189,0);
              auVar185 = ZEXT416((uint)((fVar220 * fVar220 - fVar217) * 3.0));
              auVar185 = vshufps_avx(auVar185,auVar185,0);
              auVar204 = ZEXT416((uint)(fVar220 * fVar220 * -3.0));
              auVar204 = vshufps_avx(auVar204,auVar204,0);
              auVar188._0_4_ =
                   auVar204._0_4_ * local_780 +
                   auVar185._0_4_ * local_750 +
                   auVar203._0_4_ * local_770 + auVar189._0_4_ * local_760;
              auVar188._4_4_ =
                   auVar204._4_4_ * fStack_77c +
                   auVar185._4_4_ * fStack_74c +
                   auVar203._4_4_ * fStack_76c + auVar189._4_4_ * fStack_75c;
              auVar188._8_4_ =
                   auVar204._8_4_ * fStack_778 +
                   auVar185._8_4_ * fStack_748 +
                   auVar203._8_4_ * fStack_768 + auVar189._8_4_ * fStack_758;
              auVar188._12_4_ =
                   auVar204._12_4_ * fStack_774 +
                   auVar185._12_4_ * fStack_744 +
                   auVar203._12_4_ * fStack_764 + auVar189._12_4_ * fStack_754;
              (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + (long)auVar143 * 4);
              uVar15 = vmovlps_avx(auVar188);
              *(undefined8 *)&(ray->Ng).field_0 = uVar15;
              fVar217 = (float)vextractps_avx(auVar188,2);
              (ray->Ng).field_0.field_0.z = fVar217;
              ray->u = fVar199;
              ray->v = fVar214;
              ray->primID = uVar140;
              ray->geomID = uVar138;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              prim = local_740;
            }
LAB_010b1335:
            fVar274 = (float)local_580._0_4_;
            fVar275 = (float)local_580._4_4_;
            fVar276 = fStack_578;
            fVar277 = fStack_574;
            fVar199 = fStack_570;
            fVar214 = fStack_56c;
            fVar217 = fStack_568;
            fVar220 = fStack_564;
          }
        }
      }
      if (8 < (int)uVar25) {
        auVar203 = vpshufd_avx(ZEXT416(uVar25),0);
        local_440 = auVar203._0_4_;
        fStack_43c = auVar203._4_4_;
        fStack_438 = auVar203._8_4_;
        fStack_434 = auVar203._12_4_;
        auVar203 = vshufps_avx(local_700._0_16_,local_700._0_16_,0);
        register0x00001210 = auVar203;
        _local_460 = auVar203;
        auVar203 = vpermilps_avx(local_3e0._0_16_,0xff);
        local_e0._16_16_ = auVar203;
        local_e0._0_16_ = auVar203;
        auVar150._0_4_ = 1.0 / (float)local_400._0_4_;
        auVar150._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar203 = vshufps_avx(auVar150,auVar150,0);
        _fStack_3f0 = auVar203;
        _local_400 = auVar203;
        auVar164 = ZEXT3264(_local_400);
        lVar146 = 8;
        local_6c0 = auVar296._0_32_;
        local_680 = auVar316._0_32_;
        _local_600 = auVar351._0_32_;
        fVar232 = (float)local_4e0._0_4_;
        fVar238 = (float)local_4e0._4_4_;
        fVar239 = fStack_4d8;
        fVar241 = fStack_4d4;
        fVar244 = fStack_4d0;
        fVar245 = fStack_4cc;
        fVar246 = fStack_4c8;
        fVar248 = fStack_4c4;
LAB_010b1418:
        pauVar5 = (undefined1 (*) [28])(bezier_basis0 + lVar146 * 4 + lVar141);
        fVar255 = *(float *)*pauVar5;
        fVar257 = *(float *)(*pauVar5 + 4);
        fVar259 = *(float *)(*pauVar5 + 8);
        fVar260 = *(float *)(*pauVar5 + 0xc);
        fVar261 = *(float *)(*pauVar5 + 0x10);
        fVar262 = *(float *)(*pauVar5 + 0x14);
        fVar299 = *(float *)(*pauVar5 + 0x18);
        auVar134 = *pauVar5;
        pauVar8 = (undefined1 (*) [28])(lVar141 + 0x21aa768 + lVar146 * 4);
        fVar223 = *(float *)*pauVar8;
        fVar302 = *(float *)(*pauVar8 + 4);
        fVar301 = *(float *)(*pauVar8 + 8);
        fVar303 = *(float *)(*pauVar8 + 0xc);
        fVar226 = *(float *)(*pauVar8 + 0x10);
        fVar304 = *(float *)(*pauVar8 + 0x14);
        fVar305 = *(float *)(*pauVar8 + 0x18);
        auVar133 = *pauVar8;
        pauVar8 = (undefined1 (*) [28])(lVar141 + 0x21aabec + lVar146 * 4);
        fVar307 = *(float *)*pauVar8;
        fVar229 = *(float *)(*pauVar8 + 4);
        fVar306 = *(float *)(*pauVar8 + 8);
        fVar147 = *(float *)(*pauVar8 + 0xc);
        fVar165 = *(float *)(*pauVar8 + 0x10);
        fVar166 = *(float *)(*pauVar8 + 0x14);
        fVar167 = *(float *)(*pauVar8 + 0x18);
        auVar132 = *pauVar8;
        pauVar8 = (undefined1 (*) [28])(lVar141 + 0x21ab070 + lVar146 * 4);
        fVar168 = *(float *)*pauVar8;
        fVar169 = *(float *)(*pauVar8 + 4);
        fVar170 = *(float *)(*pauVar8 + 8);
        fVar171 = *(float *)(*pauVar8 + 0xc);
        fVar263 = *(float *)(*pauVar8 + 0x10);
        fVar273 = *(float *)(*pauVar8 + 0x14);
        fVar247 = *(float *)(*pauVar8 + 0x18);
        auVar131 = *pauVar8;
        fVar216 = auVar342._0_4_;
        fVar219 = auVar342._4_4_;
        fVar222 = auVar342._8_4_;
        fVar225 = auVar342._12_4_;
        fVar228 = auVar342._16_4_;
        fVar231 = auVar342._20_4_;
        fVar308 = auVar342._24_4_;
        fVar198 = fVar220 + *(float *)pauVar8[1];
        fStack_784 = fVar220 + fVar220 + auVar164._28_4_;
        local_6e0._0_4_ =
             (float)local_100._0_4_ * fVar255 +
             fVar200 * fVar223 + fVar307 * fVar274 + (float)local_3c0._0_4_ * fVar168;
        local_6e0._4_4_ =
             (float)local_100._4_4_ * fVar257 +
             fVar215 * fVar302 + fVar229 * fVar275 + (float)local_3c0._4_4_ * fVar169;
        local_6e0._8_4_ =
             fStack_f8 * fVar259 + fVar218 * fVar301 + fVar306 * fVar276 + fStack_3b8 * fVar170;
        local_6e0._12_4_ =
             fStack_f4 * fVar260 + fVar221 * fVar303 + fVar147 * fVar277 + fStack_3b4 * fVar171;
        register0x00001450 =
             fStack_f0 * fVar261 + fVar224 * fVar226 + fVar165 * fVar199 + fStack_3b0 * fVar263;
        register0x00001454 =
             fStack_ec * fVar262 + fVar227 * fVar304 + fVar166 * fVar214 + fStack_3ac * fVar273;
        register0x00001458 =
             fStack_e8 * fVar299 + fVar230 * fVar305 + fVar167 * fVar217 + fStack_3a8 * fVar247;
        register0x0000145c = fVar198 + fStack_784;
        local_700._0_4_ =
             auVar351._0_4_ * fVar223 + fVar216 * fVar307 + fVar232 * fVar168 +
             (float)local_3a0._0_4_ * fVar255;
        local_700._4_4_ =
             auVar351._4_4_ * fVar302 + fVar219 * fVar229 + fVar238 * fVar169 +
             (float)local_3a0._4_4_ * fVar257;
        local_700._8_4_ =
             auVar351._8_4_ * fVar301 + fVar222 * fVar306 + fVar239 * fVar170 + fStack_398 * fVar259
        ;
        local_700._12_4_ =
             auVar351._12_4_ * fVar303 + fVar225 * fVar147 + fVar241 * fVar171 +
             fStack_394 * fVar260;
        local_700._16_4_ =
             auVar351._16_4_ * fVar226 + fVar228 * fVar165 + fVar244 * fVar263 +
             fStack_390 * fVar261;
        local_700._20_4_ =
             auVar351._20_4_ * fVar304 + fVar231 * fVar166 + fVar245 * fVar273 +
             fStack_38c * fVar262;
        local_700._24_4_ =
             auVar351._24_4_ * fVar305 + fVar308 * fVar167 + fVar246 * fVar247 +
             fStack_388 * fVar299;
        local_700._28_4_ = fVar220 + fVar220 + fVar248 + fStack_784;
        local_7a0._0_4_ =
             fVar255 * (float)local_160._0_4_ +
             (float)local_a0._0_4_ * fVar223 +
             fVar307 * (float)local_120._0_4_ + fVar168 * (float)local_140._0_4_;
        local_7a0._4_4_ =
             fVar257 * (float)local_160._4_4_ +
             (float)local_a0._4_4_ * fVar302 +
             fVar229 * (float)local_120._4_4_ + fVar169 * (float)local_140._4_4_;
        fStack_798 = fVar259 * fStack_158 +
                     fStack_98 * fVar301 + fVar306 * fStack_118 + fVar170 * fStack_138;
        fStack_794 = fVar260 * fStack_154 +
                     fStack_94 * fVar303 + fVar147 * fStack_114 + fVar171 * fStack_134;
        fStack_790 = fVar261 * fStack_150 +
                     fStack_90 * fVar226 + fVar165 * fStack_110 + fVar263 * fStack_130;
        fStack_78c = fVar262 * fStack_14c +
                     fStack_8c * fVar304 + fVar166 * fStack_10c + fVar273 * fStack_12c;
        fStack_788 = fVar299 * fStack_148 +
                     fStack_88 * fVar305 + fVar167 * fStack_108 + fVar247 * fStack_128;
        fStack_784 = fStack_784 + fVar220 + fVar198;
        pfVar6 = (float *)(bezier_basis1 + lVar146 * 4 + lVar141);
        fVar255 = *pfVar6;
        fVar257 = pfVar6[1];
        fVar259 = pfVar6[2];
        fVar260 = pfVar6[3];
        fVar261 = pfVar6[4];
        fVar262 = pfVar6[5];
        fVar299 = pfVar6[6];
        pauVar8 = (undefined1 (*) [28])(lVar141 + 0x21acb88 + lVar146 * 4);
        fVar220 = *(float *)*pauVar8;
        fVar223 = *(float *)(*pauVar8 + 4);
        fVar302 = *(float *)(*pauVar8 + 8);
        fVar301 = *(float *)(*pauVar8 + 0xc);
        fVar303 = *(float *)(*pauVar8 + 0x10);
        fVar226 = *(float *)(*pauVar8 + 0x14);
        fVar304 = *(float *)(*pauVar8 + 0x18);
        auVar136 = *pauVar8;
        pauVar9 = (undefined1 (*) [28])(lVar141 + 0x21ad00c + lVar146 * 4);
        fVar305 = *(float *)*pauVar9;
        fVar307 = *(float *)(*pauVar9 + 4);
        fVar229 = *(float *)(*pauVar9 + 8);
        fVar306 = *(float *)(*pauVar9 + 0xc);
        fVar147 = *(float *)(*pauVar9 + 0x10);
        fVar165 = *(float *)(*pauVar9 + 0x14);
        fVar166 = *(float *)(*pauVar9 + 0x18);
        auVar135 = *pauVar9;
        pfVar10 = (float *)(lVar141 + 0x21ad490 + lVar146 * 4);
        fVar167 = *pfVar10;
        fVar168 = pfVar10[1];
        fVar169 = pfVar10[2];
        fVar170 = pfVar10[3];
        fVar171 = pfVar10[4];
        fVar263 = pfVar10[5];
        fVar273 = pfVar10[6];
        fVar247 = fVar248 + fVar248 + fStack_3a4;
        local_480._0_4_ =
             (float)local_100._0_4_ * fVar255 +
             fVar200 * fVar220 + fVar274 * fVar305 + (float)local_3c0._0_4_ * fVar167;
        local_480._4_4_ =
             (float)local_100._4_4_ * fVar257 +
             fVar215 * fVar223 + fVar275 * fVar307 + (float)local_3c0._4_4_ * fVar168;
        local_480._8_4_ =
             fStack_f8 * fVar259 + fVar218 * fVar302 + fVar276 * fVar229 + fStack_3b8 * fVar169;
        local_480._12_4_ =
             fStack_f4 * fVar260 + fVar221 * fVar301 + fVar277 * fVar306 + fStack_3b4 * fVar170;
        local_480._16_4_ =
             fStack_f0 * fVar261 + fVar224 * fVar303 + fVar199 * fVar147 + fStack_3b0 * fVar171;
        local_480._20_4_ =
             fStack_ec * fVar262 + fVar227 * fVar226 + fVar214 * fVar165 + fStack_3ac * fVar263;
        local_480._24_4_ =
             fStack_e8 * fVar299 + fVar230 * fVar304 + fVar217 * fVar166 + fStack_3a8 * fVar273;
        local_480._28_4_ = fVar248 + pfVar10[7] + fVar247;
        local_3e0._0_4_ =
             (float)local_3a0._0_4_ * fVar255 +
             auVar351._0_4_ * fVar220 + fVar216 * fVar305 + fVar232 * fVar167;
        local_3e0._4_4_ =
             (float)local_3a0._4_4_ * fVar257 +
             auVar351._4_4_ * fVar223 + fVar219 * fVar307 + fVar238 * fVar168;
        local_3e0._8_4_ =
             fStack_398 * fVar259 + auVar351._8_4_ * fVar302 + fVar222 * fVar229 + fVar239 * fVar169
        ;
        local_3e0._12_4_ =
             fStack_394 * fVar260 +
             auVar351._12_4_ * fVar301 + fVar225 * fVar306 + fVar241 * fVar170;
        local_3e0._16_4_ =
             fStack_390 * fVar261 +
             auVar351._16_4_ * fVar303 + fVar228 * fVar147 + fVar244 * fVar171;
        local_3e0._20_4_ =
             fStack_38c * fVar262 +
             auVar351._20_4_ * fVar226 + fVar231 * fVar165 + fVar245 * fVar263;
        local_3e0._24_4_ =
             fStack_388 * fVar299 +
             auVar351._24_4_ * fVar304 + fVar308 * fVar166 + fVar246 * fVar273;
        local_3e0._28_4_ = fVar247 + fVar248 + fVar248 + *(float *)pauVar5[1];
        auVar334._0_4_ =
             (float)local_a0._0_4_ * fVar220 +
             fVar305 * (float)local_120._0_4_ + fVar167 * (float)local_140._0_4_ +
             fVar255 * (float)local_160._0_4_;
        auVar334._4_4_ =
             (float)local_a0._4_4_ * fVar223 +
             fVar307 * (float)local_120._4_4_ + fVar168 * (float)local_140._4_4_ +
             fVar257 * (float)local_160._4_4_;
        auVar334._8_4_ =
             fStack_98 * fVar302 + fVar229 * fStack_118 + fVar169 * fStack_138 +
             fVar259 * fStack_158;
        auVar334._12_4_ =
             fStack_94 * fVar301 + fVar306 * fStack_114 + fVar170 * fStack_134 +
             fVar260 * fStack_154;
        auVar334._16_4_ =
             fStack_90 * fVar303 + fVar147 * fStack_110 + fVar171 * fStack_130 +
             fVar261 * fStack_150;
        auVar334._20_4_ =
             fStack_8c * fVar226 + fVar165 * fStack_10c + fVar263 * fStack_12c +
             fVar262 * fStack_14c;
        auVar334._24_4_ =
             fStack_88 * fVar304 + fVar166 * fStack_108 + fVar273 * fStack_128 +
             fVar299 * fStack_148;
        auVar334._28_4_ = fVar248 + fVar248 + pfVar10[7] + fVar247;
        auVar29 = vsubps_avx(local_480,_local_6e0);
        auVar30 = vsubps_avx(local_3e0,local_700);
        fVar199 = auVar29._0_4_;
        fVar217 = auVar29._4_4_;
        auVar79._4_4_ = local_700._4_4_ * fVar217;
        auVar79._0_4_ = (float)local_700._0_4_ * fVar199;
        fVar224 = auVar29._8_4_;
        auVar79._8_4_ = local_700._8_4_ * fVar224;
        fVar230 = auVar29._12_4_;
        auVar79._12_4_ = local_700._12_4_ * fVar230;
        fVar238 = auVar29._16_4_;
        auVar79._16_4_ = local_700._16_4_ * fVar238;
        fVar241 = auVar29._20_4_;
        auVar79._20_4_ = local_700._20_4_ * fVar241;
        fVar245 = auVar29._24_4_;
        auVar79._24_4_ = local_700._24_4_ * fVar245;
        auVar79._28_4_ = fVar247;
        fVar214 = auVar30._0_4_;
        fVar220 = auVar30._4_4_;
        auVar80._4_4_ = local_6e0._4_4_ * fVar220;
        auVar80._0_4_ = (float)local_6e0._0_4_ * fVar214;
        fVar227 = auVar30._8_4_;
        auVar80._8_4_ = local_6e0._8_4_ * fVar227;
        fVar232 = auVar30._12_4_;
        auVar80._12_4_ = local_6e0._12_4_ * fVar232;
        fVar239 = auVar30._16_4_;
        auVar80._16_4_ = register0x00001450 * fVar239;
        fVar244 = auVar30._20_4_;
        auVar80._20_4_ = register0x00001454 * fVar244;
        fVar246 = auVar30._24_4_;
        auVar80._24_4_ = register0x00001458 * fVar246;
        auVar80._28_4_ = local_3e0._28_4_;
        auVar31 = vsubps_avx(auVar79,auVar80);
        auVar164 = ZEXT3264(_local_7a0);
        auVar157 = vmaxps_avx(_local_7a0,auVar334);
        auVar81._4_4_ = auVar157._4_4_ * auVar157._4_4_ * (fVar217 * fVar217 + fVar220 * fVar220);
        auVar81._0_4_ = auVar157._0_4_ * auVar157._0_4_ * (fVar199 * fVar199 + fVar214 * fVar214);
        auVar81._8_4_ = auVar157._8_4_ * auVar157._8_4_ * (fVar224 * fVar224 + fVar227 * fVar227);
        auVar81._12_4_ = auVar157._12_4_ * auVar157._12_4_ * (fVar230 * fVar230 + fVar232 * fVar232)
        ;
        auVar81._16_4_ = auVar157._16_4_ * auVar157._16_4_ * (fVar238 * fVar238 + fVar239 * fVar239)
        ;
        auVar81._20_4_ = auVar157._20_4_ * auVar157._20_4_ * (fVar241 * fVar241 + fVar244 * fVar244)
        ;
        auVar81._24_4_ = auVar157._24_4_ * auVar157._24_4_ * (fVar245 * fVar245 + fVar246 * fVar246)
        ;
        auVar81._28_4_ = local_480._28_4_ + local_3e0._28_4_;
        auVar82._4_4_ = auVar31._4_4_ * auVar31._4_4_;
        auVar82._0_4_ = auVar31._0_4_ * auVar31._0_4_;
        auVar82._8_4_ = auVar31._8_4_ * auVar31._8_4_;
        auVar82._12_4_ = auVar31._12_4_ * auVar31._12_4_;
        auVar82._16_4_ = auVar31._16_4_ * auVar31._16_4_;
        auVar82._20_4_ = auVar31._20_4_ * auVar31._20_4_;
        auVar82._24_4_ = auVar31._24_4_ * auVar31._24_4_;
        auVar82._28_4_ = auVar31._28_4_;
        _local_320 = vcmpps_avx(auVar82,auVar81,2);
        local_260 = (uint)lVar146;
        auVar189 = vpshufd_avx(ZEXT416(local_260),0);
        auVar203 = vpor_avx(auVar189,_DAT_01f7fcf0);
        auVar189 = vpor_avx(auVar189,_DAT_01fafea0);
        auVar129._4_4_ = fStack_43c;
        auVar129._0_4_ = local_440;
        auVar129._8_4_ = fStack_438;
        auVar129._12_4_ = fStack_434;
        auVar203 = vpcmpgtd_avx(auVar129,auVar203);
        auVar189 = vpcmpgtd_avx(auVar129,auVar189);
        auVar197._16_16_ = auVar189;
        auVar197._0_16_ = auVar203;
        auVar157 = auVar197 & _local_320;
        fVar200 = (float)local_5c0._0_4_;
        fVar215 = (float)local_5c0._4_4_;
        fVar218 = fStack_5b8;
        fVar221 = fStack_5b4;
        fVar224 = fStack_5b0;
        fVar227 = fStack_5ac;
        fVar230 = fStack_5a8;
        if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar157 >> 0x7f,0) != '\0') ||
              (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar157 >> 0xbf,0) != '\0') ||
            (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar157[0x1f] < '\0') {
          local_5a0._0_4_ = auVar136._0_4_;
          local_5a0._4_4_ = auVar136._4_4_;
          fStack_598 = auVar136._8_4_;
          fStack_594 = auVar136._12_4_;
          fStack_590 = auVar136._16_4_;
          fStack_58c = auVar136._20_4_;
          fStack_588 = auVar136._24_4_;
          fVar199 = (float)local_300._0_4_ * (float)local_5a0._0_4_;
          fVar214 = (float)local_300._4_4_ * (float)local_5a0._4_4_;
          fVar217 = fStack_2f8 * fStack_598;
          fVar220 = fStack_2f4 * fStack_594;
          fVar232 = fStack_2f0 * fStack_590;
          fVar238 = fStack_2ec * fStack_58c;
          fVar239 = fStack_2e8 * fStack_588;
          local_560._0_4_ = auVar135._0_4_;
          local_560._4_4_ = auVar135._4_4_;
          fStack_558 = auVar135._8_4_;
          fStack_554 = auVar135._12_4_;
          fStack_550 = auVar135._16_4_;
          fStack_54c = auVar135._20_4_;
          fStack_548 = auVar135._24_4_;
          _local_5a0 = auVar197;
          local_540 = fVar255 * (float)local_180._0_4_ +
                      fVar199 + (float)local_2e0._0_4_ * (float)local_560._0_4_ +
                                (float)local_660._0_4_ * fVar167;
          fStack_53c = fVar257 * (float)local_180._4_4_ +
                       fVar214 + (float)local_2e0._4_4_ * (float)local_560._4_4_ +
                                 (float)local_660._4_4_ * fVar168;
          fStack_538 = fVar259 * fStack_178 +
                       fVar217 + fStack_2d8 * fStack_558 + fStack_658 * fVar169;
          fStack_534 = fVar260 * fStack_174 +
                       fVar220 + fStack_2d4 * fStack_554 + fStack_654 * fVar170;
          fStack_530 = fVar261 * fStack_170 +
                       fVar232 + fStack_2d0 * fStack_550 + fStack_650 * fVar171;
          fStack_52c = fVar262 * fStack_16c +
                       fVar238 + fStack_2cc * fStack_54c + fStack_64c * fVar263;
          fStack_528 = fVar299 * fStack_168 +
                       fVar239 + fStack_2c8 * fStack_548 + fStack_648 * fVar273;
          fStack_524 = register0x0000145c + fStack_784 + pfVar6[7] + 0.0;
          local_5e0._0_4_ = auVar133._0_4_;
          local_5e0._4_4_ = auVar133._4_4_;
          fStack_5d8 = auVar133._8_4_;
          fStack_5d4 = auVar133._12_4_;
          fStack_5d0 = auVar133._16_4_;
          fStack_5cc = auVar133._20_4_;
          fStack_5c8 = auVar133._24_4_;
          fVar147 = (float)local_300._0_4_ * (float)local_5e0._0_4_;
          fVar165 = (float)local_300._4_4_ * (float)local_5e0._4_4_;
          fVar166 = fStack_2f8 * fStack_5d8;
          fVar167 = fStack_2f4 * fStack_5d4;
          fVar168 = fStack_2f0 * fStack_5d0;
          fVar169 = fStack_2ec * fStack_5cc;
          fVar170 = fStack_2e8 * fStack_5c8;
          local_520._0_4_ = auVar132._0_4_;
          local_520._4_4_ = auVar132._4_4_;
          fStack_518 = auVar132._8_4_;
          fStack_514 = auVar132._12_4_;
          fStack_510 = auVar132._16_4_;
          fStack_50c = auVar132._20_4_;
          fStack_508 = auVar132._24_4_;
          local_420._0_4_ = auVar131._0_4_;
          local_420._4_4_ = auVar131._4_4_;
          fStack_418 = auVar131._8_4_;
          fStack_414 = auVar131._12_4_;
          fStack_410 = auVar131._16_4_;
          fStack_40c = auVar131._20_4_;
          fStack_408 = auVar131._24_4_;
          fVar263 = (float)local_660._0_4_ * (float)local_420._0_4_;
          fVar273 = (float)local_660._4_4_ * (float)local_420._4_4_;
          fVar247 = fStack_658 * fStack_418;
          fVar198 = fStack_654 * fStack_414;
          fVar274 = fStack_650 * fStack_410;
          fVar275 = fStack_64c * fStack_40c;
          fVar276 = fStack_648 * fStack_408;
          pfVar10 = (float *)(lVar141 + 0x21abdfc + lVar146 * 4);
          fVar214 = *pfVar10;
          fVar217 = pfVar10[1];
          fVar220 = pfVar10[2];
          fVar232 = pfVar10[3];
          fVar238 = pfVar10[4];
          fVar239 = pfVar10[5];
          fVar241 = pfVar10[6];
          pfVar11 = (float *)(lVar141 + 0x21ac280 + lVar146 * 4);
          fVar244 = *pfVar11;
          fVar245 = pfVar11[1];
          fVar246 = pfVar11[2];
          fVar248 = pfVar11[3];
          fVar255 = pfVar11[4];
          fVar257 = pfVar11[5];
          fVar259 = pfVar11[6];
          _local_5e0 = auVar334;
          fVar277 = *(float *)pauVar8[1] + 0.0;
          fVar199 = auVar342._28_4_;
          pfVar12 = (float *)(lVar141 + 0x21ab978 + lVar146 * 4);
          fVar260 = *pfVar12;
          fVar261 = pfVar12[1];
          fVar262 = pfVar12[2];
          fVar299 = pfVar12[3];
          fVar223 = pfVar12[4];
          fVar302 = pfVar12[5];
          fVar301 = pfVar12[6];
          fVar171 = pfVar10[7] + pfVar11[7];
          fStack_544 = pfVar11[7] + fVar277;
          fVar277 = *(float *)pauVar8[1] + fVar199 + fVar277;
          pfVar10 = (float *)(lVar141 + 0x21ab4f4 + lVar146 * 4);
          fVar303 = *pfVar10;
          fVar226 = pfVar10[1];
          fVar304 = pfVar10[2];
          fVar305 = pfVar10[3];
          fVar307 = pfVar10[4];
          fVar229 = pfVar10[5];
          fVar306 = pfVar10[6];
          local_420._4_4_ =
               (float)local_100._4_4_ * fVar226 +
               fVar261 * (float)local_5c0._4_4_ +
               (float)local_580._4_4_ * fVar217 + (float)local_3c0._4_4_ * fVar245;
          local_420._0_4_ =
               (float)local_100._0_4_ * fVar303 +
               fVar260 * (float)local_5c0._0_4_ +
               (float)local_580._0_4_ * fVar214 + (float)local_3c0._0_4_ * fVar244;
          fStack_418 = fStack_f8 * fVar304 +
                       fVar262 * fStack_5b8 + fStack_578 * fVar220 + fStack_3b8 * fVar246;
          fStack_414 = fStack_f4 * fVar305 +
                       fVar299 * fStack_5b4 + fStack_574 * fVar232 + fStack_3b4 * fVar248;
          fStack_410 = fStack_f0 * fVar307 +
                       fVar223 * fStack_5b0 + fStack_570 * fVar238 + fStack_3b0 * fVar255;
          fStack_40c = fStack_ec * fVar229 +
                       fVar302 * fStack_5ac + fStack_56c * fVar239 + fStack_3ac * fVar257;
          fStack_408 = fStack_e8 * fVar306 +
                       fVar301 * fStack_5a8 + fStack_568 * fVar241 + fStack_3a8 * fVar259;
          fStack_404 = fVar171 + fStack_544;
          fStack_544 = fStack_544 + fVar277;
          local_560._4_4_ =
               fVar226 * (float)local_3a0._4_4_ +
               fVar219 * fVar217 + (float)local_4e0._4_4_ * fVar245 +
               fVar261 * (float)local_600._4_4_;
          local_560._0_4_ =
               fVar303 * (float)local_3a0._0_4_ +
               fVar216 * fVar214 + (float)local_4e0._0_4_ * fVar244 +
               fVar260 * (float)local_600._0_4_;
          fStack_558 = fVar304 * fStack_398 +
                       fVar222 * fVar220 + fStack_4d8 * fVar246 + fVar262 * fStack_5f8;
          fStack_554 = fVar305 * fStack_394 +
                       fVar225 * fVar232 + fStack_4d4 * fVar248 + fVar299 * fStack_5f4;
          fStack_550 = fVar307 * fStack_390 +
                       fVar228 * fVar238 + fStack_4d0 * fVar255 + fVar223 * fStack_5f0;
          fStack_54c = fVar229 * fStack_38c +
                       fVar231 * fVar239 + fStack_4cc * fVar257 + fVar302 * fStack_5ec;
          fStack_548 = fVar306 * fStack_388 +
                       fVar308 * fVar241 + fStack_4c8 * fVar259 + fVar301 * fStack_5e8;
          auVar340._0_4_ =
               (float)local_300._0_4_ * fVar260 +
               (float)local_2e0._0_4_ * fVar214 + (float)local_660._0_4_ * fVar244 +
               fVar303 * (float)local_180._0_4_;
          auVar340._4_4_ =
               (float)local_300._4_4_ * fVar261 +
               (float)local_2e0._4_4_ * fVar217 + (float)local_660._4_4_ * fVar245 +
               fVar226 * (float)local_180._4_4_;
          auVar340._8_4_ =
               fStack_2f8 * fVar262 + fStack_2d8 * fVar220 + fStack_658 * fVar246 +
               fVar304 * fStack_178;
          auVar340._12_4_ =
               fStack_2f4 * fVar299 + fStack_2d4 * fVar232 + fStack_654 * fVar248 +
               fVar305 * fStack_174;
          auVar340._16_4_ =
               fStack_2f0 * fVar223 + fStack_2d0 * fVar238 + fStack_650 * fVar255 +
               fVar307 * fStack_170;
          auVar340._20_4_ =
               fStack_2ec * fVar302 + fStack_2cc * fVar239 + fStack_64c * fVar257 +
               fVar229 * fStack_16c;
          auVar340._24_4_ =
               fStack_2e8 * fVar301 + fStack_2c8 * fVar241 + fStack_648 * fVar259 +
               fVar306 * fStack_168;
          auVar340._28_4_ = pfVar12[7] + fVar171 + fVar277;
          pfVar10 = (float *)(lVar141 + 0x21ae21c + lVar146 * 4);
          fVar214 = *pfVar10;
          fVar217 = pfVar10[1];
          fVar220 = pfVar10[2];
          fVar232 = pfVar10[3];
          fVar238 = pfVar10[4];
          fVar239 = pfVar10[5];
          fVar241 = pfVar10[6];
          pfVar11 = (float *)(lVar141 + 0x21ae6a0 + lVar146 * 4);
          fVar244 = *pfVar11;
          fVar245 = pfVar11[1];
          fVar246 = pfVar11[2];
          fVar248 = pfVar11[3];
          fVar255 = pfVar11[4];
          fVar257 = pfVar11[5];
          fVar259 = pfVar11[6];
          pfVar12 = (float *)(lVar141 + 0x21add98 + lVar146 * 4);
          fVar260 = *pfVar12;
          fVar261 = pfVar12[1];
          fVar262 = pfVar12[2];
          fVar299 = pfVar12[3];
          fVar223 = pfVar12[4];
          fVar302 = pfVar12[5];
          fVar301 = pfVar12[6];
          pfVar13 = (float *)(lVar141 + 0x21ad914 + lVar146 * 4);
          fVar303 = *pfVar13;
          fVar226 = pfVar13[1];
          fVar304 = pfVar13[2];
          fVar305 = pfVar13[3];
          fVar307 = pfVar13[4];
          fVar229 = pfVar13[5];
          fVar306 = pfVar13[6];
          auVar314._0_4_ =
               (float)local_100._0_4_ * fVar303 +
               fVar260 * (float)local_5c0._0_4_ +
               (float)local_580._0_4_ * fVar214 + (float)local_3c0._0_4_ * fVar244;
          auVar314._4_4_ =
               (float)local_100._4_4_ * fVar226 +
               fVar261 * (float)local_5c0._4_4_ +
               (float)local_580._4_4_ * fVar217 + (float)local_3c0._4_4_ * fVar245;
          auVar314._8_4_ =
               fStack_f8 * fVar304 +
               fVar262 * fStack_5b8 + fStack_578 * fVar220 + fStack_3b8 * fVar246;
          auVar314._12_4_ =
               fStack_f4 * fVar305 +
               fVar299 * fStack_5b4 + fStack_574 * fVar232 + fStack_3b4 * fVar248;
          auVar314._16_4_ =
               fStack_f0 * fVar307 +
               fVar223 * fStack_5b0 + fStack_570 * fVar238 + fStack_3b0 * fVar255;
          auVar314._20_4_ =
               fStack_ec * fVar229 +
               fVar302 * fStack_5ac + fStack_56c * fVar239 + fStack_3ac * fVar257;
          auVar314._24_4_ =
               fStack_e8 * fVar306 +
               fVar301 * fStack_5a8 + fStack_568 * fVar241 + fStack_3a8 * fVar259;
          auVar314._28_4_ = fVar199 + fVar199 + fStack_3a4 + fStack_544;
          auVar335._0_4_ =
               fVar303 * (float)local_3a0._0_4_ +
               fVar260 * (float)local_600._0_4_ +
               fVar216 * fVar214 + (float)local_4e0._0_4_ * fVar244;
          auVar335._4_4_ =
               fVar226 * (float)local_3a0._4_4_ +
               fVar261 * (float)local_600._4_4_ +
               fVar219 * fVar217 + (float)local_4e0._4_4_ * fVar245;
          auVar335._8_4_ =
               fVar304 * fStack_398 +
               fVar262 * fStack_5f8 + fVar222 * fVar220 + fStack_4d8 * fVar246;
          auVar335._12_4_ =
               fVar305 * fStack_394 +
               fVar299 * fStack_5f4 + fVar225 * fVar232 + fStack_4d4 * fVar248;
          auVar335._16_4_ =
               fVar307 * fStack_390 +
               fVar223 * fStack_5f0 + fVar228 * fVar238 + fStack_4d0 * fVar255;
          auVar335._20_4_ =
               fVar229 * fStack_38c +
               fVar302 * fStack_5ec + fVar231 * fVar239 + fStack_4cc * fVar257;
          auVar335._24_4_ =
               fVar306 * fStack_388 +
               fVar301 * fStack_5e8 + fVar308 * fVar241 + fStack_4c8 * fVar259;
          auVar335._28_4_ = fVar199 + fVar199 + fStack_4c4 + fStack_544;
          auVar254._8_4_ = 0x7fffffff;
          auVar254._0_8_ = 0x7fffffff7fffffff;
          auVar254._12_4_ = 0x7fffffff;
          auVar254._16_4_ = 0x7fffffff;
          auVar254._20_4_ = 0x7fffffff;
          auVar254._24_4_ = 0x7fffffff;
          auVar254._28_4_ = 0x7fffffff;
          auVar157 = vandps_avx(_local_420,auVar254);
          auVar31 = vandps_avx(_local_560,auVar254);
          auVar31 = vmaxps_avx(auVar157,auVar31);
          auVar157 = vandps_avx(auVar340,auVar254);
          auVar31 = vmaxps_avx(auVar31,auVar157);
          auVar31 = vcmpps_avx(auVar31,_local_460,1);
          auVar32 = vblendvps_avx(_local_420,auVar29,auVar31);
          auVar159._0_4_ =
               fVar303 * (float)local_180._0_4_ +
               (float)local_300._0_4_ * fVar260 +
               fVar244 * (float)local_660._0_4_ + (float)local_2e0._0_4_ * fVar214;
          auVar159._4_4_ =
               fVar226 * (float)local_180._4_4_ +
               (float)local_300._4_4_ * fVar261 +
               fVar245 * (float)local_660._4_4_ + (float)local_2e0._4_4_ * fVar217;
          auVar159._8_4_ =
               fVar304 * fStack_178 +
               fStack_2f8 * fVar262 + fVar246 * fStack_658 + fStack_2d8 * fVar220;
          auVar159._12_4_ =
               fVar305 * fStack_174 +
               fStack_2f4 * fVar299 + fVar248 * fStack_654 + fStack_2d4 * fVar232;
          auVar159._16_4_ =
               fVar307 * fStack_170 +
               fStack_2f0 * fVar223 + fVar255 * fStack_650 + fStack_2d0 * fVar238;
          auVar159._20_4_ =
               fVar229 * fStack_16c +
               fStack_2ec * fVar302 + fVar257 * fStack_64c + fStack_2cc * fVar239;
          auVar159._24_4_ =
               fVar306 * fStack_168 +
               fStack_2e8 * fVar301 + fVar259 * fStack_648 + fStack_2c8 * fVar241;
          auVar159._28_4_ = auVar157._28_4_ + pfVar12[7] + pfVar11[7] + pfVar10[7];
          auVar33 = vblendvps_avx(_local_560,auVar30,auVar31);
          auVar157 = vandps_avx(auVar314,auVar254);
          auVar31 = vandps_avx(auVar335,auVar254);
          auVar34 = vmaxps_avx(auVar157,auVar31);
          auVar157 = vandps_avx(auVar159,auVar254);
          auVar157 = vmaxps_avx(auVar34,auVar157);
          local_500._0_4_ = auVar134._0_4_;
          local_500._4_4_ = auVar134._4_4_;
          fStack_4f8 = auVar134._8_4_;
          fStack_4f4 = auVar134._12_4_;
          fStack_4f0 = auVar134._16_4_;
          fStack_4ec = auVar134._20_4_;
          fStack_4e8 = auVar134._24_4_;
          auVar31 = vcmpps_avx(auVar157,_local_460,1);
          auVar157 = vblendvps_avx(auVar314,auVar29,auVar31);
          auVar160._0_4_ =
               (float)local_180._0_4_ * (float)local_500._0_4_ +
               fVar147 + (float)local_2e0._0_4_ * (float)local_520._0_4_ + fVar263;
          auVar160._4_4_ =
               (float)local_180._4_4_ * (float)local_500._4_4_ +
               fVar165 + (float)local_2e0._4_4_ * (float)local_520._4_4_ + fVar273;
          auVar160._8_4_ = fStack_178 * fStack_4f8 + fVar166 + fStack_2d8 * fStack_518 + fVar247;
          auVar160._12_4_ = fStack_174 * fStack_4f4 + fVar167 + fStack_2d4 * fStack_514 + fVar198;
          auVar160._16_4_ = fStack_170 * fStack_4f0 + fVar168 + fStack_2d0 * fStack_510 + fVar274;
          auVar160._20_4_ = fStack_16c * fStack_4ec + fVar169 + fStack_2cc * fStack_50c + fVar275;
          auVar160._24_4_ = fStack_168 * fStack_4e8 + fVar170 + fStack_2c8 * fStack_508 + fVar276;
          auVar160._28_4_ = auVar34._28_4_ + fStack_524 + pfVar6[7] + 0.0;
          auVar29 = vblendvps_avx(auVar335,auVar30,auVar31);
          fVar170 = auVar32._0_4_;
          fVar171 = auVar32._4_4_;
          fVar263 = auVar32._8_4_;
          fVar273 = auVar32._12_4_;
          fVar247 = auVar32._16_4_;
          fVar198 = auVar32._20_4_;
          fVar216 = auVar32._24_4_;
          fVar219 = auVar32._28_4_;
          fVar259 = auVar157._0_4_;
          fVar261 = auVar157._4_4_;
          fVar299 = auVar157._8_4_;
          fVar302 = auVar157._12_4_;
          fVar303 = auVar157._16_4_;
          fVar304 = auVar157._20_4_;
          fVar307 = auVar157._24_4_;
          fVar199 = auVar33._0_4_;
          fVar217 = auVar33._4_4_;
          fVar232 = auVar33._8_4_;
          fVar239 = auVar33._12_4_;
          fVar244 = auVar33._16_4_;
          fVar246 = auVar33._20_4_;
          fVar255 = auVar33._24_4_;
          auVar322._0_4_ = fVar199 * fVar199 + fVar170 * fVar170;
          auVar322._4_4_ = fVar217 * fVar217 + fVar171 * fVar171;
          auVar322._8_4_ = fVar232 * fVar232 + fVar263 * fVar263;
          auVar322._12_4_ = fVar239 * fVar239 + fVar273 * fVar273;
          auVar322._16_4_ = fVar244 * fVar244 + fVar247 * fVar247;
          auVar322._20_4_ = fVar246 * fVar246 + fVar198 * fVar198;
          auVar322._24_4_ = fVar255 * fVar255 + fVar216 * fVar216;
          auVar322._28_4_ = fStack_2e4 + auVar30._28_4_;
          auVar30 = vrsqrtps_avx(auVar322);
          fVar214 = auVar30._0_4_;
          fVar220 = auVar30._4_4_;
          auVar83._4_4_ = fVar220 * 1.5;
          auVar83._0_4_ = fVar214 * 1.5;
          fVar238 = auVar30._8_4_;
          auVar83._8_4_ = fVar238 * 1.5;
          fVar241 = auVar30._12_4_;
          auVar83._12_4_ = fVar241 * 1.5;
          fVar245 = auVar30._16_4_;
          auVar83._16_4_ = fVar245 * 1.5;
          fVar248 = auVar30._20_4_;
          auVar83._20_4_ = fVar248 * 1.5;
          fVar257 = auVar30._24_4_;
          auVar83._24_4_ = fVar257 * 1.5;
          auVar83._28_4_ = auVar335._28_4_;
          auVar84._4_4_ = fVar220 * fVar220 * fVar220 * auVar322._4_4_ * 0.5;
          auVar84._0_4_ = fVar214 * fVar214 * fVar214 * auVar322._0_4_ * 0.5;
          auVar84._8_4_ = fVar238 * fVar238 * fVar238 * auVar322._8_4_ * 0.5;
          auVar84._12_4_ = fVar241 * fVar241 * fVar241 * auVar322._12_4_ * 0.5;
          auVar84._16_4_ = fVar245 * fVar245 * fVar245 * auVar322._16_4_ * 0.5;
          auVar84._20_4_ = fVar248 * fVar248 * fVar248 * auVar322._20_4_ * 0.5;
          auVar84._24_4_ = fVar257 * fVar257 * fVar257 * auVar322._24_4_ * 0.5;
          auVar84._28_4_ = auVar322._28_4_;
          auVar31 = vsubps_avx(auVar83,auVar84);
          fVar306 = auVar31._0_4_;
          fVar147 = auVar31._4_4_;
          fVar165 = auVar31._8_4_;
          fVar166 = auVar31._12_4_;
          fVar167 = auVar31._16_4_;
          fVar168 = auVar31._20_4_;
          fVar169 = auVar31._24_4_;
          fVar214 = auVar29._0_4_;
          fVar220 = auVar29._4_4_;
          fVar238 = auVar29._8_4_;
          fVar241 = auVar29._12_4_;
          fVar245 = auVar29._16_4_;
          fVar248 = auVar29._20_4_;
          fVar257 = auVar29._24_4_;
          auVar294._0_4_ = fVar214 * fVar214 + fVar259 * fVar259;
          auVar294._4_4_ = fVar220 * fVar220 + fVar261 * fVar261;
          auVar294._8_4_ = fVar238 * fVar238 + fVar299 * fVar299;
          auVar294._12_4_ = fVar241 * fVar241 + fVar302 * fVar302;
          auVar294._16_4_ = fVar245 * fVar245 + fVar303 * fVar303;
          auVar294._20_4_ = fVar248 * fVar248 + fVar304 * fVar304;
          auVar294._24_4_ = fVar257 * fVar257 + fVar307 * fVar307;
          auVar294._28_4_ = auVar30._28_4_ + auVar157._28_4_;
          auVar157 = vrsqrtps_avx(auVar294);
          fVar260 = auVar157._0_4_;
          fVar262 = auVar157._4_4_;
          auVar85._4_4_ = fVar262 * 1.5;
          auVar85._0_4_ = fVar260 * 1.5;
          fVar223 = auVar157._8_4_;
          auVar85._8_4_ = fVar223 * 1.5;
          fVar301 = auVar157._12_4_;
          auVar85._12_4_ = fVar301 * 1.5;
          fVar226 = auVar157._16_4_;
          auVar85._16_4_ = fVar226 * 1.5;
          fVar305 = auVar157._20_4_;
          auVar85._20_4_ = fVar305 * 1.5;
          fVar229 = auVar157._24_4_;
          auVar85._24_4_ = fVar229 * 1.5;
          auVar85._28_4_ = auVar335._28_4_;
          auVar86._4_4_ = fVar262 * fVar262 * fVar262 * auVar294._4_4_ * 0.5;
          auVar86._0_4_ = fVar260 * fVar260 * fVar260 * auVar294._0_4_ * 0.5;
          auVar86._8_4_ = fVar223 * fVar223 * fVar223 * auVar294._8_4_ * 0.5;
          auVar86._12_4_ = fVar301 * fVar301 * fVar301 * auVar294._12_4_ * 0.5;
          auVar86._16_4_ = fVar226 * fVar226 * fVar226 * auVar294._16_4_ * 0.5;
          auVar86._20_4_ = fVar305 * fVar305 * fVar305 * auVar294._20_4_ * 0.5;
          auVar86._24_4_ = fVar229 * fVar229 * fVar229 * auVar294._24_4_ * 0.5;
          auVar86._28_4_ = auVar294._28_4_;
          auVar29 = vsubps_avx(auVar85,auVar86);
          fVar260 = auVar29._0_4_;
          fVar262 = auVar29._4_4_;
          fVar223 = auVar29._8_4_;
          fVar301 = auVar29._12_4_;
          fVar226 = auVar29._16_4_;
          fVar305 = auVar29._20_4_;
          fVar229 = auVar29._24_4_;
          fVar199 = (float)local_7a0._0_4_ * fVar306 * fVar199;
          fVar217 = (float)local_7a0._4_4_ * fVar147 * fVar217;
          auVar87._4_4_ = fVar217;
          auVar87._0_4_ = fVar199;
          fVar232 = fStack_798 * fVar165 * fVar232;
          auVar87._8_4_ = fVar232;
          fVar239 = fStack_794 * fVar166 * fVar239;
          auVar87._12_4_ = fVar239;
          fVar244 = fStack_790 * fVar167 * fVar244;
          auVar87._16_4_ = fVar244;
          fVar246 = fStack_78c * fVar168 * fVar246;
          auVar87._20_4_ = fVar246;
          fVar255 = fStack_788 * fVar169 * fVar255;
          auVar87._24_4_ = fVar255;
          auVar87._28_4_ = auVar157._28_4_;
          local_500._4_4_ = fVar217 + local_6e0._4_4_;
          local_500._0_4_ = fVar199 + (float)local_6e0._0_4_;
          fStack_4f8 = fVar232 + local_6e0._8_4_;
          fStack_4f4 = fVar239 + local_6e0._12_4_;
          fStack_4f0 = fVar244 + register0x00001450;
          fStack_4ec = fVar246 + register0x00001454;
          fStack_4e8 = fVar255 + register0x00001458;
          fStack_4e4 = auVar157._28_4_ + register0x0000145c;
          fVar199 = (float)local_7a0._0_4_ * fVar306 * -fVar170;
          fVar217 = (float)local_7a0._4_4_ * fVar147 * -fVar171;
          auVar88._4_4_ = fVar217;
          auVar88._0_4_ = fVar199;
          fVar232 = fStack_798 * fVar165 * -fVar263;
          auVar88._8_4_ = fVar232;
          fVar239 = fStack_794 * fVar166 * -fVar273;
          auVar88._12_4_ = fVar239;
          fVar244 = fStack_790 * fVar167 * -fVar247;
          auVar88._16_4_ = fVar244;
          fVar246 = fStack_78c * fVar168 * -fVar198;
          auVar88._20_4_ = fVar246;
          fVar255 = fStack_788 * fVar169 * -fVar216;
          auVar88._24_4_ = fVar255;
          auVar88._28_4_ = -fVar219;
          local_520._4_4_ = local_700._4_4_ + fVar217;
          local_520._0_4_ = (float)local_700._0_4_ + fVar199;
          fStack_518 = local_700._8_4_ + fVar232;
          fStack_514 = local_700._12_4_ + fVar239;
          fStack_510 = local_700._16_4_ + fVar244;
          fStack_50c = local_700._20_4_ + fVar246;
          fStack_508 = local_700._24_4_ + fVar255;
          fStack_504 = local_700._28_4_ + -fVar219;
          fVar199 = fVar306 * 0.0 * (float)local_7a0._0_4_;
          fVar217 = fVar147 * 0.0 * (float)local_7a0._4_4_;
          auVar89._4_4_ = fVar217;
          auVar89._0_4_ = fVar199;
          fVar232 = fVar165 * 0.0 * fStack_798;
          auVar89._8_4_ = fVar232;
          fVar239 = fVar166 * 0.0 * fStack_794;
          auVar89._12_4_ = fVar239;
          fVar244 = fVar167 * 0.0 * fStack_790;
          auVar89._16_4_ = fVar244;
          fVar246 = fVar168 * 0.0 * fStack_78c;
          auVar89._20_4_ = fVar246;
          fVar255 = fVar169 * 0.0 * fStack_788;
          auVar89._24_4_ = fVar255;
          auVar89._28_4_ = fVar219;
          auVar34 = vsubps_avx(_local_6e0,auVar87);
          auVar357._0_4_ = fVar199 + auVar160._0_4_;
          auVar357._4_4_ = fVar217 + auVar160._4_4_;
          auVar357._8_4_ = fVar232 + auVar160._8_4_;
          auVar357._12_4_ = fVar239 + auVar160._12_4_;
          auVar357._16_4_ = fVar244 + auVar160._16_4_;
          auVar357._20_4_ = fVar246 + auVar160._20_4_;
          auVar357._24_4_ = fVar255 + auVar160._24_4_;
          auVar357._28_4_ = fVar219 + auVar160._28_4_;
          fVar199 = auVar334._0_4_ * fVar260 * fVar214;
          fVar214 = auVar334._4_4_ * fVar262 * fVar220;
          auVar90._4_4_ = fVar214;
          auVar90._0_4_ = fVar199;
          fVar217 = auVar334._8_4_ * fVar223 * fVar238;
          auVar90._8_4_ = fVar217;
          fVar220 = auVar334._12_4_ * fVar301 * fVar241;
          auVar90._12_4_ = fVar220;
          fVar232 = auVar334._16_4_ * fVar226 * fVar245;
          auVar90._16_4_ = fVar232;
          fVar238 = auVar334._20_4_ * fVar305 * fVar248;
          auVar90._20_4_ = fVar238;
          fVar239 = auVar334._24_4_ * fVar229 * fVar257;
          auVar90._24_4_ = fVar239;
          auVar90._28_4_ = fStack_784;
          auVar37 = vsubps_avx(local_700,auVar88);
          auVar341._0_4_ = local_480._0_4_ + fVar199;
          auVar341._4_4_ = local_480._4_4_ + fVar214;
          auVar341._8_4_ = local_480._8_4_ + fVar217;
          auVar341._12_4_ = local_480._12_4_ + fVar220;
          auVar341._16_4_ = local_480._16_4_ + fVar232;
          auVar341._20_4_ = local_480._20_4_ + fVar238;
          auVar341._24_4_ = local_480._24_4_ + fVar239;
          auVar341._28_4_ = local_480._28_4_ + fStack_784;
          fVar199 = fVar260 * -fVar259 * auVar334._0_4_;
          fVar214 = fVar262 * -fVar261 * auVar334._4_4_;
          auVar91._4_4_ = fVar214;
          auVar91._0_4_ = fVar199;
          fVar217 = fVar223 * -fVar299 * auVar334._8_4_;
          auVar91._8_4_ = fVar217;
          fVar220 = fVar301 * -fVar302 * auVar334._12_4_;
          auVar91._12_4_ = fVar220;
          fVar232 = fVar226 * -fVar303 * auVar334._16_4_;
          auVar91._16_4_ = fVar232;
          fVar238 = fVar305 * -fVar304 * auVar334._20_4_;
          auVar91._20_4_ = fVar238;
          fVar239 = fVar229 * -fVar307 * auVar334._24_4_;
          auVar91._24_4_ = fVar239;
          auVar91._28_4_ = register0x0000145c;
          auVar151 = vsubps_avx(auVar160,auVar89);
          auVar237._0_4_ = local_3e0._0_4_ + fVar199;
          auVar237._4_4_ = local_3e0._4_4_ + fVar214;
          auVar237._8_4_ = local_3e0._8_4_ + fVar217;
          auVar237._12_4_ = local_3e0._12_4_ + fVar220;
          auVar237._16_4_ = local_3e0._16_4_ + fVar232;
          auVar237._20_4_ = local_3e0._20_4_ + fVar238;
          auVar237._24_4_ = local_3e0._24_4_ + fVar239;
          auVar237._28_4_ = local_3e0._28_4_ + register0x0000145c;
          fVar199 = fVar260 * 0.0 * auVar334._0_4_;
          fVar214 = fVar262 * 0.0 * auVar334._4_4_;
          auVar92._4_4_ = fVar214;
          auVar92._0_4_ = fVar199;
          fVar217 = fVar223 * 0.0 * auVar334._8_4_;
          auVar92._8_4_ = fVar217;
          fVar220 = fVar301 * 0.0 * auVar334._12_4_;
          auVar92._12_4_ = fVar220;
          fVar232 = fVar226 * 0.0 * auVar334._16_4_;
          auVar92._16_4_ = fVar232;
          fVar238 = fVar305 * 0.0 * auVar334._20_4_;
          auVar92._20_4_ = fVar238;
          fVar239 = fVar229 * 0.0 * auVar334._24_4_;
          auVar92._24_4_ = fVar239;
          auVar92._28_4_ = auVar160._28_4_;
          auVar157 = vsubps_avx(local_480,auVar90);
          auVar128._4_4_ = fStack_53c;
          auVar128._0_4_ = local_540;
          auVar128._8_4_ = fStack_538;
          auVar128._12_4_ = fStack_534;
          auVar128._16_4_ = fStack_530;
          auVar128._20_4_ = fStack_52c;
          auVar128._24_4_ = fStack_528;
          auVar128._28_4_ = fStack_524;
          auVar315._0_4_ = local_540 + fVar199;
          auVar315._4_4_ = fStack_53c + fVar214;
          auVar315._8_4_ = fStack_538 + fVar217;
          auVar315._12_4_ = fStack_534 + fVar220;
          auVar315._16_4_ = fStack_530 + fVar232;
          auVar315._20_4_ = fStack_52c + fVar238;
          auVar315._24_4_ = fStack_528 + fVar239;
          auVar315._28_4_ = fStack_524 + auVar160._28_4_;
          auVar30 = vsubps_avx(local_3e0,auVar91);
          auVar31 = vsubps_avx(auVar128,auVar92);
          auVar32 = vsubps_avx(auVar237,auVar37);
          auVar33 = vsubps_avx(auVar315,auVar151);
          auVar93._4_4_ = auVar151._4_4_ * auVar32._4_4_;
          auVar93._0_4_ = auVar151._0_4_ * auVar32._0_4_;
          auVar93._8_4_ = auVar151._8_4_ * auVar32._8_4_;
          auVar93._12_4_ = auVar151._12_4_ * auVar32._12_4_;
          auVar93._16_4_ = auVar151._16_4_ * auVar32._16_4_;
          auVar93._20_4_ = auVar151._20_4_ * auVar32._20_4_;
          auVar93._24_4_ = auVar151._24_4_ * auVar32._24_4_;
          auVar93._28_4_ = auVar335._28_4_;
          auVar94._4_4_ = auVar37._4_4_ * auVar33._4_4_;
          auVar94._0_4_ = auVar37._0_4_ * auVar33._0_4_;
          auVar94._8_4_ = auVar37._8_4_ * auVar33._8_4_;
          auVar94._12_4_ = auVar37._12_4_ * auVar33._12_4_;
          auVar94._16_4_ = auVar37._16_4_ * auVar33._16_4_;
          auVar94._20_4_ = auVar37._20_4_ * auVar33._20_4_;
          auVar94._24_4_ = auVar37._24_4_ * auVar33._24_4_;
          auVar94._28_4_ = fStack_524;
          auVar35 = vsubps_avx(auVar94,auVar93);
          auVar95._4_4_ = auVar34._4_4_ * auVar33._4_4_;
          auVar95._0_4_ = auVar34._0_4_ * auVar33._0_4_;
          auVar95._8_4_ = auVar34._8_4_ * auVar33._8_4_;
          auVar95._12_4_ = auVar34._12_4_ * auVar33._12_4_;
          auVar95._16_4_ = auVar34._16_4_ * auVar33._16_4_;
          auVar95._20_4_ = auVar34._20_4_ * auVar33._20_4_;
          auVar95._24_4_ = auVar34._24_4_ * auVar33._24_4_;
          auVar95._28_4_ = auVar33._28_4_;
          auVar33 = vsubps_avx(auVar341,auVar34);
          auVar96._4_4_ = auVar151._4_4_ * auVar33._4_4_;
          auVar96._0_4_ = auVar151._0_4_ * auVar33._0_4_;
          auVar96._8_4_ = auVar151._8_4_ * auVar33._8_4_;
          auVar96._12_4_ = auVar151._12_4_ * auVar33._12_4_;
          auVar96._16_4_ = auVar151._16_4_ * auVar33._16_4_;
          auVar96._20_4_ = auVar151._20_4_ * auVar33._20_4_;
          auVar96._24_4_ = auVar151._24_4_ * auVar33._24_4_;
          auVar96._28_4_ = auVar29._28_4_;
          auVar36 = vsubps_avx(auVar96,auVar95);
          auVar97._4_4_ = auVar37._4_4_ * auVar33._4_4_;
          auVar97._0_4_ = auVar37._0_4_ * auVar33._0_4_;
          auVar97._8_4_ = auVar37._8_4_ * auVar33._8_4_;
          auVar97._12_4_ = auVar37._12_4_ * auVar33._12_4_;
          auVar97._16_4_ = auVar37._16_4_ * auVar33._16_4_;
          auVar97._20_4_ = auVar37._20_4_ * auVar33._20_4_;
          auVar97._24_4_ = auVar37._24_4_ * auVar33._24_4_;
          auVar97._28_4_ = auVar29._28_4_;
          auVar98._4_4_ = auVar34._4_4_ * auVar32._4_4_;
          auVar98._0_4_ = auVar34._0_4_ * auVar32._0_4_;
          auVar98._8_4_ = auVar34._8_4_ * auVar32._8_4_;
          auVar98._12_4_ = auVar34._12_4_ * auVar32._12_4_;
          auVar98._16_4_ = auVar34._16_4_ * auVar32._16_4_;
          auVar98._20_4_ = auVar34._20_4_ * auVar32._20_4_;
          auVar98._24_4_ = auVar34._24_4_ * auVar32._24_4_;
          auVar98._28_4_ = auVar32._28_4_;
          auVar29 = vsubps_avx(auVar98,auVar97);
          auVar181._0_4_ = auVar35._0_4_ * 0.0 + auVar29._0_4_ + auVar36._0_4_ * 0.0;
          auVar181._4_4_ = auVar35._4_4_ * 0.0 + auVar29._4_4_ + auVar36._4_4_ * 0.0;
          auVar181._8_4_ = auVar35._8_4_ * 0.0 + auVar29._8_4_ + auVar36._8_4_ * 0.0;
          auVar181._12_4_ = auVar35._12_4_ * 0.0 + auVar29._12_4_ + auVar36._12_4_ * 0.0;
          auVar181._16_4_ = auVar35._16_4_ * 0.0 + auVar29._16_4_ + auVar36._16_4_ * 0.0;
          auVar181._20_4_ = auVar35._20_4_ * 0.0 + auVar29._20_4_ + auVar36._20_4_ * 0.0;
          auVar181._24_4_ = auVar35._24_4_ * 0.0 + auVar29._24_4_ + auVar36._24_4_ * 0.0;
          auVar181._28_4_ = auVar35._28_4_ + auVar29._28_4_ + auVar36._28_4_;
          auVar28 = vcmpps_avx(auVar181,ZEXT832(0) << 0x20,2);
          auVar157 = vblendvps_avx(auVar157,_local_500,auVar28);
          auVar29 = vblendvps_avx(auVar30,_local_520,auVar28);
          auVar30 = vblendvps_avx(auVar31,auVar357,auVar28);
          auVar31 = vblendvps_avx(auVar34,auVar341,auVar28);
          auVar32 = vblendvps_avx(auVar37,auVar237,auVar28);
          auVar33 = vblendvps_avx(auVar151,auVar315,auVar28);
          auVar34 = vblendvps_avx(auVar341,auVar34,auVar28);
          auVar35 = vblendvps_avx(auVar237,auVar37,auVar28);
          auVar36 = vblendvps_avx(auVar315,auVar151,auVar28);
          local_700 = vandps_avx(auVar197,_local_320);
          auVar34 = vsubps_avx(auVar34,auVar157);
          auVar152 = vsubps_avx(auVar35,auVar29);
          auVar36 = vsubps_avx(auVar36,auVar30);
          auVar174 = vsubps_avx(auVar29,auVar32);
          fVar199 = auVar152._0_4_;
          fVar228 = auVar30._0_4_;
          fVar241 = auVar152._4_4_;
          fVar231 = auVar30._4_4_;
          auVar99._4_4_ = fVar231 * fVar241;
          auVar99._0_4_ = fVar228 * fVar199;
          fVar259 = auVar152._8_4_;
          fVar308 = auVar30._8_4_;
          auVar99._8_4_ = fVar308 * fVar259;
          fVar301 = auVar152._12_4_;
          fVar240 = auVar30._12_4_;
          auVar99._12_4_ = fVar240 * fVar301;
          fVar306 = auVar152._16_4_;
          fVar242 = auVar30._16_4_;
          auVar99._16_4_ = fVar242 * fVar306;
          fVar170 = auVar152._20_4_;
          fVar243 = auVar30._20_4_;
          auVar99._20_4_ = fVar243 * fVar170;
          fVar219 = auVar152._24_4_;
          fVar249 = auVar30._24_4_;
          auVar99._24_4_ = fVar249 * fVar219;
          auVar99._28_4_ = auVar35._28_4_;
          fVar214 = auVar29._0_4_;
          fVar256 = auVar36._0_4_;
          fVar244 = auVar29._4_4_;
          fVar258 = auVar36._4_4_;
          auVar100._4_4_ = fVar258 * fVar244;
          auVar100._0_4_ = fVar256 * fVar214;
          fVar260 = auVar29._8_4_;
          fVar278 = auVar36._8_4_;
          auVar100._8_4_ = fVar278 * fVar260;
          fVar303 = auVar29._12_4_;
          fVar287 = auVar36._12_4_;
          auVar100._12_4_ = fVar287 * fVar303;
          fVar147 = auVar29._16_4_;
          fVar288 = auVar36._16_4_;
          auVar100._16_4_ = fVar288 * fVar147;
          fVar171 = auVar29._20_4_;
          fVar289 = auVar36._20_4_;
          auVar100._20_4_ = fVar289 * fVar171;
          fVar274 = auVar29._24_4_;
          fVar290 = auVar36._24_4_;
          uVar14 = auVar37._28_4_;
          auVar100._24_4_ = fVar290 * fVar274;
          auVar100._28_4_ = uVar14;
          auVar35 = vsubps_avx(auVar100,auVar99);
          fVar217 = auVar157._0_4_;
          fVar245 = auVar157._4_4_;
          auVar101._4_4_ = fVar258 * fVar245;
          auVar101._0_4_ = fVar256 * fVar217;
          fVar261 = auVar157._8_4_;
          auVar101._8_4_ = fVar278 * fVar261;
          fVar226 = auVar157._12_4_;
          auVar101._12_4_ = fVar287 * fVar226;
          fVar165 = auVar157._16_4_;
          auVar101._16_4_ = fVar288 * fVar165;
          fVar263 = auVar157._20_4_;
          auVar101._20_4_ = fVar289 * fVar263;
          fVar275 = auVar157._24_4_;
          auVar101._24_4_ = fVar290 * fVar275;
          auVar101._28_4_ = uVar14;
          fVar220 = auVar34._0_4_;
          fVar246 = auVar34._4_4_;
          auVar102._4_4_ = fVar231 * fVar246;
          auVar102._0_4_ = fVar228 * fVar220;
          fVar262 = auVar34._8_4_;
          auVar102._8_4_ = fVar308 * fVar262;
          fVar304 = auVar34._12_4_;
          auVar102._12_4_ = fVar240 * fVar304;
          fVar166 = auVar34._16_4_;
          auVar102._16_4_ = fVar242 * fVar166;
          fVar273 = auVar34._20_4_;
          auVar102._20_4_ = fVar243 * fVar273;
          fVar276 = auVar34._24_4_;
          auVar102._24_4_ = fVar249 * fVar276;
          auVar102._28_4_ = auVar341._28_4_;
          auVar37 = vsubps_avx(auVar102,auVar101);
          auVar103._4_4_ = fVar244 * fVar246;
          auVar103._0_4_ = fVar214 * fVar220;
          auVar103._8_4_ = fVar260 * fVar262;
          auVar103._12_4_ = fVar303 * fVar304;
          auVar103._16_4_ = fVar147 * fVar166;
          auVar103._20_4_ = fVar171 * fVar273;
          auVar103._24_4_ = fVar274 * fVar276;
          auVar103._28_4_ = uVar14;
          auVar104._4_4_ = fVar245 * fVar241;
          auVar104._0_4_ = fVar217 * fVar199;
          auVar104._8_4_ = fVar261 * fVar259;
          auVar104._12_4_ = fVar226 * fVar301;
          auVar104._16_4_ = fVar165 * fVar306;
          auVar104._20_4_ = fVar263 * fVar170;
          auVar104._24_4_ = fVar275 * fVar219;
          auVar104._28_4_ = auVar151._28_4_;
          auVar151 = vsubps_avx(auVar104,auVar103);
          auVar30 = vsubps_avx(auVar30,auVar33);
          fVar238 = auVar151._28_4_ + auVar37._28_4_;
          auVar323._0_4_ = auVar151._0_4_ + auVar37._0_4_ * 0.0 + auVar35._0_4_ * 0.0;
          auVar323._4_4_ = auVar151._4_4_ + auVar37._4_4_ * 0.0 + auVar35._4_4_ * 0.0;
          auVar323._8_4_ = auVar151._8_4_ + auVar37._8_4_ * 0.0 + auVar35._8_4_ * 0.0;
          auVar323._12_4_ = auVar151._12_4_ + auVar37._12_4_ * 0.0 + auVar35._12_4_ * 0.0;
          auVar323._16_4_ = auVar151._16_4_ + auVar37._16_4_ * 0.0 + auVar35._16_4_ * 0.0;
          auVar323._20_4_ = auVar151._20_4_ + auVar37._20_4_ * 0.0 + auVar35._20_4_ * 0.0;
          auVar323._24_4_ = auVar151._24_4_ + auVar37._24_4_ * 0.0 + auVar35._24_4_ * 0.0;
          auVar323._28_4_ = fVar238 + auVar35._28_4_;
          fVar232 = auVar174._0_4_;
          fVar248 = auVar174._4_4_;
          auVar105._4_4_ = auVar33._4_4_ * fVar248;
          auVar105._0_4_ = auVar33._0_4_ * fVar232;
          fVar299 = auVar174._8_4_;
          auVar105._8_4_ = auVar33._8_4_ * fVar299;
          fVar305 = auVar174._12_4_;
          auVar105._12_4_ = auVar33._12_4_ * fVar305;
          fVar167 = auVar174._16_4_;
          auVar105._16_4_ = auVar33._16_4_ * fVar167;
          fVar247 = auVar174._20_4_;
          auVar105._20_4_ = auVar33._20_4_ * fVar247;
          fVar277 = auVar174._24_4_;
          auVar105._24_4_ = auVar33._24_4_ * fVar277;
          auVar105._28_4_ = fVar238;
          fVar238 = auVar30._0_4_;
          fVar255 = auVar30._4_4_;
          auVar106._4_4_ = auVar32._4_4_ * fVar255;
          auVar106._0_4_ = auVar32._0_4_ * fVar238;
          fVar223 = auVar30._8_4_;
          auVar106._8_4_ = auVar32._8_4_ * fVar223;
          fVar307 = auVar30._12_4_;
          auVar106._12_4_ = auVar32._12_4_ * fVar307;
          fVar168 = auVar30._16_4_;
          auVar106._16_4_ = auVar32._16_4_ * fVar168;
          fVar198 = auVar30._20_4_;
          auVar106._20_4_ = auVar32._20_4_ * fVar198;
          fVar222 = auVar30._24_4_;
          auVar106._24_4_ = auVar32._24_4_ * fVar222;
          auVar106._28_4_ = auVar151._28_4_;
          auVar37 = vsubps_avx(auVar106,auVar105);
          auVar157 = vsubps_avx(auVar157,auVar31);
          fVar239 = auVar157._0_4_;
          fVar257 = auVar157._4_4_;
          auVar107._4_4_ = auVar33._4_4_ * fVar257;
          auVar107._0_4_ = auVar33._0_4_ * fVar239;
          fVar302 = auVar157._8_4_;
          auVar107._8_4_ = auVar33._8_4_ * fVar302;
          fVar229 = auVar157._12_4_;
          auVar107._12_4_ = auVar33._12_4_ * fVar229;
          fVar169 = auVar157._16_4_;
          auVar107._16_4_ = auVar33._16_4_ * fVar169;
          fVar216 = auVar157._20_4_;
          auVar107._20_4_ = auVar33._20_4_ * fVar216;
          fVar225 = auVar157._24_4_;
          auVar107._24_4_ = auVar33._24_4_ * fVar225;
          auVar107._28_4_ = auVar33._28_4_;
          auVar108._4_4_ = fVar255 * auVar31._4_4_;
          auVar108._0_4_ = fVar238 * auVar31._0_4_;
          auVar108._8_4_ = fVar223 * auVar31._8_4_;
          auVar108._12_4_ = fVar307 * auVar31._12_4_;
          auVar108._16_4_ = fVar168 * auVar31._16_4_;
          auVar108._20_4_ = fVar198 * auVar31._20_4_;
          auVar108._24_4_ = fVar222 * auVar31._24_4_;
          auVar108._28_4_ = auVar35._28_4_;
          auVar157 = vsubps_avx(auVar107,auVar108);
          auVar109._4_4_ = auVar32._4_4_ * fVar257;
          auVar109._0_4_ = auVar32._0_4_ * fVar239;
          auVar109._8_4_ = auVar32._8_4_ * fVar302;
          auVar109._12_4_ = auVar32._12_4_ * fVar229;
          auVar109._16_4_ = auVar32._16_4_ * fVar169;
          auVar109._20_4_ = auVar32._20_4_ * fVar216;
          auVar109._24_4_ = auVar32._24_4_ * fVar225;
          auVar109._28_4_ = auVar32._28_4_;
          auVar110._4_4_ = fVar248 * auVar31._4_4_;
          auVar110._0_4_ = fVar232 * auVar31._0_4_;
          auVar110._8_4_ = fVar299 * auVar31._8_4_;
          auVar110._12_4_ = fVar305 * auVar31._12_4_;
          auVar110._16_4_ = fVar167 * auVar31._16_4_;
          auVar110._20_4_ = fVar247 * auVar31._20_4_;
          auVar110._24_4_ = fVar277 * auVar31._24_4_;
          auVar110._28_4_ = auVar31._28_4_;
          auVar31 = vsubps_avx(auVar110,auVar109);
          auVar161._0_4_ = auVar37._0_4_ * 0.0 + auVar31._0_4_ + auVar157._0_4_ * 0.0;
          auVar161._4_4_ = auVar37._4_4_ * 0.0 + auVar31._4_4_ + auVar157._4_4_ * 0.0;
          auVar161._8_4_ = auVar37._8_4_ * 0.0 + auVar31._8_4_ + auVar157._8_4_ * 0.0;
          auVar161._12_4_ = auVar37._12_4_ * 0.0 + auVar31._12_4_ + auVar157._12_4_ * 0.0;
          auVar161._16_4_ = auVar37._16_4_ * 0.0 + auVar31._16_4_ + auVar157._16_4_ * 0.0;
          auVar161._20_4_ = auVar37._20_4_ * 0.0 + auVar31._20_4_ + auVar157._20_4_ * 0.0;
          auVar161._24_4_ = auVar37._24_4_ * 0.0 + auVar31._24_4_ + auVar157._24_4_ * 0.0;
          auVar161._28_4_ = auVar157._28_4_ + auVar31._28_4_ + auVar157._28_4_;
          auVar164 = ZEXT3264(auVar161);
          auVar157 = vmaxps_avx(auVar323,auVar161);
          auVar157 = vcmpps_avx(auVar157,ZEXT432(0) << 0x20,2);
          auVar31 = local_700 & auVar157;
          if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar31 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar31 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar31 >> 0x7f,0) == '\0') &&
                (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar31 >> 0xbf,0) == '\0') &&
              (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar31[0x1f]) {
LAB_010b1f84:
            auVar213._8_8_ = local_4c0[1]._8_8_;
            auVar213._0_8_ = local_4c0[1]._0_8_;
            auVar213._16_8_ = local_4c0[1]._16_8_;
            auVar213._24_8_ = local_4c0[1]._24_8_;
          }
          else {
            auVar31 = vandps_avx(auVar157,local_700);
            auVar111._4_4_ = fVar255 * fVar241;
            auVar111._0_4_ = fVar238 * fVar199;
            auVar111._8_4_ = fVar223 * fVar259;
            auVar111._12_4_ = fVar307 * fVar301;
            auVar111._16_4_ = fVar168 * fVar306;
            auVar111._20_4_ = fVar198 * fVar170;
            auVar111._24_4_ = fVar222 * fVar219;
            auVar111._28_4_ = local_700._28_4_;
            auVar112._4_4_ = fVar248 * fVar258;
            auVar112._0_4_ = fVar232 * fVar256;
            auVar112._8_4_ = fVar299 * fVar278;
            auVar112._12_4_ = fVar305 * fVar287;
            auVar112._16_4_ = fVar167 * fVar288;
            auVar112._20_4_ = fVar247 * fVar289;
            auVar112._24_4_ = fVar277 * fVar290;
            auVar112._28_4_ = auVar157._28_4_;
            auVar32 = vsubps_avx(auVar112,auVar111);
            auVar113._4_4_ = fVar257 * fVar258;
            auVar113._0_4_ = fVar239 * fVar256;
            auVar113._8_4_ = fVar302 * fVar278;
            auVar113._12_4_ = fVar229 * fVar287;
            auVar113._16_4_ = fVar169 * fVar288;
            auVar113._20_4_ = fVar216 * fVar289;
            auVar113._24_4_ = fVar225 * fVar290;
            auVar113._28_4_ = auVar36._28_4_;
            auVar114._4_4_ = fVar255 * fVar246;
            auVar114._0_4_ = fVar238 * fVar220;
            auVar114._8_4_ = fVar223 * fVar262;
            auVar114._12_4_ = fVar307 * fVar304;
            auVar114._16_4_ = fVar168 * fVar166;
            auVar114._20_4_ = fVar198 * fVar273;
            auVar114._24_4_ = fVar222 * fVar276;
            auVar114._28_4_ = auVar30._28_4_;
            auVar33 = vsubps_avx(auVar114,auVar113);
            auVar115._4_4_ = fVar248 * fVar246;
            auVar115._0_4_ = fVar232 * fVar220;
            auVar115._8_4_ = fVar299 * fVar262;
            auVar115._12_4_ = fVar305 * fVar304;
            auVar115._16_4_ = fVar167 * fVar166;
            auVar115._20_4_ = fVar247 * fVar273;
            auVar115._24_4_ = fVar277 * fVar276;
            auVar115._28_4_ = auVar34._28_4_;
            auVar116._4_4_ = fVar257 * fVar241;
            auVar116._0_4_ = fVar239 * fVar199;
            auVar116._8_4_ = fVar302 * fVar259;
            auVar116._12_4_ = fVar229 * fVar301;
            auVar116._16_4_ = fVar169 * fVar306;
            auVar116._20_4_ = fVar216 * fVar170;
            auVar116._24_4_ = fVar225 * fVar219;
            auVar116._28_4_ = auVar152._28_4_;
            auVar35 = vsubps_avx(auVar116,auVar115);
            auVar295._0_4_ = auVar32._0_4_ * 0.0 + auVar35._0_4_ + auVar33._0_4_ * 0.0;
            auVar295._4_4_ = auVar32._4_4_ * 0.0 + auVar35._4_4_ + auVar33._4_4_ * 0.0;
            auVar295._8_4_ = auVar32._8_4_ * 0.0 + auVar35._8_4_ + auVar33._8_4_ * 0.0;
            auVar295._12_4_ = auVar32._12_4_ * 0.0 + auVar35._12_4_ + auVar33._12_4_ * 0.0;
            auVar295._16_4_ = auVar32._16_4_ * 0.0 + auVar35._16_4_ + auVar33._16_4_ * 0.0;
            auVar295._20_4_ = auVar32._20_4_ * 0.0 + auVar35._20_4_ + auVar33._20_4_ * 0.0;
            auVar295._24_4_ = auVar32._24_4_ * 0.0 + auVar35._24_4_ + auVar33._24_4_ * 0.0;
            auVar295._28_4_ = auVar174._28_4_ + auVar35._28_4_ + auVar34._28_4_;
            auVar157 = vrcpps_avx(auVar295);
            fVar220 = auVar157._0_4_;
            fVar232 = auVar157._4_4_;
            auVar117._4_4_ = auVar295._4_4_ * fVar232;
            auVar117._0_4_ = auVar295._0_4_ * fVar220;
            fVar238 = auVar157._8_4_;
            auVar117._8_4_ = auVar295._8_4_ * fVar238;
            fVar239 = auVar157._12_4_;
            auVar117._12_4_ = auVar295._12_4_ * fVar239;
            fVar241 = auVar157._16_4_;
            auVar117._16_4_ = auVar295._16_4_ * fVar241;
            fVar246 = auVar157._20_4_;
            auVar117._20_4_ = auVar295._20_4_ * fVar246;
            fVar248 = auVar157._24_4_;
            auVar117._24_4_ = auVar295._24_4_ * fVar248;
            auVar117._28_4_ = auVar30._28_4_;
            auVar336._8_4_ = 0x3f800000;
            auVar336._0_8_ = 0x3f8000003f800000;
            auVar336._12_4_ = 0x3f800000;
            auVar336._16_4_ = 0x3f800000;
            auVar336._20_4_ = 0x3f800000;
            auVar336._24_4_ = 0x3f800000;
            auVar336._28_4_ = 0x3f800000;
            auVar157 = vsubps_avx(auVar336,auVar117);
            fVar220 = auVar157._0_4_ * fVar220 + fVar220;
            fVar232 = auVar157._4_4_ * fVar232 + fVar232;
            fVar238 = auVar157._8_4_ * fVar238 + fVar238;
            fVar239 = auVar157._12_4_ * fVar239 + fVar239;
            fVar241 = auVar157._16_4_ * fVar241 + fVar241;
            fVar246 = auVar157._20_4_ * fVar246 + fVar246;
            fVar248 = auVar157._24_4_ * fVar248 + fVar248;
            auVar118._4_4_ =
                 (fVar245 * auVar32._4_4_ + auVar33._4_4_ * fVar244 + fVar231 * auVar35._4_4_) *
                 fVar232;
            auVar118._0_4_ =
                 (fVar217 * auVar32._0_4_ + auVar33._0_4_ * fVar214 + fVar228 * auVar35._0_4_) *
                 fVar220;
            auVar118._8_4_ =
                 (fVar261 * auVar32._8_4_ + auVar33._8_4_ * fVar260 + fVar308 * auVar35._8_4_) *
                 fVar238;
            auVar118._12_4_ =
                 (fVar226 * auVar32._12_4_ + auVar33._12_4_ * fVar303 + fVar240 * auVar35._12_4_) *
                 fVar239;
            auVar118._16_4_ =
                 (fVar165 * auVar32._16_4_ + auVar33._16_4_ * fVar147 + fVar242 * auVar35._16_4_) *
                 fVar241;
            auVar118._20_4_ =
                 (fVar263 * auVar32._20_4_ + auVar33._20_4_ * fVar171 + fVar243 * auVar35._20_4_) *
                 fVar246;
            auVar118._24_4_ =
                 (fVar275 * auVar32._24_4_ + auVar33._24_4_ * fVar274 + fVar249 * auVar35._24_4_) *
                 fVar248;
            auVar118._28_4_ = auVar29._28_4_ + auVar35._28_4_;
            fVar199 = (ray->super_RayK<1>).tfar;
            auVar212._4_4_ = fVar199;
            auVar212._0_4_ = fVar199;
            auVar212._8_4_ = fVar199;
            auVar212._12_4_ = fVar199;
            auVar212._16_4_ = fVar199;
            auVar212._20_4_ = fVar199;
            auVar212._24_4_ = fVar199;
            auVar212._28_4_ = fVar199;
            auVar29 = vcmpps_avx(local_e0,auVar118,2);
            auVar157 = vcmpps_avx(auVar118,auVar212,2);
            auVar157 = vandps_avx(auVar29,auVar157);
            auVar30 = auVar31 & auVar157;
            if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar30 >> 0x7f,0) == '\0') &&
                  (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar30 >> 0xbf,0) == '\0') &&
                (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar30[0x1f]) goto LAB_010b1f84;
            auVar157 = vandps_avx(auVar31,auVar157);
            auVar30 = vcmpps_avx(auVar295,ZEXT432(0) << 0x20,4);
            auVar31 = auVar157 & auVar30;
            auVar213._8_8_ = local_4c0[1]._8_8_;
            auVar213._0_8_ = local_4c0[1]._0_8_;
            auVar213._16_8_ = local_4c0[1]._16_8_;
            auVar213._24_8_ = local_4c0[1]._24_8_;
            if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0x7f,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar31 >> 0xbf,0) != '\0') ||
                (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar31[0x1f] < '\0') {
              auVar213 = vandps_avx(auVar30,auVar157);
              auVar119._4_4_ = auVar323._4_4_ * fVar232;
              auVar119._0_4_ = auVar323._0_4_ * fVar220;
              auVar119._8_4_ = auVar323._8_4_ * fVar238;
              auVar119._12_4_ = auVar323._12_4_ * fVar239;
              auVar119._16_4_ = auVar323._16_4_ * fVar241;
              auVar119._20_4_ = auVar323._20_4_ * fVar246;
              auVar119._24_4_ = auVar323._24_4_ * fVar248;
              auVar119._28_4_ = auVar29._28_4_;
              auVar120._4_4_ = auVar161._4_4_ * fVar232;
              auVar120._0_4_ = auVar161._0_4_ * fVar220;
              auVar120._8_4_ = auVar161._8_4_ * fVar238;
              auVar120._12_4_ = auVar161._12_4_ * fVar239;
              auVar120._16_4_ = auVar161._16_4_ * fVar241;
              auVar120._20_4_ = auVar161._20_4_ * fVar246;
              auVar120._24_4_ = auVar161._24_4_ * fVar248;
              auVar120._28_4_ = auVar161._28_4_;
              auVar272._8_4_ = 0x3f800000;
              auVar272._0_8_ = 0x3f8000003f800000;
              auVar272._12_4_ = 0x3f800000;
              auVar272._16_4_ = 0x3f800000;
              auVar272._20_4_ = 0x3f800000;
              auVar272._24_4_ = 0x3f800000;
              auVar272._28_4_ = 0x3f800000;
              auVar157 = vsubps_avx(auVar272,auVar119);
              _local_c0 = vblendvps_avx(auVar157,auVar119,auVar28);
              auVar157 = vsubps_avx(auVar272,auVar120);
              _local_380 = vblendvps_avx(auVar157,auVar120,auVar28);
              auVar164 = ZEXT3264(_local_380);
              local_360 = auVar118;
            }
          }
          auVar342 = ZEXT3264(local_6a0);
          auVar316 = ZEXT3264(local_680);
          auVar296 = ZEXT3264(local_6c0);
          auVar351 = ZEXT3264(_local_600);
          if ((((((((auVar213 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar213 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar213 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar213 >> 0x7f,0) != '\0') ||
                (auVar213 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar213 >> 0xbf,0) != '\0') ||
              (auVar213 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar213[0x1f] < '\0') {
            auVar157 = vsubps_avx(auVar334,_local_7a0);
            fVar214 = (float)local_7a0._0_4_ + auVar157._0_4_ * (float)local_c0._0_4_;
            fVar217 = (float)local_7a0._4_4_ + auVar157._4_4_ * (float)local_c0._4_4_;
            fVar220 = fStack_798 + auVar157._8_4_ * fStack_b8;
            fVar232 = fStack_794 + auVar157._12_4_ * fStack_b4;
            fVar238 = fStack_790 + auVar157._16_4_ * fStack_b0;
            fVar239 = fStack_78c + auVar157._20_4_ * fStack_ac;
            fVar241 = fStack_788 + auVar157._24_4_ * fStack_a8;
            fVar244 = fStack_784 + auVar157._28_4_;
            fVar199 = pre->depth_scale;
            auVar121._4_4_ = (fVar217 + fVar217) * fVar199;
            auVar121._0_4_ = (fVar214 + fVar214) * fVar199;
            auVar121._8_4_ = (fVar220 + fVar220) * fVar199;
            auVar121._12_4_ = (fVar232 + fVar232) * fVar199;
            auVar121._16_4_ = (fVar238 + fVar238) * fVar199;
            auVar121._20_4_ = (fVar239 + fVar239) * fVar199;
            auVar121._24_4_ = (fVar241 + fVar241) * fVar199;
            auVar121._28_4_ = fVar244 + fVar244;
            auVar157 = vcmpps_avx(local_360,auVar121,6);
            auVar164 = ZEXT3264(auVar157);
            auVar29 = auVar213 & auVar157;
            if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0x7f,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar29 >> 0xbf,0) != '\0') ||
                (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar29[0x1f] < '\0') {
              local_380._0_4_ = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
              local_380._4_4_ = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
              uStack_378._0_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
              uStack_378._4_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
              uStack_370._0_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
              uStack_370._4_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
              uStack_368._0_4_ = (float)uStack_368 + (float)uStack_368 + -1.0;
              uStack_368._4_4_ = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
              local_2c0 = _local_c0;
              auVar137 = _local_380;
              auVar29 = _local_380;
              local_2a0 = (float)local_380._0_4_;
              fStack_29c = (float)local_380._4_4_;
              fStack_298 = (float)uStack_378;
              fStack_294 = uStack_378._4_4_;
              fStack_290 = (float)uStack_370;
              fStack_28c = uStack_370._4_4_;
              fStack_288 = (float)uStack_368;
              fStack_284 = uStack_368._4_4_;
              local_280 = local_360;
              local_25c = uVar25;
              local_250 = CONCAT44(fStack_77c,local_780);
              uStack_248 = CONCAT44(fStack_774,fStack_778);
              local_240 = CONCAT44(fStack_74c,local_750);
              uStack_238 = CONCAT44(fStack_744,fStack_748);
              local_230 = CONCAT44(fStack_75c,local_760);
              uStack_228 = CONCAT44(fStack_754,fStack_758);
              local_220 = CONCAT44(fStack_76c,local_770);
              uStack_218 = CONCAT44(fStack_764,fStack_768);
              pGVar144 = (context->scene->geometries).items[local_7b0].ptr;
              _local_380 = auVar29;
              if ((pGVar144->mask & (ray->super_RayK<1>).mask) != 0) {
                auVar157 = vandps_avx(auVar157,auVar213);
                local_4c0[0] = auVar157;
                auVar203 = vshufps_avx(ZEXT416((uint)(float)(int)local_260),
                                       ZEXT416((uint)(float)(int)local_260),0);
                local_1e0[0] = (auVar203._0_4_ + (float)local_c0._0_4_ + 0.0) *
                               (float)local_400._0_4_;
                local_1e0[1] = (auVar203._4_4_ + (float)local_c0._4_4_ + 1.0) *
                               (float)local_400._4_4_;
                local_1e0[2] = (auVar203._8_4_ + fStack_b8 + 2.0) * fStack_3f8;
                local_1e0[3] = (auVar203._12_4_ + fStack_b4 + 3.0) * fStack_3f4;
                fStack_1d0 = (auVar203._0_4_ + fStack_b0 + 4.0) * fStack_3f0;
                fStack_1cc = (auVar203._4_4_ + fStack_ac + 5.0) * fStack_3ec;
                fStack_1c8 = (auVar203._8_4_ + fStack_a8 + 6.0) * fStack_3e8;
                fStack_1c4 = auVar203._12_4_ + fStack_a4 + 7.0;
                uStack_370 = auVar137._16_8_;
                uStack_368 = auVar29._24_8_;
                local_1c0 = local_380;
                uStack_1b8 = uStack_378;
                uStack_1b0 = uStack_370;
                uStack_1a8 = uStack_368;
                local_1a0 = local_360;
                auVar182._8_4_ = 0x7f800000;
                auVar182._0_8_ = 0x7f8000007f800000;
                auVar182._12_4_ = 0x7f800000;
                auVar182._16_4_ = 0x7f800000;
                auVar182._20_4_ = 0x7f800000;
                auVar182._24_4_ = 0x7f800000;
                auVar182._28_4_ = 0x7f800000;
                auVar29 = vblendvps_avx(auVar182,local_360,auVar157);
                auVar30 = vshufps_avx(auVar29,auVar29,0xb1);
                auVar30 = vminps_avx(auVar29,auVar30);
                auVar31 = vshufpd_avx(auVar30,auVar30,5);
                auVar30 = vminps_avx(auVar30,auVar31);
                auVar31 = vperm2f128_avx(auVar30,auVar30,1);
                auVar30 = vminps_avx(auVar30,auVar31);
                auVar29 = vcmpps_avx(auVar29,auVar30,0);
                auVar30 = auVar157 & auVar29;
                if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar30 >> 0x7f,0) != '\0') ||
                      (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar30 >> 0xbf,0) != '\0') ||
                    (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar30[0x1f] < '\0') {
                  auVar157 = vandps_avx(auVar29,auVar157);
                }
                uVar140 = vmovmskps_avx(auVar157);
                uVar138 = 0;
                if (uVar140 != 0) {
                  for (; (uVar140 >> uVar138 & 1) == 0; uVar138 = uVar138 + 1) {
                  }
                }
                auVar143 = (undefined1  [8])(ulong)uVar138;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar144->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_700 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  local_6e0._0_8_ = pGVar144;
                  do {
                    local_624 = local_1e0[(long)auVar143];
                    local_620 = *(undefined4 *)((long)&local_1c0 + (long)auVar143 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + (long)auVar143 * 4);
                    local_730.context = context->user;
                    fVar214 = 1.0 - local_624;
                    fVar199 = local_624 * fVar214 + local_624 * fVar214;
                    auVar203 = ZEXT416((uint)(local_624 * local_624 * 3.0));
                    auVar203 = vshufps_avx(auVar203,auVar203,0);
                    auVar189 = ZEXT416((uint)((fVar199 - local_624 * local_624) * 3.0));
                    auVar189 = vshufps_avx(auVar189,auVar189,0);
                    auVar185 = ZEXT416((uint)((fVar214 * fVar214 - fVar199) * 3.0));
                    auVar185 = vshufps_avx(auVar185,auVar185,0);
                    auVar204 = ZEXT416((uint)(fVar214 * fVar214 * -3.0));
                    auVar204 = vshufps_avx(auVar204,auVar204,0);
                    auVar191._0_4_ =
                         auVar204._0_4_ * local_780 +
                         auVar185._0_4_ * local_750 +
                         auVar203._0_4_ * local_770 + auVar189._0_4_ * local_760;
                    auVar191._4_4_ =
                         auVar204._4_4_ * fStack_77c +
                         auVar185._4_4_ * fStack_74c +
                         auVar203._4_4_ * fStack_76c + auVar189._4_4_ * fStack_75c;
                    auVar191._8_4_ =
                         auVar204._8_4_ * fStack_778 +
                         auVar185._8_4_ * fStack_748 +
                         auVar203._8_4_ * fStack_768 + auVar189._8_4_ * fStack_758;
                    auVar191._12_4_ =
                         auVar204._12_4_ * fStack_774 +
                         auVar185._12_4_ * fStack_744 +
                         auVar203._12_4_ * fStack_764 + auVar189._12_4_ * fStack_754;
                    local_630 = vmovlps_avx(auVar191);
                    local_628 = vextractps_avx(auVar191,2);
                    local_61c = (int)local_7a8;
                    local_618 = (int)local_7b0;
                    local_614 = (local_730.context)->instID[0];
                    local_610 = (local_730.context)->instPrimID[0];
                    local_7b4 = -1;
                    local_730.valid = &local_7b4;
                    local_730.geometryUserPtr = pGVar144->userPtr;
                    local_730.ray = (RTCRayN *)ray;
                    local_730.hit = (RTCHitN *)&local_630;
                    local_730.N = 1;
                    local_7a0 = auVar143;
                    if (pGVar144->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_010b2158:
                      p_Var26 = context->args->filter;
                      if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar144->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var26)(&local_730);
                        pGVar144 = (Geometry *)local_6e0._0_8_;
                        auVar143 = local_7a0;
                        if (*local_730.valid == 0) goto LAB_010b21ff;
                      }
                      (((Vec3f *)((long)local_730.ray + 0x30))->field_0).components[0] =
                           *(float *)local_730.hit;
                      (((Vec3f *)((long)local_730.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_730.hit + 4);
                      (((Vec3f *)((long)local_730.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_730.hit + 8);
                      *(float *)((long)local_730.ray + 0x3c) = *(float *)(local_730.hit + 0xc);
                      *(float *)((long)local_730.ray + 0x40) = *(float *)(local_730.hit + 0x10);
                      *(float *)((long)local_730.ray + 0x44) = *(float *)(local_730.hit + 0x14);
                      *(float *)((long)local_730.ray + 0x48) = *(float *)(local_730.hit + 0x18);
                      *(float *)((long)local_730.ray + 0x4c) = *(float *)(local_730.hit + 0x1c);
                      *(float *)((long)local_730.ray + 0x50) = *(float *)(local_730.hit + 0x20);
                    }
                    else {
                      (*pGVar144->intersectionFilterN)(&local_730);
                      pGVar144 = (Geometry *)local_6e0._0_8_;
                      auVar143 = local_7a0;
                      if (*local_730.valid != 0) goto LAB_010b2158;
LAB_010b21ff:
                      (ray->super_RayK<1>).tfar = (float)local_700._0_4_;
                      pGVar144 = (Geometry *)local_6e0._0_8_;
                      auVar143 = local_7a0;
                    }
                    *(undefined4 *)(local_4c0[0] + (long)auVar143 * 4) = 0;
                    auVar30 = local_4c0[0];
                    fVar199 = (ray->super_RayK<1>).tfar;
                    auVar162._4_4_ = fVar199;
                    auVar162._0_4_ = fVar199;
                    auVar162._8_4_ = fVar199;
                    auVar162._12_4_ = fVar199;
                    auVar162._16_4_ = fVar199;
                    auVar162._20_4_ = fVar199;
                    auVar162._24_4_ = fVar199;
                    auVar162._28_4_ = fVar199;
                    auVar29 = vcmpps_avx(local_360,auVar162,2);
                    auVar157 = vandps_avx(auVar29,local_4c0[0]);
                    auVar164 = ZEXT3264(auVar157);
                    local_4c0[0] = auVar157;
                    auVar30 = auVar30 & auVar29;
                    if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar30 >> 0x7f,0) == '\0') &&
                          (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar30 >> 0xbf,0) == '\0') &&
                        (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar30[0x1f]) goto LAB_010b22a2;
                    auVar183._8_4_ = 0x7f800000;
                    auVar183._0_8_ = 0x7f8000007f800000;
                    auVar183._12_4_ = 0x7f800000;
                    auVar183._16_4_ = 0x7f800000;
                    auVar183._20_4_ = 0x7f800000;
                    auVar183._24_4_ = 0x7f800000;
                    auVar183._28_4_ = 0x7f800000;
                    auVar29 = vblendvps_avx(auVar183,local_360,auVar157);
                    auVar30 = vshufps_avx(auVar29,auVar29,0xb1);
                    auVar30 = vminps_avx(auVar29,auVar30);
                    auVar31 = vshufpd_avx(auVar30,auVar30,5);
                    auVar30 = vminps_avx(auVar30,auVar31);
                    auVar31 = vperm2f128_avx(auVar30,auVar30,1);
                    auVar30 = vminps_avx(auVar30,auVar31);
                    auVar29 = vcmpps_avx(auVar29,auVar30,0);
                    auVar30 = auVar157 & auVar29;
                    if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar30 >> 0x7f,0) != '\0') ||
                          (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar30 >> 0xbf,0) != '\0') ||
                        (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar30[0x1f] < '\0') {
                      auVar157 = vandps_avx(auVar29,auVar157);
                    }
                    local_700 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    uVar140 = vmovmskps_avx(auVar157);
                    uVar138 = 0;
                    if (uVar140 != 0) {
                      for (; (uVar140 >> uVar138 & 1) == 0; uVar138 = uVar138 + 1) {
                      }
                    }
                    auVar143 = (undefined1  [8])(ulong)uVar138;
                  } while( true );
                }
                fVar199 = local_1e0[(long)auVar143];
                auVar164 = ZEXT464((uint)fVar199);
                fVar214 = *(float *)((long)&local_1c0 + (long)auVar143 * 4);
                fVar220 = 1.0 - fVar199;
                fVar217 = fVar199 * fVar220 + fVar199 * fVar220;
                auVar203 = ZEXT416((uint)(fVar199 * fVar199 * 3.0));
                auVar203 = vshufps_avx(auVar203,auVar203,0);
                auVar189 = ZEXT416((uint)((fVar217 - fVar199 * fVar199) * 3.0));
                auVar189 = vshufps_avx(auVar189,auVar189,0);
                auVar185 = ZEXT416((uint)((fVar220 * fVar220 - fVar217) * 3.0));
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                auVar204 = ZEXT416((uint)(fVar220 * fVar220 * -3.0));
                auVar204 = vshufps_avx(auVar204,auVar204,0);
                auVar190._0_4_ =
                     auVar204._0_4_ * local_780 +
                     auVar185._0_4_ * local_750 +
                     auVar203._0_4_ * local_770 + auVar189._0_4_ * local_760;
                auVar190._4_4_ =
                     auVar204._4_4_ * fStack_77c +
                     auVar185._4_4_ * fStack_74c +
                     auVar203._4_4_ * fStack_76c + auVar189._4_4_ * fStack_75c;
                auVar190._8_4_ =
                     auVar204._8_4_ * fStack_778 +
                     auVar185._8_4_ * fStack_748 +
                     auVar203._8_4_ * fStack_768 + auVar189._8_4_ * fStack_758;
                auVar190._12_4_ =
                     auVar204._12_4_ * fStack_774 +
                     auVar185._12_4_ * fStack_744 +
                     auVar203._12_4_ * fStack_764 + auVar189._12_4_ * fStack_754;
                (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + (long)auVar143 * 4);
                uVar15 = vmovlps_avx(auVar190);
                *(undefined8 *)&(ray->Ng).field_0 = uVar15;
                fVar217 = (float)vextractps_avx(auVar190,2);
                (ray->Ng).field_0.field_0.z = fVar217;
                ray->u = fVar199;
                ray->v = fVar214;
                ray->primID = (uint)local_7a8;
                ray->geomID = (uint)local_7b0;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                prim = local_740;
              }
            }
          }
          goto LAB_010b1f57;
        }
        auVar296 = ZEXT3264(local_6c0);
        auVar316 = ZEXT3264(local_680);
        auVar342 = ZEXT3264(auVar342._0_32_);
        auVar351 = ZEXT3264(_local_600);
        fVar232 = (float)local_4e0._0_4_;
        fVar238 = (float)local_4e0._4_4_;
        fVar239 = fStack_4d8;
        fVar241 = fStack_4d4;
        fVar244 = fStack_4d0;
        fVar245 = fStack_4cc;
        fVar246 = fStack_4c8;
        fVar248 = fStack_4c4;
        goto LAB_010b1f60;
      }
LAB_010b1356:
      fVar199 = (ray->super_RayK<1>).tfar;
      auVar158._4_4_ = fVar199;
      auVar158._0_4_ = fVar199;
      auVar158._8_4_ = fVar199;
      auVar158._12_4_ = fVar199;
      auVar158._16_4_ = fVar199;
      auVar158._20_4_ = fVar199;
      auVar158._24_4_ = fVar199;
      auVar158._28_4_ = fVar199;
      auVar157 = vcmpps_avx(local_80,auVar158,2);
      uVar138 = vmovmskps_avx(auVar157);
      uVar138 = (uint)uVar145 & uVar138;
    } while (uVar138 != 0);
  }
  return;
LAB_010b22a2:
  auVar296 = ZEXT3264(local_6c0);
  auVar316 = ZEXT3264(local_680);
  auVar342 = ZEXT3264(local_6a0);
  auVar351 = ZEXT3264(_local_600);
  prim = local_740;
  pre = local_738;
  fVar200 = (float)local_5c0._0_4_;
  fVar215 = (float)local_5c0._4_4_;
  fVar218 = fStack_5b8;
  fVar221 = fStack_5b4;
  fVar224 = fStack_5b0;
  fVar227 = fStack_5ac;
  fVar230 = fStack_5a8;
LAB_010b1f57:
  fVar232 = (float)local_4e0._0_4_;
  fVar238 = (float)local_4e0._4_4_;
  fVar239 = fStack_4d8;
  fVar241 = fStack_4d4;
  fVar244 = fStack_4d0;
  fVar245 = fStack_4cc;
  fVar246 = fStack_4c8;
  fVar248 = fStack_4c4;
LAB_010b1f60:
  lVar146 = lVar146 + 8;
  fVar274 = (float)local_580._0_4_;
  fVar275 = (float)local_580._4_4_;
  fVar276 = fStack_578;
  fVar277 = fStack_574;
  fVar199 = fStack_570;
  fVar214 = fStack_56c;
  fVar217 = fStack_568;
  fVar220 = fStack_564;
  if ((int)uVar25 <= (int)lVar146) goto LAB_010b1356;
  goto LAB_010b1418;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }